

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O0

bool __thiscall CLIntercept::initDispatch(CLIntercept *this,string *libName)

{
  char *pcVar1;
  void *pvVar2;
  cl_api_clGetPlatformIDs p_Var3;
  cl_api_clGetPlatformInfo p_Var4;
  cl_api_clGetDeviceIDs p_Var5;
  cl_api_clGetDeviceInfo p_Var6;
  cl_api_clCreateContext p_Var7;
  cl_api_clCreateContextFromType p_Var8;
  cl_api_clRetainContext p_Var9;
  cl_api_clReleaseContext p_Var10;
  cl_api_clGetContextInfo p_Var11;
  cl_api_clCreateCommandQueue p_Var12;
  cl_api_clRetainCommandQueue p_Var13;
  cl_api_clReleaseCommandQueue p_Var14;
  cl_api_clGetCommandQueueInfo p_Var15;
  cl_api_clSetCommandQueueProperty p_Var16;
  cl_api_clCreateBuffer p_Var17;
  cl_api_clCreateImage2D p_Var18;
  cl_api_clCreateImage3D p_Var19;
  cl_api_clRetainMemObject p_Var20;
  cl_api_clReleaseMemObject p_Var21;
  cl_api_clGetSupportedImageFormats p_Var22;
  cl_api_clGetMemObjectInfo p_Var23;
  cl_api_clGetImageInfo p_Var24;
  cl_api_clCreateSampler p_Var25;
  cl_api_clRetainSampler p_Var26;
  cl_api_clReleaseSampler p_Var27;
  cl_api_clGetSamplerInfo p_Var28;
  cl_api_clCreateProgramWithSource p_Var29;
  cl_api_clCreateProgramWithBinary p_Var30;
  cl_api_clRetainProgram p_Var31;
  cl_api_clReleaseProgram p_Var32;
  cl_api_clBuildProgram p_Var33;
  cl_api_clUnloadCompiler p_Var34;
  cl_api_clGetProgramInfo p_Var35;
  cl_api_clGetProgramBuildInfo p_Var36;
  cl_api_clCreateKernel p_Var37;
  cl_api_clCreateKernelsInProgram p_Var38;
  cl_api_clRetainKernel p_Var39;
  cl_api_clReleaseKernel p_Var40;
  cl_api_clSetKernelArg p_Var41;
  cl_api_clGetKernelInfo p_Var42;
  cl_api_clGetKernelWorkGroupInfo p_Var43;
  cl_api_clWaitForEvents p_Var44;
  cl_api_clGetEventInfo p_Var45;
  cl_api_clRetainEvent p_Var46;
  cl_api_clReleaseEvent p_Var47;
  cl_api_clGetEventProfilingInfo p_Var48;
  cl_api_clFlush p_Var49;
  cl_api_clFinish p_Var50;
  cl_api_clEnqueueReadBuffer p_Var51;
  cl_api_clEnqueueWriteBuffer p_Var52;
  cl_api_clEnqueueCopyBuffer p_Var53;
  cl_api_clEnqueueReadImage p_Var54;
  cl_api_clEnqueueWriteImage p_Var55;
  cl_api_clEnqueueCopyImage p_Var56;
  cl_api_clEnqueueCopyImageToBuffer p_Var57;
  cl_api_clEnqueueCopyBufferToImage p_Var58;
  cl_api_clEnqueueMapBuffer p_Var59;
  cl_api_clEnqueueMapImage p_Var60;
  cl_api_clEnqueueUnmapMemObject p_Var61;
  cl_api_clEnqueueNDRangeKernel p_Var62;
  cl_api_clEnqueueTask p_Var63;
  cl_api_clEnqueueNativeKernel p_Var64;
  cl_api_clEnqueueMarker p_Var65;
  cl_api_clEnqueueWaitForEvents p_Var66;
  cl_api_clEnqueueBarrier p_Var67;
  cl_api_clGetExtensionFunctionAddress p_Var68;
  cl_api_clGetGLContextInfoKHR p_Var69;
  cl_api_clCreateFromGLBuffer p_Var70;
  cl_api_clCreateFromGLTexture p_Var71;
  cl_api_clCreateFromGLTexture2D p_Var72;
  cl_api_clCreateFromGLTexture3D p_Var73;
  cl_api_clCreateFromGLRenderbuffer p_Var74;
  cl_api_clGetGLObjectInfo p_Var75;
  cl_api_clGetGLTextureInfo p_Var76;
  cl_api_clEnqueueAcquireGLObjects p_Var77;
  cl_api_clEnqueueReleaseGLObjects p_Var78;
  cl_api_clSetEventCallback p_Var79;
  cl_api_clCreateSubBuffer p_Var80;
  cl_api_clSetMemObjectDestructorCallback p_Var81;
  cl_api_clCreateUserEvent p_Var82;
  cl_api_clSetUserEventStatus p_Var83;
  cl_api_clEnqueueReadBufferRect p_Var84;
  cl_api_clEnqueueWriteBufferRect p_Var85;
  cl_api_clEnqueueCopyBufferRect p_Var86;
  cl_api_clCreateSubDevices p_Var87;
  cl_api_clRetainDevice p_Var88;
  cl_api_clReleaseDevice p_Var89;
  cl_api_clCreateImage p_Var90;
  cl_api_clCreateProgramWithBuiltInKernels p_Var91;
  cl_api_clCompileProgram p_Var92;
  cl_api_clLinkProgram p_Var93;
  cl_api_clUnloadPlatformCompiler p_Var94;
  cl_api_clGetKernelArgInfo p_Var95;
  cl_api_clEnqueueFillBuffer p_Var96;
  cl_api_clEnqueueFillImage p_Var97;
  cl_api_clEnqueueMigrateMemObjects p_Var98;
  cl_api_clEnqueueMarkerWithWaitList p_Var99;
  cl_api_clEnqueueBarrierWithWaitList p_Var100;
  cl_api_clGetExtensionFunctionAddressForPlatform p_Var101;
  cl_api_clCreateCommandQueueWithProperties p_Var102;
  cl_api_clCreatePipe p_Var103;
  cl_api_clGetPipeInfo p_Var104;
  cl_api_clSVMAlloc p_Var105;
  cl_api_clSVMFree p_Var106;
  cl_api_clEnqueueSVMFree p_Var107;
  cl_api_clEnqueueSVMMemcpy p_Var108;
  cl_api_clEnqueueSVMMemFill p_Var109;
  cl_api_clEnqueueSVMMap p_Var110;
  cl_api_clEnqueueSVMUnmap p_Var111;
  cl_api_clCreateSamplerWithProperties p_Var112;
  cl_api_clSetKernelArgSVMPointer p_Var113;
  cl_api_clSetKernelExecInfo p_Var114;
  cl_api_clCloneKernel p_Var115;
  cl_api_clCreateProgramWithIL p_Var116;
  cl_api_clEnqueueSVMMigrateMem p_Var117;
  cl_api_clGetDeviceAndHostTimer p_Var118;
  cl_api_clGetHostTimer p_Var119;
  cl_api_clGetKernelSubGroupInfo p_Var120;
  cl_api_clSetDefaultDeviceCommandQueue p_Var121;
  cl_api_clSetProgramReleaseCallback p_Var122;
  cl_api_clSetProgramSpecializationConstant p_Var123;
  cl_api_clCreateBufferWithProperties p_Var124;
  cl_api_clCreateImageWithProperties p_Var125;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  CLIntercept *in_RDI;
  double dVar126;
  void **pfunc_123;
  void *func_123;
  void **pfunc_122;
  void *func_122;
  void **pfunc_121;
  void *func_121;
  void **pfunc_120;
  void *func_120;
  void **pfunc_119;
  void *func_119;
  void **pfunc_118;
  void *func_118;
  void **pfunc_117;
  void *func_117;
  void **pfunc_116;
  void *func_116;
  void **pfunc_115;
  void *func_115;
  void **pfunc_114;
  void *func_114;
  void **pfunc_113;
  void *func_113;
  void **pfunc_112;
  void *func_112;
  void **pfunc_111;
  void *func_111;
  void **pfunc_110;
  void *func_110;
  void **pfunc_109;
  void *func_109;
  void **pfunc_108;
  void *func_108;
  void **pfunc_107;
  void *func_107;
  void **pfunc_106;
  void *func_106;
  void **pfunc_105;
  void *func_105;
  void **pfunc_104;
  void *func_104;
  void **pfunc_103;
  void *func_103;
  void **pfunc_102;
  void *func_102;
  void **pfunc_101;
  void *func_101;
  void **pfunc_100;
  void *func_100;
  void **pfunc_99;
  void *func_99;
  void **pfunc_98;
  void *func_98;
  void **pfunc_97;
  void *func_97;
  void **pfunc_96;
  void *func_96;
  void **pfunc_95;
  void *func_95;
  void **pfunc_94;
  void *func_94;
  void **pfunc_93;
  void *func_93;
  void **pfunc_92;
  void *func_92;
  void **pfunc_91;
  void *func_91;
  void **pfunc_90;
  void *func_90;
  void **pfunc_89;
  void *func_89;
  void **pfunc_88;
  void *func_88;
  void **pfunc_87;
  void *func_87;
  void **pfunc_86;
  void *func_86;
  void **pfunc_85;
  void *func_85;
  void **pfunc_84;
  void *func_84;
  void **pfunc_83;
  void *func_83;
  void **pfunc_82;
  void *func_82;
  void **pfunc_81;
  void *func_81;
  void **pfunc_80;
  void *func_80;
  void **pfunc_79;
  void *func_79;
  void **pfunc_78;
  void *func_78;
  void **pfunc_77;
  void *func_77;
  void **pfunc_76;
  void *func_76;
  void **pfunc_75;
  void *func_75;
  void **pfunc_74;
  void *func_74;
  void **pfunc_73;
  void *func_73;
  void **pfunc_72;
  void *func_72;
  void **pfunc_71;
  void *func_71;
  void **pfunc_70;
  void *func_70;
  void **pfunc_69;
  void *func_69;
  void **pfunc_68;
  void *func_68;
  void **pfunc_67;
  void *func_67;
  void **pfunc_66;
  void *func_66;
  void **pfunc_65;
  void *func_65;
  bool savedSuccess;
  void **pfunc_64;
  void *func_64;
  void **pfunc_63;
  void *func_63;
  void **pfunc_62;
  void *func_62;
  void **pfunc_61;
  void *func_61;
  void **pfunc_60;
  void *func_60;
  void **pfunc_59;
  void *func_59;
  void **pfunc_58;
  void *func_58;
  void **pfunc_57;
  void *func_57;
  void **pfunc_56;
  void *func_56;
  void **pfunc_55;
  void *func_55;
  void **pfunc_54;
  void *func_54;
  void **pfunc_53;
  void *func_53;
  void **pfunc_52;
  void *func_52;
  void **pfunc_51;
  void *func_51;
  void **pfunc_50;
  void *func_50;
  void **pfunc_49;
  void *func_49;
  void **pfunc_48;
  void *func_48;
  void **pfunc_47;
  void *func_47;
  void **pfunc_46;
  void *func_46;
  void **pfunc_45;
  void *func_45;
  void **pfunc_44;
  void *func_44;
  void **pfunc_43;
  void *func_43;
  void **pfunc_42;
  void *func_42;
  void **pfunc_41;
  void *func_41;
  void **pfunc_40;
  void *func_40;
  void **pfunc_39;
  void *func_39;
  void **pfunc_38;
  void *func_38;
  void **pfunc_37;
  void *func_37;
  void **pfunc_36;
  void *func_36;
  void **pfunc_35;
  void *func_35;
  void **pfunc_34;
  void *func_34;
  void **pfunc_33;
  void *func_33;
  void **pfunc_32;
  void *func_32;
  void **pfunc_31;
  void *func_31;
  void **pfunc_30;
  void *func_30;
  void **pfunc_29;
  void *func_29;
  void **pfunc_28;
  void *func_28;
  void **pfunc_27;
  void *func_27;
  void **pfunc_26;
  void *func_26;
  void **pfunc_25;
  void *func_25;
  void **pfunc_24;
  void *func_24;
  void **pfunc_23;
  void *func_23;
  void **pfunc_22;
  void *func_22;
  void **pfunc_21;
  void *func_21;
  void **pfunc_20;
  void *func_20;
  void **pfunc_19;
  void *func_19;
  void **pfunc_18;
  void *func_18;
  void **pfunc_17;
  void *func_17;
  void **pfunc_16;
  void *func_16;
  void **pfunc_15;
  void *func_15;
  void **pfunc_14;
  void *func_14;
  void **pfunc_13;
  void *func_13;
  void **pfunc_12;
  void *func_12;
  void **pfunc_11;
  void *func_11;
  void **pfunc_10;
  void *func_10;
  void **pfunc_9;
  void *func_9;
  void **pfunc_8;
  void *func_8;
  void **pfunc_7;
  void *func_7;
  void **pfunc_6;
  void *func_6;
  void **pfunc_5;
  void *func_5;
  void **pfunc_4;
  void *func_4;
  void **pfunc_3;
  void *func_3;
  void **pfunc_2;
  void *func_2;
  void **pfunc_1;
  void *func_1;
  void **pfunc;
  void *func;
  bool success;
  string *in_stack_ffffffffffff9e28;
  allocator *in_stack_ffffffffffff9e30;
  Services_Common *in_stack_ffffffffffff9e38;
  allocator local_4e31;
  string local_4e30 [32];
  string local_4e10 [32];
  string local_4df0 [39];
  allocator local_4dc9;
  string local_4dc8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_4da8;
  cl_api_clCreateImageWithProperties *local_4da0;
  allocator local_4d91;
  string local_4d90 [32];
  string local_4d70 [32];
  string local_4d50 [39];
  allocator local_4d29;
  string local_4d28 [32];
  cl_api_clCreateImageWithProperties local_4d08;
  cl_api_clCreateBufferWithProperties *local_4d00;
  allocator local_4cf1;
  string local_4cf0 [32];
  string local_4cd0 [32];
  string local_4cb0 [39];
  allocator local_4c89;
  string local_4c88 [32];
  cl_api_clCreateBufferWithProperties local_4c68;
  cl_api_clSetProgramSpecializationConstant *local_4c60;
  allocator local_4c51;
  string local_4c50 [32];
  string local_4c30 [32];
  string local_4c10 [39];
  allocator local_4be9;
  string local_4be8 [32];
  cl_api_clSetProgramSpecializationConstant local_4bc8;
  cl_api_clSetProgramReleaseCallback *local_4bc0;
  allocator local_4bb1;
  string local_4bb0 [32];
  string local_4b90 [32];
  string local_4b70 [39];
  allocator local_4b49;
  string local_4b48 [32];
  cl_api_clSetProgramReleaseCallback local_4b28;
  cl_api_clSetDefaultDeviceCommandQueue *local_4b20;
  allocator local_4b11;
  string local_4b10 [32];
  string local_4af0 [32];
  string local_4ad0 [39];
  allocator local_4aa9;
  string local_4aa8 [32];
  cl_api_clSetDefaultDeviceCommandQueue local_4a88;
  cl_api_clGetKernelSubGroupInfo *local_4a80;
  allocator local_4a71;
  string local_4a70 [32];
  string local_4a50 [32];
  string local_4a30 [39];
  allocator local_4a09;
  string local_4a08 [32];
  cl_api_clGetKernelSubGroupInfo local_49e8;
  cl_api_clGetHostTimer *local_49e0;
  allocator local_49d1;
  string local_49d0 [32];
  string local_49b0 [32];
  string local_4990 [39];
  allocator local_4969;
  string local_4968 [32];
  cl_api_clGetHostTimer local_4948;
  cl_api_clGetDeviceAndHostTimer *local_4940;
  allocator local_4931;
  string local_4930 [32];
  string local_4910 [32];
  string local_48f0 [39];
  allocator local_48c9;
  string local_48c8 [32];
  cl_api_clGetDeviceAndHostTimer local_48a8;
  cl_api_clEnqueueSVMMigrateMem *local_48a0;
  allocator local_4891;
  string local_4890 [32];
  string local_4870 [32];
  string local_4850 [39];
  allocator local_4829;
  string local_4828 [32];
  cl_api_clEnqueueSVMMigrateMem local_4808;
  cl_api_clCreateProgramWithIL *local_4800;
  allocator local_47f1;
  string local_47f0 [32];
  string local_47d0 [32];
  string local_47b0 [39];
  allocator local_4789;
  string local_4788 [32];
  cl_api_clCreateProgramWithIL local_4768;
  cl_api_clCloneKernel *local_4760;
  allocator local_4751;
  string local_4750 [32];
  string local_4730 [32];
  string local_4710 [39];
  allocator local_46e9;
  string local_46e8 [32];
  cl_api_clCloneKernel local_46c8;
  cl_api_clSetKernelExecInfo *local_46c0;
  allocator local_46b1;
  string local_46b0 [32];
  string local_4690 [32];
  string local_4670 [39];
  allocator local_4649;
  string local_4648 [32];
  cl_api_clSetKernelExecInfo local_4628;
  cl_api_clSetKernelArgSVMPointer *local_4620;
  allocator local_4611;
  string local_4610 [32];
  string local_45f0 [32];
  string local_45d0 [39];
  allocator local_45a9;
  string local_45a8 [32];
  cl_api_clSetKernelArgSVMPointer local_4588;
  cl_api_clCreateSamplerWithProperties *local_4580;
  allocator local_4571;
  string local_4570 [32];
  string local_4550 [32];
  string local_4530 [39];
  allocator local_4509;
  string local_4508 [32];
  cl_api_clCreateSamplerWithProperties local_44e8;
  cl_api_clEnqueueSVMUnmap *local_44e0;
  allocator local_44d1;
  string local_44d0 [32];
  string local_44b0 [32];
  string local_4490 [39];
  allocator local_4469;
  string local_4468 [32];
  cl_api_clEnqueueSVMUnmap local_4448;
  cl_api_clEnqueueSVMMap *local_4440;
  allocator local_4431;
  string local_4430 [32];
  string local_4410 [32];
  string local_43f0 [39];
  allocator local_43c9;
  string local_43c8 [32];
  cl_api_clEnqueueSVMMap local_43a8;
  cl_api_clEnqueueSVMMemFill *local_43a0;
  allocator local_4391;
  string local_4390 [32];
  string local_4370 [32];
  string local_4350 [39];
  allocator local_4329;
  string local_4328 [32];
  cl_api_clEnqueueSVMMemFill local_4308;
  cl_api_clEnqueueSVMMemcpy *local_4300;
  allocator local_42f1;
  string local_42f0 [32];
  string local_42d0 [32];
  string local_42b0 [39];
  allocator local_4289;
  string local_4288 [32];
  cl_api_clEnqueueSVMMemcpy local_4268;
  cl_api_clEnqueueSVMFree *local_4260;
  allocator local_4251;
  string local_4250 [32];
  string local_4230 [32];
  string local_4210 [39];
  allocator local_41e9;
  string local_41e8 [32];
  cl_api_clEnqueueSVMFree local_41c8;
  cl_api_clSVMFree *local_41c0;
  allocator local_41b1;
  string local_41b0 [32];
  string local_4190 [32];
  string local_4170 [39];
  allocator local_4149;
  string local_4148 [32];
  cl_api_clSVMFree local_4128;
  cl_api_clSVMAlloc *local_4120;
  allocator local_4111;
  string local_4110 [32];
  string local_40f0 [32];
  string local_40d0 [39];
  allocator local_40a9;
  string local_40a8 [32];
  cl_api_clSVMAlloc local_4088;
  cl_api_clGetPipeInfo *local_4080;
  allocator local_4071;
  string local_4070 [32];
  string local_4050 [32];
  string local_4030 [39];
  allocator local_4009;
  string local_4008 [32];
  cl_api_clGetPipeInfo local_3fe8;
  cl_api_clCreatePipe *local_3fe0;
  allocator local_3fd1;
  string local_3fd0 [32];
  string local_3fb0 [32];
  string local_3f90 [39];
  allocator local_3f69;
  string local_3f68 [32];
  cl_api_clCreatePipe local_3f48;
  cl_api_clCreateCommandQueueWithProperties *local_3f40;
  allocator local_3f31;
  string local_3f30 [32];
  string local_3f10 [32];
  string local_3ef0 [39];
  allocator local_3ec9;
  string local_3ec8 [32];
  cl_api_clCreateCommandQueueWithProperties local_3ea8;
  cl_api_clGetExtensionFunctionAddressForPlatform *local_3ea0;
  allocator local_3e91;
  string local_3e90 [32];
  string local_3e70 [32];
  string local_3e50 [39];
  allocator local_3e29;
  string local_3e28 [32];
  cl_api_clGetExtensionFunctionAddressForPlatform local_3e08;
  cl_api_clEnqueueBarrierWithWaitList *local_3e00;
  allocator local_3df1;
  string local_3df0 [32];
  string local_3dd0 [32];
  string local_3db0 [39];
  allocator local_3d89;
  string local_3d88 [32];
  cl_api_clEnqueueBarrierWithWaitList local_3d68;
  cl_api_clEnqueueMarkerWithWaitList *local_3d60;
  allocator local_3d51;
  string local_3d50 [32];
  string local_3d30 [32];
  string local_3d10 [39];
  allocator local_3ce9;
  string local_3ce8 [32];
  cl_api_clEnqueueMarkerWithWaitList local_3cc8;
  cl_api_clEnqueueMigrateMemObjects *local_3cc0;
  allocator local_3cb1;
  string local_3cb0 [32];
  string local_3c90 [32];
  string local_3c70 [39];
  allocator local_3c49;
  string local_3c48 [32];
  cl_api_clEnqueueMigrateMemObjects local_3c28;
  cl_api_clEnqueueFillImage *local_3c20;
  allocator local_3c11;
  string local_3c10 [32];
  string local_3bf0 [32];
  string local_3bd0 [39];
  allocator local_3ba9;
  string local_3ba8 [32];
  cl_api_clEnqueueFillImage local_3b88;
  cl_api_clEnqueueFillBuffer *local_3b80;
  allocator local_3b71;
  string local_3b70 [32];
  string local_3b50 [32];
  string local_3b30 [39];
  allocator local_3b09;
  string local_3b08 [32];
  cl_api_clEnqueueFillBuffer local_3ae8;
  cl_api_clGetKernelArgInfo *local_3ae0;
  allocator local_3ad1;
  string local_3ad0 [32];
  string local_3ab0 [32];
  string local_3a90 [39];
  allocator local_3a69;
  string local_3a68 [32];
  cl_api_clGetKernelArgInfo local_3a48;
  cl_api_clUnloadPlatformCompiler *local_3a40;
  allocator local_3a31;
  string local_3a30 [32];
  string local_3a10 [32];
  string local_39f0 [39];
  allocator local_39c9;
  string local_39c8 [32];
  cl_api_clUnloadPlatformCompiler local_39a8;
  cl_api_clLinkProgram *local_39a0;
  allocator local_3991;
  string local_3990 [32];
  string local_3970 [32];
  string local_3950 [39];
  allocator local_3929;
  string local_3928 [32];
  cl_api_clLinkProgram local_3908;
  cl_api_clCompileProgram *local_3900;
  allocator local_38f1;
  string local_38f0 [32];
  string local_38d0 [32];
  string local_38b0 [39];
  allocator local_3889;
  string local_3888 [32];
  cl_api_clCompileProgram local_3868;
  cl_api_clCreateProgramWithBuiltInKernels *local_3860;
  allocator local_3851;
  string local_3850 [32];
  string local_3830 [32];
  string local_3810 [39];
  allocator local_37e9;
  string local_37e8 [32];
  cl_api_clCreateProgramWithBuiltInKernels local_37c8;
  cl_api_clCreateImage *local_37c0;
  allocator local_37b1;
  string local_37b0 [32];
  string local_3790 [32];
  string local_3770 [39];
  allocator local_3749;
  string local_3748 [32];
  cl_api_clCreateImage local_3728;
  cl_api_clReleaseDevice *local_3720;
  allocator local_3711;
  string local_3710 [32];
  string local_36f0 [32];
  string local_36d0 [39];
  allocator local_36a9;
  string local_36a8 [32];
  cl_api_clReleaseDevice local_3688;
  cl_api_clRetainDevice *local_3680;
  allocator local_3671;
  string local_3670 [32];
  string local_3650 [32];
  string local_3630 [39];
  allocator local_3609;
  string local_3608 [32];
  cl_api_clRetainDevice local_35e8;
  cl_api_clCreateSubDevices *local_35e0;
  allocator local_35d1;
  string local_35d0 [32];
  string local_35b0 [32];
  string local_3590 [39];
  allocator local_3569;
  string local_3568 [32];
  cl_api_clCreateSubDevices local_3548;
  cl_api_clEnqueueCopyBufferRect *local_3540;
  allocator local_3531;
  string local_3530 [32];
  string local_3510 [32];
  string local_34f0 [39];
  allocator local_34c9;
  string local_34c8 [32];
  cl_api_clEnqueueCopyBufferRect local_34a8;
  cl_api_clEnqueueWriteBufferRect *local_34a0;
  allocator local_3491;
  string local_3490 [32];
  string local_3470 [32];
  string local_3450 [39];
  allocator local_3429;
  string local_3428 [32];
  cl_api_clEnqueueWriteBufferRect local_3408;
  cl_api_clEnqueueReadBufferRect *local_3400;
  allocator local_33f1;
  string local_33f0 [32];
  string local_33d0 [32];
  string local_33b0 [39];
  allocator local_3389;
  string local_3388 [32];
  cl_api_clEnqueueReadBufferRect local_3368;
  cl_api_clSetUserEventStatus *local_3360;
  allocator local_3351;
  string local_3350 [32];
  string local_3330 [32];
  string local_3310 [39];
  allocator local_32e9;
  string local_32e8 [32];
  cl_api_clSetUserEventStatus local_32c8;
  cl_api_clCreateUserEvent *local_32c0;
  allocator local_32b1;
  string local_32b0 [32];
  string local_3290 [32];
  string local_3270 [39];
  allocator local_3249;
  string local_3248 [32];
  cl_api_clCreateUserEvent local_3228;
  cl_api_clSetMemObjectDestructorCallback *local_3220;
  allocator local_3211;
  string local_3210 [32];
  string local_31f0 [32];
  string local_31d0 [39];
  allocator local_31a9;
  string local_31a8 [32];
  cl_api_clSetMemObjectDestructorCallback local_3188;
  cl_api_clCreateSubBuffer *local_3180;
  allocator local_3171;
  string local_3170 [32];
  string local_3150 [32];
  string local_3130 [39];
  allocator local_3109;
  string local_3108 [32];
  cl_api_clCreateSubBuffer local_30e8;
  cl_api_clSetEventCallback *local_30e0;
  allocator local_30d1;
  string local_30d0 [32];
  string local_30b0 [32];
  string local_3090 [39];
  allocator local_3069;
  string local_3068 [32];
  cl_api_clSetEventCallback local_3048;
  cl_api_clEnqueueReleaseGLObjects *local_3040;
  allocator local_3031;
  string local_3030 [32];
  string local_3010 [32];
  string local_2ff0 [39];
  allocator local_2fc9;
  string local_2fc8 [32];
  cl_api_clEnqueueReleaseGLObjects local_2fa8;
  cl_api_clEnqueueAcquireGLObjects *local_2fa0;
  allocator local_2f91;
  string local_2f90 [32];
  string local_2f70 [32];
  string local_2f50 [39];
  allocator local_2f29;
  string local_2f28 [32];
  cl_api_clEnqueueAcquireGLObjects local_2f08;
  cl_api_clGetGLTextureInfo *local_2f00;
  allocator local_2ef1;
  string local_2ef0 [32];
  string local_2ed0 [32];
  string local_2eb0 [39];
  allocator local_2e89;
  string local_2e88 [32];
  cl_api_clGetGLTextureInfo local_2e68;
  cl_api_clGetGLObjectInfo *local_2e60;
  allocator local_2e51;
  string local_2e50 [32];
  string local_2e30 [32];
  string local_2e10 [39];
  allocator local_2de9;
  string local_2de8 [32];
  cl_api_clGetGLObjectInfo local_2dc8;
  cl_api_clCreateFromGLRenderbuffer *local_2dc0;
  allocator local_2db1;
  string local_2db0 [32];
  string local_2d90 [32];
  string local_2d70 [39];
  allocator local_2d49;
  string local_2d48 [32];
  cl_api_clCreateFromGLRenderbuffer local_2d28;
  cl_api_clCreateFromGLTexture3D *local_2d20;
  allocator local_2d11;
  string local_2d10 [32];
  string local_2cf0 [32];
  string local_2cd0 [39];
  allocator local_2ca9;
  string local_2ca8 [32];
  cl_api_clCreateFromGLTexture3D local_2c88;
  cl_api_clCreateFromGLTexture2D *local_2c80;
  allocator local_2c71;
  string local_2c70 [32];
  string local_2c50 [32];
  string local_2c30 [39];
  allocator local_2c09;
  string local_2c08 [32];
  cl_api_clCreateFromGLTexture2D local_2be8;
  cl_api_clCreateFromGLTexture *local_2be0;
  allocator local_2bd1;
  string local_2bd0 [32];
  string local_2bb0 [32];
  string local_2b90 [39];
  allocator local_2b69;
  string local_2b68 [32];
  cl_api_clCreateFromGLTexture local_2b48;
  cl_api_clCreateFromGLBuffer *local_2b40;
  allocator local_2b31;
  string local_2b30 [32];
  string local_2b10 [32];
  string local_2af0 [39];
  allocator local_2ac9;
  string local_2ac8 [32];
  cl_api_clCreateFromGLBuffer local_2aa8;
  cl_api_clGetGLContextInfoKHR *local_2aa0;
  allocator local_2a91;
  string local_2a90 [32];
  string local_2a70 [32];
  string local_2a50 [39];
  allocator local_2a29;
  string local_2a28 [32];
  cl_api_clGetGLContextInfoKHR local_2a08;
  cl_api_clGetExtensionFunctionAddress *local_2a00;
  allocator local_29f1;
  string local_29f0 [32];
  string local_29d0 [32];
  string local_29b0 [39];
  allocator local_2989;
  string local_2988 [32];
  cl_api_clGetExtensionFunctionAddress local_2968;
  byte local_2959;
  cl_api_clEnqueueBarrier *local_2958;
  allocator local_2949;
  string local_2948 [32];
  string local_2928 [32];
  string local_2908 [39];
  allocator local_28e1;
  string local_28e0 [32];
  cl_api_clEnqueueBarrier local_28c0;
  cl_api_clEnqueueWaitForEvents *local_28b8;
  allocator local_28a9;
  string local_28a8 [32];
  string local_2888 [32];
  string local_2868 [39];
  allocator local_2841;
  string local_2840 [32];
  cl_api_clEnqueueWaitForEvents local_2820;
  cl_api_clEnqueueMarker *local_2818;
  allocator local_2809;
  string local_2808 [32];
  string local_27e8 [32];
  string local_27c8 [39];
  allocator local_27a1;
  string local_27a0 [32];
  cl_api_clEnqueueMarker local_2780;
  cl_api_clEnqueueNativeKernel *local_2778;
  allocator local_2769;
  string local_2768 [32];
  string local_2748 [32];
  string local_2728 [39];
  allocator local_2701;
  string local_2700 [32];
  cl_api_clEnqueueNativeKernel local_26e0;
  cl_api_clEnqueueTask *local_26d8;
  allocator local_26c9;
  string local_26c8 [32];
  string local_26a8 [32];
  string local_2688 [39];
  allocator local_2661;
  string local_2660 [32];
  cl_api_clEnqueueTask local_2640;
  cl_api_clEnqueueNDRangeKernel *local_2638;
  allocator local_2629;
  string local_2628 [32];
  string local_2608 [32];
  string local_25e8 [39];
  allocator local_25c1;
  string local_25c0 [32];
  cl_api_clEnqueueNDRangeKernel local_25a0;
  cl_api_clEnqueueUnmapMemObject *local_2598;
  allocator local_2589;
  string local_2588 [32];
  string local_2568 [32];
  string local_2548 [39];
  allocator local_2521;
  string local_2520 [32];
  cl_api_clEnqueueUnmapMemObject local_2500;
  cl_api_clEnqueueMapImage *local_24f8;
  allocator local_24e9;
  string local_24e8 [32];
  string local_24c8 [32];
  string local_24a8 [39];
  allocator local_2481;
  string local_2480 [32];
  cl_api_clEnqueueMapImage local_2460;
  cl_api_clEnqueueMapBuffer *local_2458;
  allocator local_2449;
  string local_2448 [32];
  string local_2428 [32];
  string local_2408 [39];
  allocator local_23e1;
  string local_23e0 [32];
  cl_api_clEnqueueMapBuffer local_23c0;
  cl_api_clEnqueueCopyBufferToImage *local_23b8;
  allocator local_23a9;
  string local_23a8 [32];
  string local_2388 [32];
  string local_2368 [39];
  allocator local_2341;
  string local_2340 [32];
  cl_api_clEnqueueCopyBufferToImage local_2320;
  cl_api_clEnqueueCopyImageToBuffer *local_2318;
  allocator local_2309;
  string local_2308 [32];
  string local_22e8 [32];
  string local_22c8 [39];
  allocator local_22a1;
  string local_22a0 [32];
  cl_api_clEnqueueCopyImageToBuffer local_2280;
  cl_api_clEnqueueCopyImage *local_2278;
  allocator local_2269;
  string local_2268 [32];
  string local_2248 [32];
  string local_2228 [39];
  allocator local_2201;
  string local_2200 [32];
  cl_api_clEnqueueCopyImage local_21e0;
  cl_api_clEnqueueWriteImage *local_21d8;
  allocator local_21c9;
  string local_21c8 [32];
  string local_21a8 [32];
  string local_2188 [39];
  allocator local_2161;
  string local_2160 [32];
  cl_api_clEnqueueWriteImage local_2140;
  cl_api_clEnqueueReadImage *local_2138;
  allocator local_2129;
  string local_2128 [32];
  string local_2108 [32];
  string local_20e8 [39];
  allocator local_20c1;
  string local_20c0 [32];
  cl_api_clEnqueueReadImage local_20a0;
  cl_api_clEnqueueCopyBuffer *local_2098;
  allocator local_2089;
  string local_2088 [32];
  string local_2068 [32];
  string local_2048 [39];
  allocator local_2021;
  string local_2020 [32];
  cl_api_clEnqueueCopyBuffer local_2000;
  cl_api_clEnqueueWriteBuffer *local_1ff8;
  allocator local_1fe9;
  string local_1fe8 [32];
  string local_1fc8 [32];
  string local_1fa8 [39];
  allocator local_1f81;
  string local_1f80 [32];
  cl_api_clEnqueueWriteBuffer local_1f60;
  cl_api_clEnqueueReadBuffer *local_1f58;
  allocator local_1f49;
  string local_1f48 [32];
  string local_1f28 [32];
  string local_1f08 [39];
  allocator local_1ee1;
  string local_1ee0 [32];
  cl_api_clEnqueueReadBuffer local_1ec0;
  cl_api_clFinish *local_1eb8;
  allocator local_1ea9;
  string local_1ea8 [32];
  string local_1e88 [32];
  string local_1e68 [39];
  allocator local_1e41;
  string local_1e40 [32];
  cl_api_clFinish local_1e20;
  cl_api_clFlush *local_1e18;
  allocator local_1e09;
  string local_1e08 [32];
  string local_1de8 [32];
  string local_1dc8 [39];
  allocator local_1da1;
  string local_1da0 [32];
  cl_api_clFlush local_1d80;
  cl_api_clGetEventProfilingInfo *local_1d78;
  allocator local_1d69;
  string local_1d68 [32];
  string local_1d48 [32];
  string local_1d28 [39];
  allocator local_1d01;
  string local_1d00 [32];
  cl_api_clGetEventProfilingInfo local_1ce0;
  cl_api_clReleaseEvent *local_1cd8;
  allocator local_1cc9;
  string local_1cc8 [32];
  string local_1ca8 [32];
  string local_1c88 [39];
  allocator local_1c61;
  string local_1c60 [32];
  cl_api_clReleaseEvent local_1c40;
  cl_api_clRetainEvent *local_1c38;
  allocator local_1c29;
  string local_1c28 [32];
  string local_1c08 [32];
  string local_1be8 [39];
  allocator local_1bc1;
  string local_1bc0 [32];
  cl_api_clRetainEvent local_1ba0;
  cl_api_clGetEventInfo *local_1b98;
  allocator local_1b89;
  string local_1b88 [32];
  string local_1b68 [32];
  string local_1b48 [39];
  allocator local_1b21;
  string local_1b20 [32];
  cl_api_clGetEventInfo local_1b00;
  cl_api_clWaitForEvents *local_1af8;
  allocator local_1ae9;
  string local_1ae8 [32];
  string local_1ac8 [32];
  string local_1aa8 [39];
  allocator local_1a81;
  string local_1a80 [32];
  cl_api_clWaitForEvents local_1a60;
  cl_api_clGetKernelWorkGroupInfo *local_1a58;
  allocator local_1a49;
  string local_1a48 [32];
  string local_1a28 [32];
  string local_1a08 [39];
  allocator local_19e1;
  string local_19e0 [32];
  cl_api_clGetKernelWorkGroupInfo local_19c0;
  cl_api_clGetKernelInfo *local_19b8;
  allocator local_19a9;
  string local_19a8 [32];
  string local_1988 [32];
  string local_1968 [39];
  allocator local_1941;
  string local_1940 [32];
  cl_api_clGetKernelInfo local_1920;
  cl_api_clSetKernelArg *local_1918;
  allocator local_1909;
  string local_1908 [32];
  string local_18e8 [32];
  string local_18c8 [39];
  allocator local_18a1;
  string local_18a0 [32];
  cl_api_clSetKernelArg local_1880;
  cl_api_clReleaseKernel *local_1878;
  allocator local_1869;
  string local_1868 [32];
  string local_1848 [32];
  string local_1828 [39];
  allocator local_1801;
  string local_1800 [32];
  cl_api_clReleaseKernel local_17e0;
  cl_api_clRetainKernel *local_17d8;
  allocator local_17c9;
  string local_17c8 [32];
  string local_17a8 [32];
  string local_1788 [39];
  allocator local_1761;
  string local_1760 [32];
  cl_api_clRetainKernel local_1740;
  cl_api_clCreateKernelsInProgram *local_1738;
  allocator local_1729;
  string local_1728 [32];
  string local_1708 [32];
  string local_16e8 [39];
  allocator local_16c1;
  string local_16c0 [32];
  cl_api_clCreateKernelsInProgram local_16a0;
  cl_api_clCreateKernel *local_1698;
  allocator local_1689;
  string local_1688 [32];
  string local_1668 [32];
  string local_1648 [39];
  allocator local_1621;
  string local_1620 [32];
  cl_api_clCreateKernel local_1600;
  cl_api_clGetProgramBuildInfo *local_15f8;
  allocator local_15e9;
  string local_15e8 [32];
  string local_15c8 [32];
  string local_15a8 [39];
  allocator local_1581;
  string local_1580 [32];
  cl_api_clGetProgramBuildInfo local_1560;
  cl_api_clGetProgramInfo *local_1558;
  allocator local_1549;
  string local_1548 [32];
  string local_1528 [32];
  string local_1508 [39];
  allocator local_14e1;
  string local_14e0 [32];
  cl_api_clGetProgramInfo local_14c0;
  cl_api_clUnloadCompiler *local_14b8;
  allocator local_14a9;
  string local_14a8 [32];
  string local_1488 [32];
  string local_1468 [39];
  allocator local_1441;
  string local_1440 [32];
  cl_api_clUnloadCompiler local_1420;
  cl_api_clBuildProgram *local_1418;
  allocator local_1409;
  string local_1408 [32];
  string local_13e8 [32];
  string local_13c8 [39];
  allocator local_13a1;
  string local_13a0 [32];
  cl_api_clBuildProgram local_1380;
  cl_api_clReleaseProgram *local_1378;
  allocator local_1369;
  string local_1368 [32];
  string local_1348 [32];
  string local_1328 [39];
  allocator local_1301;
  string local_1300 [32];
  cl_api_clReleaseProgram local_12e0;
  cl_api_clRetainProgram *local_12d8;
  allocator local_12c9;
  string local_12c8 [32];
  string local_12a8 [32];
  string local_1288 [39];
  allocator local_1261;
  string local_1260 [32];
  cl_api_clRetainProgram local_1240;
  cl_api_clCreateProgramWithBinary *local_1238;
  allocator local_1229;
  string local_1228 [32];
  string local_1208 [32];
  string local_11e8 [39];
  allocator local_11c1;
  string local_11c0 [32];
  cl_api_clCreateProgramWithBinary local_11a0;
  cl_api_clCreateProgramWithSource *local_1198;
  allocator local_1189;
  string local_1188 [32];
  string local_1168 [32];
  string local_1148 [39];
  allocator local_1121;
  string local_1120 [32];
  cl_api_clCreateProgramWithSource local_1100;
  cl_api_clGetSamplerInfo *local_10f8;
  allocator local_10e9;
  string local_10e8 [32];
  string local_10c8 [32];
  string local_10a8 [39];
  allocator local_1081;
  string local_1080 [32];
  cl_api_clGetSamplerInfo local_1060;
  cl_api_clReleaseSampler *local_1058;
  allocator local_1049;
  string local_1048 [32];
  string local_1028 [32];
  string local_1008 [39];
  allocator local_fe1;
  string local_fe0 [32];
  cl_api_clReleaseSampler local_fc0;
  cl_api_clRetainSampler *local_fb8;
  allocator local_fa9;
  string local_fa8 [32];
  string local_f88 [32];
  string local_f68 [39];
  allocator local_f41;
  string local_f40 [32];
  cl_api_clRetainSampler local_f20;
  cl_api_clCreateSampler *local_f18;
  allocator local_f09;
  string local_f08 [32];
  string local_ee8 [32];
  string local_ec8 [39];
  allocator local_ea1;
  string local_ea0 [32];
  cl_api_clCreateSampler local_e80;
  cl_api_clGetImageInfo *local_e78;
  allocator local_e69;
  string local_e68 [32];
  string local_e48 [32];
  string local_e28 [39];
  allocator local_e01;
  string local_e00 [32];
  cl_api_clGetImageInfo local_de0;
  cl_api_clGetMemObjectInfo *local_dd8;
  allocator local_dc9;
  string local_dc8 [32];
  string local_da8 [32];
  string local_d88 [39];
  allocator local_d61;
  string local_d60 [32];
  cl_api_clGetMemObjectInfo local_d40;
  cl_api_clGetSupportedImageFormats *local_d38;
  allocator local_d29;
  string local_d28 [32];
  string local_d08 [32];
  string local_ce8 [39];
  allocator local_cc1;
  string local_cc0 [32];
  cl_api_clGetSupportedImageFormats local_ca0;
  cl_api_clReleaseMemObject *local_c98;
  allocator local_c89;
  string local_c88 [32];
  string local_c68 [32];
  string local_c48 [39];
  allocator local_c21;
  string local_c20 [32];
  cl_api_clReleaseMemObject local_c00;
  cl_api_clRetainMemObject *local_bf8;
  allocator local_be9;
  string local_be8 [32];
  string local_bc8 [32];
  string local_ba8 [39];
  allocator local_b81;
  string local_b80 [32];
  cl_api_clRetainMemObject local_b60;
  cl_api_clCreateImage3D *local_b58;
  allocator local_b49;
  string local_b48 [32];
  string local_b28 [32];
  string local_b08 [39];
  allocator local_ae1;
  string local_ae0 [32];
  cl_api_clCreateImage3D local_ac0;
  cl_api_clCreateImage2D *local_ab8;
  allocator local_aa9;
  string local_aa8 [32];
  string local_a88 [32];
  string local_a68 [39];
  allocator local_a41;
  string local_a40 [32];
  cl_api_clCreateImage2D local_a20;
  cl_api_clCreateBuffer *local_a18;
  allocator local_a09;
  string local_a08 [32];
  string local_9e8 [32];
  string local_9c8 [39];
  allocator local_9a1;
  string local_9a0 [32];
  cl_api_clCreateBuffer local_980;
  cl_api_clSetCommandQueueProperty *local_978;
  allocator local_969;
  string local_968 [32];
  string local_948 [32];
  string local_928 [39];
  allocator local_901;
  string local_900 [32];
  cl_api_clSetCommandQueueProperty local_8e0;
  cl_api_clGetCommandQueueInfo *local_8d8;
  allocator local_8c9;
  string local_8c8 [32];
  string local_8a8 [32];
  string local_888 [39];
  allocator local_861;
  string local_860 [32];
  cl_api_clGetCommandQueueInfo local_840;
  cl_api_clReleaseCommandQueue *local_838;
  allocator local_829;
  string local_828 [32];
  string local_808 [32];
  string local_7e8 [39];
  allocator local_7c1;
  string local_7c0 [32];
  cl_api_clReleaseCommandQueue local_7a0;
  cl_api_clRetainCommandQueue *local_798;
  allocator local_789;
  string local_788 [32];
  string local_768 [32];
  string local_748 [39];
  allocator local_721;
  string local_720 [32];
  cl_api_clRetainCommandQueue local_700;
  cl_api_clCreateCommandQueue *local_6f8;
  allocator local_6e9;
  string local_6e8 [32];
  string local_6c8 [32];
  string local_6a8 [39];
  allocator local_681;
  string local_680 [32];
  cl_api_clCreateCommandQueue local_660;
  cl_api_clGetContextInfo *local_658;
  allocator local_649;
  string local_648 [32];
  string local_628 [32];
  string local_608 [39];
  allocator local_5e1;
  string local_5e0 [32];
  cl_api_clGetContextInfo local_5c0;
  cl_api_clReleaseContext *local_5b8;
  allocator local_5a9;
  string local_5a8 [32];
  string local_588 [32];
  string local_568 [39];
  allocator local_541;
  string local_540 [32];
  cl_api_clReleaseContext local_520;
  cl_api_clRetainContext *local_518;
  allocator local_509;
  string local_508 [32];
  string local_4e8 [32];
  string local_4c8 [39];
  allocator local_4a1;
  string local_4a0 [32];
  cl_api_clRetainContext local_480;
  cl_api_clCreateContextFromType *local_478;
  allocator local_469;
  string local_468 [32];
  string local_448 [32];
  string local_428 [39];
  allocator local_401;
  string local_400 [32];
  cl_api_clCreateContextFromType local_3e0;
  cl_api_clCreateContext *local_3d8;
  allocator local_3c9;
  string local_3c8 [32];
  string local_3a8 [32];
  string local_388 [39];
  allocator local_361;
  string local_360 [32];
  cl_api_clCreateContext local_340;
  cl_api_clGetDeviceInfo *local_338;
  allocator local_329;
  string local_328 [32];
  string local_308 [32];
  string local_2e8 [39];
  allocator local_2c1;
  string local_2c0 [32];
  cl_api_clGetDeviceInfo local_2a0;
  cl_api_clGetDeviceIDs *local_298;
  allocator local_289;
  string local_288 [32];
  string local_268 [32];
  string local_248 [39];
  allocator local_221;
  string local_220 [32];
  cl_api_clGetDeviceIDs local_200;
  cl_api_clGetPlatformInfo *local_1f8;
  allocator local_1e9;
  string local_1e8 [32];
  string local_1c8 [32];
  string local_1a8 [39];
  allocator local_181;
  string local_180 [32];
  cl_api_clGetPlatformInfo local_160;
  cl_icd_dispatch *local_158;
  allocator local_149;
  string local_148 [32];
  string local_128 [32];
  string local_108 [39];
  allocator local_e1;
  string local_e0 [32];
  cl_api_clGetPlatformIDs local_c0;
  allocator local_b1;
  string local_b0 [32];
  string local_90 [32];
  string local_70 [55];
  allocator local_39;
  string local_38 [39];
  byte local_11;
  
  local_11 = 1;
  OS(in_RDI);
  pcVar1 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,pcVar1,&local_39);
  pvVar2 = ::OS::Services_Common::LoadLibrary
                     ((Services_Common *)in_stack_ffffffffffff9e30,in_stack_ffffffffffff9e28);
  in_RDI->m_OpenCLLibraryHandle = pvVar2;
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  if (in_RDI->m_OpenCLLibraryHandle == (void *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b0,"Couldn\'t load library: ",&local_b1);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffff9e38,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffff9e30);
    dVar126 = (double)std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)in_stack_ffffffffffff9e38,(char *)in_stack_ffffffffffff9e30)
    ;
    log(in_RDI,dVar126);
    std::__cxx11::string::~string(local_70);
    std::__cxx11::string::~string(local_90);
    std::__cxx11::string::~string(local_b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_b1);
    local_11 = 0;
  }
  if ((local_11 & 1) != 0) {
    OS(in_RDI);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_e0,"clGetPlatformIDs",&local_e1);
    p_Var3 = (cl_api_clGetPlatformIDs)
             ::OS::Services_Common::GetFunctionPointer
                       (in_stack_ffffffffffff9e38,in_stack_ffffffffffff9e30,
                        in_stack_ffffffffffff9e28);
    std::__cxx11::string::~string(local_e0);
    std::allocator<char>::~allocator((allocator<char> *)&local_e1);
    local_c0 = p_Var3;
    if (p_Var3 == (cl_api_clGetPlatformIDs)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_148,"Couldn\'t get exported function pointer to: ",&local_149);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffff9e38,(char *)in_stack_ffffffffffff9e30);
      dVar126 = (double)std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)in_stack_ffffffffffff9e38,
                                       (char *)in_stack_ffffffffffff9e30);
      log(in_RDI,dVar126);
      std::__cxx11::string::~string(local_108);
      std::__cxx11::string::~string(local_128);
      std::__cxx11::string::~string(local_148);
      std::allocator<char>::~allocator((allocator<char> *)&local_149);
      local_11 = 0;
    }
    else {
      local_158 = &in_RDI->m_Dispatch;
      local_158->clGetPlatformIDs = p_Var3;
    }
    OS(in_RDI);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_180,"clGetPlatformInfo",&local_181);
    p_Var4 = (cl_api_clGetPlatformInfo)
             ::OS::Services_Common::GetFunctionPointer
                       (in_stack_ffffffffffff9e38,in_stack_ffffffffffff9e30,
                        in_stack_ffffffffffff9e28);
    std::__cxx11::string::~string(local_180);
    std::allocator<char>::~allocator((allocator<char> *)&local_181);
    local_160 = p_Var4;
    if (p_Var4 == (cl_api_clGetPlatformInfo)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_1e8,"Couldn\'t get exported function pointer to: ",&local_1e9);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffff9e38,(char *)in_stack_ffffffffffff9e30);
      dVar126 = (double)std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)in_stack_ffffffffffff9e38,
                                       (char *)in_stack_ffffffffffff9e30);
      log(in_RDI,dVar126);
      std::__cxx11::string::~string(local_1a8);
      std::__cxx11::string::~string(local_1c8);
      std::__cxx11::string::~string(local_1e8);
      std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
      local_11 = 0;
    }
    else {
      local_1f8 = &(in_RDI->m_Dispatch).clGetPlatformInfo;
      *local_1f8 = p_Var4;
    }
    OS(in_RDI);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_220,"clGetDeviceIDs",&local_221);
    p_Var5 = (cl_api_clGetDeviceIDs)
             ::OS::Services_Common::GetFunctionPointer
                       (in_stack_ffffffffffff9e38,in_stack_ffffffffffff9e30,
                        in_stack_ffffffffffff9e28);
    std::__cxx11::string::~string(local_220);
    std::allocator<char>::~allocator((allocator<char> *)&local_221);
    local_200 = p_Var5;
    if (p_Var5 == (cl_api_clGetDeviceIDs)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_288,"Couldn\'t get exported function pointer to: ",&local_289);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffff9e38,(char *)in_stack_ffffffffffff9e30);
      dVar126 = (double)std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)in_stack_ffffffffffff9e38,
                                       (char *)in_stack_ffffffffffff9e30);
      log(in_RDI,dVar126);
      std::__cxx11::string::~string(local_248);
      std::__cxx11::string::~string(local_268);
      std::__cxx11::string::~string(local_288);
      std::allocator<char>::~allocator((allocator<char> *)&local_289);
      local_11 = 0;
    }
    else {
      local_298 = &(in_RDI->m_Dispatch).clGetDeviceIDs;
      *local_298 = p_Var5;
    }
    OS(in_RDI);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2c0,"clGetDeviceInfo",&local_2c1);
    p_Var6 = (cl_api_clGetDeviceInfo)
             ::OS::Services_Common::GetFunctionPointer
                       (in_stack_ffffffffffff9e38,in_stack_ffffffffffff9e30,
                        in_stack_ffffffffffff9e28);
    std::__cxx11::string::~string(local_2c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_2c1);
    local_2a0 = p_Var6;
    if (p_Var6 == (cl_api_clGetDeviceInfo)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_328,"Couldn\'t get exported function pointer to: ",&local_329);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffff9e38,(char *)in_stack_ffffffffffff9e30);
      dVar126 = (double)std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)in_stack_ffffffffffff9e38,
                                       (char *)in_stack_ffffffffffff9e30);
      log(in_RDI,dVar126);
      std::__cxx11::string::~string(local_2e8);
      std::__cxx11::string::~string(local_308);
      std::__cxx11::string::~string(local_328);
      std::allocator<char>::~allocator((allocator<char> *)&local_329);
      local_11 = 0;
    }
    else {
      local_338 = &(in_RDI->m_Dispatch).clGetDeviceInfo;
      *local_338 = p_Var6;
    }
    OS(in_RDI);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_360,"clCreateContext",&local_361);
    p_Var7 = (cl_api_clCreateContext)
             ::OS::Services_Common::GetFunctionPointer
                       (in_stack_ffffffffffff9e38,in_stack_ffffffffffff9e30,
                        in_stack_ffffffffffff9e28);
    std::__cxx11::string::~string(local_360);
    std::allocator<char>::~allocator((allocator<char> *)&local_361);
    local_340 = p_Var7;
    if (p_Var7 == (cl_api_clCreateContext)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_3c8,"Couldn\'t get exported function pointer to: ",&local_3c9);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffff9e38,(char *)in_stack_ffffffffffff9e30);
      dVar126 = (double)std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)in_stack_ffffffffffff9e38,
                                       (char *)in_stack_ffffffffffff9e30);
      log(in_RDI,dVar126);
      std::__cxx11::string::~string(local_388);
      std::__cxx11::string::~string(local_3a8);
      std::__cxx11::string::~string(local_3c8);
      std::allocator<char>::~allocator((allocator<char> *)&local_3c9);
      local_11 = 0;
    }
    else {
      local_3d8 = &(in_RDI->m_Dispatch).clCreateContext;
      *local_3d8 = p_Var7;
    }
    OS(in_RDI);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_400,"clCreateContextFromType",&local_401);
    p_Var8 = (cl_api_clCreateContextFromType)
             ::OS::Services_Common::GetFunctionPointer
                       (in_stack_ffffffffffff9e38,in_stack_ffffffffffff9e30,
                        in_stack_ffffffffffff9e28);
    std::__cxx11::string::~string(local_400);
    std::allocator<char>::~allocator((allocator<char> *)&local_401);
    local_3e0 = p_Var8;
    if (p_Var8 == (cl_api_clCreateContextFromType)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_468,"Couldn\'t get exported function pointer to: ",&local_469);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffff9e38,(char *)in_stack_ffffffffffff9e30);
      dVar126 = (double)std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)in_stack_ffffffffffff9e38,
                                       (char *)in_stack_ffffffffffff9e30);
      log(in_RDI,dVar126);
      std::__cxx11::string::~string(local_428);
      std::__cxx11::string::~string(local_448);
      std::__cxx11::string::~string(local_468);
      std::allocator<char>::~allocator((allocator<char> *)&local_469);
      local_11 = 0;
    }
    else {
      local_478 = &(in_RDI->m_Dispatch).clCreateContextFromType;
      *local_478 = p_Var8;
    }
    OS(in_RDI);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_4a0,"clRetainContext",&local_4a1);
    p_Var9 = (cl_api_clRetainContext)
             ::OS::Services_Common::GetFunctionPointer
                       (in_stack_ffffffffffff9e38,in_stack_ffffffffffff9e30,
                        in_stack_ffffffffffff9e28);
    std::__cxx11::string::~string(local_4a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_4a1);
    local_480 = p_Var9;
    if (p_Var9 == (cl_api_clRetainContext)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_508,"Couldn\'t get exported function pointer to: ",&local_509);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffff9e38,(char *)in_stack_ffffffffffff9e30);
      dVar126 = (double)std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)in_stack_ffffffffffff9e38,
                                       (char *)in_stack_ffffffffffff9e30);
      log(in_RDI,dVar126);
      std::__cxx11::string::~string(local_4c8);
      std::__cxx11::string::~string(local_4e8);
      std::__cxx11::string::~string(local_508);
      std::allocator<char>::~allocator((allocator<char> *)&local_509);
      local_11 = 0;
    }
    else {
      local_518 = &(in_RDI->m_Dispatch).clRetainContext;
      *local_518 = p_Var9;
    }
    OS(in_RDI);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_540,"clReleaseContext",&local_541);
    p_Var10 = (cl_api_clReleaseContext)
              ::OS::Services_Common::GetFunctionPointer
                        (in_stack_ffffffffffff9e38,in_stack_ffffffffffff9e30,
                         in_stack_ffffffffffff9e28);
    std::__cxx11::string::~string(local_540);
    std::allocator<char>::~allocator((allocator<char> *)&local_541);
    local_520 = p_Var10;
    if (p_Var10 == (cl_api_clReleaseContext)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_5a8,"Couldn\'t get exported function pointer to: ",&local_5a9);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffff9e38,(char *)in_stack_ffffffffffff9e30);
      dVar126 = (double)std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)in_stack_ffffffffffff9e38,
                                       (char *)in_stack_ffffffffffff9e30);
      log(in_RDI,dVar126);
      std::__cxx11::string::~string(local_568);
      std::__cxx11::string::~string(local_588);
      std::__cxx11::string::~string(local_5a8);
      std::allocator<char>::~allocator((allocator<char> *)&local_5a9);
      local_11 = 0;
    }
    else {
      local_5b8 = &(in_RDI->m_Dispatch).clReleaseContext;
      *local_5b8 = p_Var10;
    }
    OS(in_RDI);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_5e0,"clGetContextInfo",&local_5e1);
    p_Var11 = (cl_api_clGetContextInfo)
              ::OS::Services_Common::GetFunctionPointer
                        (in_stack_ffffffffffff9e38,in_stack_ffffffffffff9e30,
                         in_stack_ffffffffffff9e28);
    std::__cxx11::string::~string(local_5e0);
    std::allocator<char>::~allocator((allocator<char> *)&local_5e1);
    local_5c0 = p_Var11;
    if (p_Var11 == (cl_api_clGetContextInfo)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_648,"Couldn\'t get exported function pointer to: ",&local_649);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffff9e38,(char *)in_stack_ffffffffffff9e30);
      dVar126 = (double)std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)in_stack_ffffffffffff9e38,
                                       (char *)in_stack_ffffffffffff9e30);
      log(in_RDI,dVar126);
      std::__cxx11::string::~string(local_608);
      std::__cxx11::string::~string(local_628);
      std::__cxx11::string::~string(local_648);
      std::allocator<char>::~allocator((allocator<char> *)&local_649);
      local_11 = 0;
    }
    else {
      local_658 = &(in_RDI->m_Dispatch).clGetContextInfo;
      *local_658 = p_Var11;
    }
    OS(in_RDI);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_680,"clCreateCommandQueue",&local_681);
    p_Var12 = (cl_api_clCreateCommandQueue)
              ::OS::Services_Common::GetFunctionPointer
                        (in_stack_ffffffffffff9e38,in_stack_ffffffffffff9e30,
                         in_stack_ffffffffffff9e28);
    std::__cxx11::string::~string(local_680);
    std::allocator<char>::~allocator((allocator<char> *)&local_681);
    local_660 = p_Var12;
    if (p_Var12 == (cl_api_clCreateCommandQueue)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_6e8,"Couldn\'t get exported function pointer to: ",&local_6e9);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffff9e38,(char *)in_stack_ffffffffffff9e30);
      dVar126 = (double)std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)in_stack_ffffffffffff9e38,
                                       (char *)in_stack_ffffffffffff9e30);
      log(in_RDI,dVar126);
      std::__cxx11::string::~string(local_6a8);
      std::__cxx11::string::~string(local_6c8);
      std::__cxx11::string::~string(local_6e8);
      std::allocator<char>::~allocator((allocator<char> *)&local_6e9);
      local_11 = 0;
    }
    else {
      local_6f8 = &(in_RDI->m_Dispatch).clCreateCommandQueue;
      *local_6f8 = p_Var12;
    }
    OS(in_RDI);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_720,"clRetainCommandQueue",&local_721);
    p_Var13 = (cl_api_clRetainCommandQueue)
              ::OS::Services_Common::GetFunctionPointer
                        (in_stack_ffffffffffff9e38,in_stack_ffffffffffff9e30,
                         in_stack_ffffffffffff9e28);
    std::__cxx11::string::~string(local_720);
    std::allocator<char>::~allocator((allocator<char> *)&local_721);
    local_700 = p_Var13;
    if (p_Var13 == (cl_api_clRetainCommandQueue)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_788,"Couldn\'t get exported function pointer to: ",&local_789);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffff9e38,(char *)in_stack_ffffffffffff9e30);
      dVar126 = (double)std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)in_stack_ffffffffffff9e38,
                                       (char *)in_stack_ffffffffffff9e30);
      log(in_RDI,dVar126);
      std::__cxx11::string::~string(local_748);
      std::__cxx11::string::~string(local_768);
      std::__cxx11::string::~string(local_788);
      std::allocator<char>::~allocator((allocator<char> *)&local_789);
      local_11 = 0;
    }
    else {
      local_798 = &(in_RDI->m_Dispatch).clRetainCommandQueue;
      *local_798 = p_Var13;
    }
    OS(in_RDI);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_7c0,"clReleaseCommandQueue",&local_7c1);
    p_Var14 = (cl_api_clReleaseCommandQueue)
              ::OS::Services_Common::GetFunctionPointer
                        (in_stack_ffffffffffff9e38,in_stack_ffffffffffff9e30,
                         in_stack_ffffffffffff9e28);
    std::__cxx11::string::~string(local_7c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_7c1);
    local_7a0 = p_Var14;
    if (p_Var14 == (cl_api_clReleaseCommandQueue)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_828,"Couldn\'t get exported function pointer to: ",&local_829);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffff9e38,(char *)in_stack_ffffffffffff9e30);
      dVar126 = (double)std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)in_stack_ffffffffffff9e38,
                                       (char *)in_stack_ffffffffffff9e30);
      log(in_RDI,dVar126);
      std::__cxx11::string::~string(local_7e8);
      std::__cxx11::string::~string(local_808);
      std::__cxx11::string::~string(local_828);
      std::allocator<char>::~allocator((allocator<char> *)&local_829);
      local_11 = 0;
    }
    else {
      local_838 = &(in_RDI->m_Dispatch).clReleaseCommandQueue;
      *local_838 = p_Var14;
    }
    OS(in_RDI);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_860,"clGetCommandQueueInfo",&local_861);
    p_Var15 = (cl_api_clGetCommandQueueInfo)
              ::OS::Services_Common::GetFunctionPointer
                        (in_stack_ffffffffffff9e38,in_stack_ffffffffffff9e30,
                         in_stack_ffffffffffff9e28);
    std::__cxx11::string::~string(local_860);
    std::allocator<char>::~allocator((allocator<char> *)&local_861);
    local_840 = p_Var15;
    if (p_Var15 == (cl_api_clGetCommandQueueInfo)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_8c8,"Couldn\'t get exported function pointer to: ",&local_8c9);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffff9e38,(char *)in_stack_ffffffffffff9e30);
      dVar126 = (double)std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)in_stack_ffffffffffff9e38,
                                       (char *)in_stack_ffffffffffff9e30);
      log(in_RDI,dVar126);
      std::__cxx11::string::~string(local_888);
      std::__cxx11::string::~string(local_8a8);
      std::__cxx11::string::~string(local_8c8);
      std::allocator<char>::~allocator((allocator<char> *)&local_8c9);
      local_11 = 0;
    }
    else {
      local_8d8 = &(in_RDI->m_Dispatch).clGetCommandQueueInfo;
      *local_8d8 = p_Var15;
    }
    OS(in_RDI);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_900,"clSetCommandQueueProperty",&local_901);
    p_Var16 = (cl_api_clSetCommandQueueProperty)
              ::OS::Services_Common::GetFunctionPointer
                        (in_stack_ffffffffffff9e38,in_stack_ffffffffffff9e30,
                         in_stack_ffffffffffff9e28);
    std::__cxx11::string::~string(local_900);
    std::allocator<char>::~allocator((allocator<char> *)&local_901);
    local_8e0 = p_Var16;
    if (p_Var16 == (cl_api_clSetCommandQueueProperty)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_968,"Couldn\'t get exported function pointer to: ",&local_969);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffff9e38,(char *)in_stack_ffffffffffff9e30);
      dVar126 = (double)std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)in_stack_ffffffffffff9e38,
                                       (char *)in_stack_ffffffffffff9e30);
      log(in_RDI,dVar126);
      std::__cxx11::string::~string(local_928);
      std::__cxx11::string::~string(local_948);
      std::__cxx11::string::~string(local_968);
      std::allocator<char>::~allocator((allocator<char> *)&local_969);
      local_11 = 0;
    }
    else {
      local_978 = &(in_RDI->m_Dispatch).clSetCommandQueueProperty;
      *local_978 = p_Var16;
    }
    OS(in_RDI);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_9a0,"clCreateBuffer",&local_9a1);
    p_Var17 = (cl_api_clCreateBuffer)
              ::OS::Services_Common::GetFunctionPointer
                        (in_stack_ffffffffffff9e38,in_stack_ffffffffffff9e30,
                         in_stack_ffffffffffff9e28);
    std::__cxx11::string::~string(local_9a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_9a1);
    local_980 = p_Var17;
    if (p_Var17 == (cl_api_clCreateBuffer)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_a08,"Couldn\'t get exported function pointer to: ",&local_a09);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffff9e38,(char *)in_stack_ffffffffffff9e30);
      dVar126 = (double)std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)in_stack_ffffffffffff9e38,
                                       (char *)in_stack_ffffffffffff9e30);
      log(in_RDI,dVar126);
      std::__cxx11::string::~string(local_9c8);
      std::__cxx11::string::~string(local_9e8);
      std::__cxx11::string::~string(local_a08);
      std::allocator<char>::~allocator((allocator<char> *)&local_a09);
      local_11 = 0;
    }
    else {
      local_a18 = &(in_RDI->m_Dispatch).clCreateBuffer;
      *local_a18 = p_Var17;
    }
    OS(in_RDI);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a40,"clCreateImage2D",&local_a41);
    p_Var18 = (cl_api_clCreateImage2D)
              ::OS::Services_Common::GetFunctionPointer
                        (in_stack_ffffffffffff9e38,in_stack_ffffffffffff9e30,
                         in_stack_ffffffffffff9e28);
    std::__cxx11::string::~string(local_a40);
    std::allocator<char>::~allocator((allocator<char> *)&local_a41);
    local_a20 = p_Var18;
    if (p_Var18 == (cl_api_clCreateImage2D)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_aa8,"Couldn\'t get exported function pointer to: ",&local_aa9);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffff9e38,(char *)in_stack_ffffffffffff9e30);
      dVar126 = (double)std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)in_stack_ffffffffffff9e38,
                                       (char *)in_stack_ffffffffffff9e30);
      log(in_RDI,dVar126);
      std::__cxx11::string::~string(local_a68);
      std::__cxx11::string::~string(local_a88);
      std::__cxx11::string::~string(local_aa8);
      std::allocator<char>::~allocator((allocator<char> *)&local_aa9);
      local_11 = 0;
    }
    else {
      local_ab8 = &(in_RDI->m_Dispatch).clCreateImage2D;
      *local_ab8 = p_Var18;
    }
    OS(in_RDI);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_ae0,"clCreateImage3D",&local_ae1);
    p_Var19 = (cl_api_clCreateImage3D)
              ::OS::Services_Common::GetFunctionPointer
                        (in_stack_ffffffffffff9e38,in_stack_ffffffffffff9e30,
                         in_stack_ffffffffffff9e28);
    std::__cxx11::string::~string(local_ae0);
    std::allocator<char>::~allocator((allocator<char> *)&local_ae1);
    local_ac0 = p_Var19;
    if (p_Var19 == (cl_api_clCreateImage3D)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_b48,"Couldn\'t get exported function pointer to: ",&local_b49);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffff9e38,(char *)in_stack_ffffffffffff9e30);
      dVar126 = (double)std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)in_stack_ffffffffffff9e38,
                                       (char *)in_stack_ffffffffffff9e30);
      log(in_RDI,dVar126);
      std::__cxx11::string::~string(local_b08);
      std::__cxx11::string::~string(local_b28);
      std::__cxx11::string::~string(local_b48);
      std::allocator<char>::~allocator((allocator<char> *)&local_b49);
      local_11 = 0;
    }
    else {
      local_b58 = &(in_RDI->m_Dispatch).clCreateImage3D;
      *local_b58 = p_Var19;
    }
    OS(in_RDI);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b80,"clRetainMemObject",&local_b81);
    p_Var20 = (cl_api_clRetainMemObject)
              ::OS::Services_Common::GetFunctionPointer
                        (in_stack_ffffffffffff9e38,in_stack_ffffffffffff9e30,
                         in_stack_ffffffffffff9e28);
    std::__cxx11::string::~string(local_b80);
    std::allocator<char>::~allocator((allocator<char> *)&local_b81);
    local_b60 = p_Var20;
    if (p_Var20 == (cl_api_clRetainMemObject)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_be8,"Couldn\'t get exported function pointer to: ",&local_be9);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffff9e38,(char *)in_stack_ffffffffffff9e30);
      dVar126 = (double)std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)in_stack_ffffffffffff9e38,
                                       (char *)in_stack_ffffffffffff9e30);
      log(in_RDI,dVar126);
      std::__cxx11::string::~string(local_ba8);
      std::__cxx11::string::~string(local_bc8);
      std::__cxx11::string::~string(local_be8);
      std::allocator<char>::~allocator((allocator<char> *)&local_be9);
      local_11 = 0;
    }
    else {
      local_bf8 = &(in_RDI->m_Dispatch).clRetainMemObject;
      *local_bf8 = p_Var20;
    }
    OS(in_RDI);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c20,"clReleaseMemObject",&local_c21);
    p_Var21 = (cl_api_clReleaseMemObject)
              ::OS::Services_Common::GetFunctionPointer
                        (in_stack_ffffffffffff9e38,in_stack_ffffffffffff9e30,
                         in_stack_ffffffffffff9e28);
    std::__cxx11::string::~string(local_c20);
    std::allocator<char>::~allocator((allocator<char> *)&local_c21);
    local_c00 = p_Var21;
    if (p_Var21 == (cl_api_clReleaseMemObject)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_c88,"Couldn\'t get exported function pointer to: ",&local_c89);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffff9e38,(char *)in_stack_ffffffffffff9e30);
      dVar126 = (double)std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)in_stack_ffffffffffff9e38,
                                       (char *)in_stack_ffffffffffff9e30);
      log(in_RDI,dVar126);
      std::__cxx11::string::~string(local_c48);
      std::__cxx11::string::~string(local_c68);
      std::__cxx11::string::~string(local_c88);
      std::allocator<char>::~allocator((allocator<char> *)&local_c89);
      local_11 = 0;
    }
    else {
      local_c98 = &(in_RDI->m_Dispatch).clReleaseMemObject;
      *local_c98 = p_Var21;
    }
    OS(in_RDI);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_cc0,"clGetSupportedImageFormats",&local_cc1);
    p_Var22 = (cl_api_clGetSupportedImageFormats)
              ::OS::Services_Common::GetFunctionPointer
                        (in_stack_ffffffffffff9e38,in_stack_ffffffffffff9e30,
                         in_stack_ffffffffffff9e28);
    std::__cxx11::string::~string(local_cc0);
    std::allocator<char>::~allocator((allocator<char> *)&local_cc1);
    local_ca0 = p_Var22;
    if (p_Var22 == (cl_api_clGetSupportedImageFormats)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_d28,"Couldn\'t get exported function pointer to: ",&local_d29);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffff9e38,(char *)in_stack_ffffffffffff9e30);
      dVar126 = (double)std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)in_stack_ffffffffffff9e38,
                                       (char *)in_stack_ffffffffffff9e30);
      log(in_RDI,dVar126);
      std::__cxx11::string::~string(local_ce8);
      std::__cxx11::string::~string(local_d08);
      std::__cxx11::string::~string(local_d28);
      std::allocator<char>::~allocator((allocator<char> *)&local_d29);
      local_11 = 0;
    }
    else {
      local_d38 = &(in_RDI->m_Dispatch).clGetSupportedImageFormats;
      *local_d38 = p_Var22;
    }
    OS(in_RDI);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_d60,"clGetMemObjectInfo",&local_d61);
    p_Var23 = (cl_api_clGetMemObjectInfo)
              ::OS::Services_Common::GetFunctionPointer
                        (in_stack_ffffffffffff9e38,in_stack_ffffffffffff9e30,
                         in_stack_ffffffffffff9e28);
    std::__cxx11::string::~string(local_d60);
    std::allocator<char>::~allocator((allocator<char> *)&local_d61);
    local_d40 = p_Var23;
    if (p_Var23 == (cl_api_clGetMemObjectInfo)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_dc8,"Couldn\'t get exported function pointer to: ",&local_dc9);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffff9e38,(char *)in_stack_ffffffffffff9e30);
      dVar126 = (double)std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)in_stack_ffffffffffff9e38,
                                       (char *)in_stack_ffffffffffff9e30);
      log(in_RDI,dVar126);
      std::__cxx11::string::~string(local_d88);
      std::__cxx11::string::~string(local_da8);
      std::__cxx11::string::~string(local_dc8);
      std::allocator<char>::~allocator((allocator<char> *)&local_dc9);
      local_11 = 0;
    }
    else {
      local_dd8 = &(in_RDI->m_Dispatch).clGetMemObjectInfo;
      *local_dd8 = p_Var23;
    }
    OS(in_RDI);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_e00,"clGetImageInfo",&local_e01);
    p_Var24 = (cl_api_clGetImageInfo)
              ::OS::Services_Common::GetFunctionPointer
                        (in_stack_ffffffffffff9e38,in_stack_ffffffffffff9e30,
                         in_stack_ffffffffffff9e28);
    std::__cxx11::string::~string(local_e00);
    std::allocator<char>::~allocator((allocator<char> *)&local_e01);
    local_de0 = p_Var24;
    if (p_Var24 == (cl_api_clGetImageInfo)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_e68,"Couldn\'t get exported function pointer to: ",&local_e69);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffff9e38,(char *)in_stack_ffffffffffff9e30);
      dVar126 = (double)std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)in_stack_ffffffffffff9e38,
                                       (char *)in_stack_ffffffffffff9e30);
      log(in_RDI,dVar126);
      std::__cxx11::string::~string(local_e28);
      std::__cxx11::string::~string(local_e48);
      std::__cxx11::string::~string(local_e68);
      std::allocator<char>::~allocator((allocator<char> *)&local_e69);
      local_11 = 0;
    }
    else {
      local_e78 = &(in_RDI->m_Dispatch).clGetImageInfo;
      *local_e78 = p_Var24;
    }
    OS(in_RDI);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_ea0,"clCreateSampler",&local_ea1);
    p_Var25 = (cl_api_clCreateSampler)
              ::OS::Services_Common::GetFunctionPointer
                        (in_stack_ffffffffffff9e38,in_stack_ffffffffffff9e30,
                         in_stack_ffffffffffff9e28);
    std::__cxx11::string::~string(local_ea0);
    std::allocator<char>::~allocator((allocator<char> *)&local_ea1);
    local_e80 = p_Var25;
    if (p_Var25 == (cl_api_clCreateSampler)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_f08,"Couldn\'t get exported function pointer to: ",&local_f09);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffff9e38,(char *)in_stack_ffffffffffff9e30);
      dVar126 = (double)std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)in_stack_ffffffffffff9e38,
                                       (char *)in_stack_ffffffffffff9e30);
      log(in_RDI,dVar126);
      std::__cxx11::string::~string(local_ec8);
      std::__cxx11::string::~string(local_ee8);
      std::__cxx11::string::~string(local_f08);
      std::allocator<char>::~allocator((allocator<char> *)&local_f09);
      local_11 = 0;
    }
    else {
      local_f18 = &(in_RDI->m_Dispatch).clCreateSampler;
      *local_f18 = p_Var25;
    }
    OS(in_RDI);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_f40,"clRetainSampler",&local_f41);
    p_Var26 = (cl_api_clRetainSampler)
              ::OS::Services_Common::GetFunctionPointer
                        (in_stack_ffffffffffff9e38,in_stack_ffffffffffff9e30,
                         in_stack_ffffffffffff9e28);
    std::__cxx11::string::~string(local_f40);
    std::allocator<char>::~allocator((allocator<char> *)&local_f41);
    local_f20 = p_Var26;
    if (p_Var26 == (cl_api_clRetainSampler)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_fa8,"Couldn\'t get exported function pointer to: ",&local_fa9);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffff9e38,(char *)in_stack_ffffffffffff9e30);
      dVar126 = (double)std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)in_stack_ffffffffffff9e38,
                                       (char *)in_stack_ffffffffffff9e30);
      log(in_RDI,dVar126);
      std::__cxx11::string::~string(local_f68);
      std::__cxx11::string::~string(local_f88);
      std::__cxx11::string::~string(local_fa8);
      std::allocator<char>::~allocator((allocator<char> *)&local_fa9);
      local_11 = 0;
    }
    else {
      local_fb8 = &(in_RDI->m_Dispatch).clRetainSampler;
      *local_fb8 = p_Var26;
    }
    OS(in_RDI);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_fe0,"clReleaseSampler",&local_fe1);
    p_Var27 = (cl_api_clReleaseSampler)
              ::OS::Services_Common::GetFunctionPointer
                        (in_stack_ffffffffffff9e38,in_stack_ffffffffffff9e30,
                         in_stack_ffffffffffff9e28);
    std::__cxx11::string::~string(local_fe0);
    std::allocator<char>::~allocator((allocator<char> *)&local_fe1);
    local_fc0 = p_Var27;
    if (p_Var27 == (cl_api_clReleaseSampler)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_1048,"Couldn\'t get exported function pointer to: ",&local_1049);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffff9e38,(char *)in_stack_ffffffffffff9e30);
      dVar126 = (double)std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)in_stack_ffffffffffff9e38,
                                       (char *)in_stack_ffffffffffff9e30);
      log(in_RDI,dVar126);
      std::__cxx11::string::~string(local_1008);
      std::__cxx11::string::~string(local_1028);
      std::__cxx11::string::~string(local_1048);
      std::allocator<char>::~allocator((allocator<char> *)&local_1049);
      local_11 = 0;
    }
    else {
      local_1058 = &(in_RDI->m_Dispatch).clReleaseSampler;
      *local_1058 = p_Var27;
    }
    OS(in_RDI);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1080,"clGetSamplerInfo",&local_1081);
    p_Var28 = (cl_api_clGetSamplerInfo)
              ::OS::Services_Common::GetFunctionPointer
                        (in_stack_ffffffffffff9e38,in_stack_ffffffffffff9e30,
                         in_stack_ffffffffffff9e28);
    std::__cxx11::string::~string(local_1080);
    std::allocator<char>::~allocator((allocator<char> *)&local_1081);
    local_1060 = p_Var28;
    if (p_Var28 == (cl_api_clGetSamplerInfo)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_10e8,"Couldn\'t get exported function pointer to: ",&local_10e9);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffff9e38,(char *)in_stack_ffffffffffff9e30);
      dVar126 = (double)std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)in_stack_ffffffffffff9e38,
                                       (char *)in_stack_ffffffffffff9e30);
      log(in_RDI,dVar126);
      std::__cxx11::string::~string(local_10a8);
      std::__cxx11::string::~string(local_10c8);
      std::__cxx11::string::~string(local_10e8);
      std::allocator<char>::~allocator((allocator<char> *)&local_10e9);
      local_11 = 0;
    }
    else {
      local_10f8 = &(in_RDI->m_Dispatch).clGetSamplerInfo;
      *local_10f8 = p_Var28;
    }
    OS(in_RDI);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1120,"clCreateProgramWithSource",&local_1121);
    p_Var29 = (cl_api_clCreateProgramWithSource)
              ::OS::Services_Common::GetFunctionPointer
                        (in_stack_ffffffffffff9e38,in_stack_ffffffffffff9e30,
                         in_stack_ffffffffffff9e28);
    std::__cxx11::string::~string(local_1120);
    std::allocator<char>::~allocator((allocator<char> *)&local_1121);
    local_1100 = p_Var29;
    if (p_Var29 == (cl_api_clCreateProgramWithSource)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_1188,"Couldn\'t get exported function pointer to: ",&local_1189);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffff9e38,(char *)in_stack_ffffffffffff9e30);
      dVar126 = (double)std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)in_stack_ffffffffffff9e38,
                                       (char *)in_stack_ffffffffffff9e30);
      log(in_RDI,dVar126);
      std::__cxx11::string::~string(local_1148);
      std::__cxx11::string::~string(local_1168);
      std::__cxx11::string::~string(local_1188);
      std::allocator<char>::~allocator((allocator<char> *)&local_1189);
      local_11 = 0;
    }
    else {
      local_1198 = &(in_RDI->m_Dispatch).clCreateProgramWithSource;
      *local_1198 = p_Var29;
    }
    OS(in_RDI);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_11c0,"clCreateProgramWithBinary",&local_11c1);
    p_Var30 = (cl_api_clCreateProgramWithBinary)
              ::OS::Services_Common::GetFunctionPointer
                        (in_stack_ffffffffffff9e38,in_stack_ffffffffffff9e30,
                         in_stack_ffffffffffff9e28);
    std::__cxx11::string::~string(local_11c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_11c1);
    local_11a0 = p_Var30;
    if (p_Var30 == (cl_api_clCreateProgramWithBinary)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_1228,"Couldn\'t get exported function pointer to: ",&local_1229);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffff9e38,(char *)in_stack_ffffffffffff9e30);
      dVar126 = (double)std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)in_stack_ffffffffffff9e38,
                                       (char *)in_stack_ffffffffffff9e30);
      log(in_RDI,dVar126);
      std::__cxx11::string::~string(local_11e8);
      std::__cxx11::string::~string(local_1208);
      std::__cxx11::string::~string(local_1228);
      std::allocator<char>::~allocator((allocator<char> *)&local_1229);
      local_11 = 0;
    }
    else {
      local_1238 = &(in_RDI->m_Dispatch).clCreateProgramWithBinary;
      *local_1238 = p_Var30;
    }
    OS(in_RDI);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1260,"clRetainProgram",&local_1261);
    p_Var31 = (cl_api_clRetainProgram)
              ::OS::Services_Common::GetFunctionPointer
                        (in_stack_ffffffffffff9e38,in_stack_ffffffffffff9e30,
                         in_stack_ffffffffffff9e28);
    std::__cxx11::string::~string(local_1260);
    std::allocator<char>::~allocator((allocator<char> *)&local_1261);
    local_1240 = p_Var31;
    if (p_Var31 == (cl_api_clRetainProgram)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_12c8,"Couldn\'t get exported function pointer to: ",&local_12c9);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffff9e38,(char *)in_stack_ffffffffffff9e30);
      dVar126 = (double)std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)in_stack_ffffffffffff9e38,
                                       (char *)in_stack_ffffffffffff9e30);
      log(in_RDI,dVar126);
      std::__cxx11::string::~string(local_1288);
      std::__cxx11::string::~string(local_12a8);
      std::__cxx11::string::~string(local_12c8);
      std::allocator<char>::~allocator((allocator<char> *)&local_12c9);
      local_11 = 0;
    }
    else {
      local_12d8 = &(in_RDI->m_Dispatch).clRetainProgram;
      *local_12d8 = p_Var31;
    }
    OS(in_RDI);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1300,"clReleaseProgram",&local_1301);
    p_Var32 = (cl_api_clReleaseProgram)
              ::OS::Services_Common::GetFunctionPointer
                        (in_stack_ffffffffffff9e38,in_stack_ffffffffffff9e30,
                         in_stack_ffffffffffff9e28);
    std::__cxx11::string::~string(local_1300);
    std::allocator<char>::~allocator((allocator<char> *)&local_1301);
    local_12e0 = p_Var32;
    if (p_Var32 == (cl_api_clReleaseProgram)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_1368,"Couldn\'t get exported function pointer to: ",&local_1369);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffff9e38,(char *)in_stack_ffffffffffff9e30);
      dVar126 = (double)std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)in_stack_ffffffffffff9e38,
                                       (char *)in_stack_ffffffffffff9e30);
      log(in_RDI,dVar126);
      std::__cxx11::string::~string(local_1328);
      std::__cxx11::string::~string(local_1348);
      std::__cxx11::string::~string(local_1368);
      std::allocator<char>::~allocator((allocator<char> *)&local_1369);
      local_11 = 0;
    }
    else {
      local_1378 = &(in_RDI->m_Dispatch).clReleaseProgram;
      *local_1378 = p_Var32;
    }
    OS(in_RDI);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_13a0,"clBuildProgram",&local_13a1);
    p_Var33 = (cl_api_clBuildProgram)
              ::OS::Services_Common::GetFunctionPointer
                        (in_stack_ffffffffffff9e38,in_stack_ffffffffffff9e30,
                         in_stack_ffffffffffff9e28);
    std::__cxx11::string::~string(local_13a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_13a1);
    local_1380 = p_Var33;
    if (p_Var33 == (cl_api_clBuildProgram)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_1408,"Couldn\'t get exported function pointer to: ",&local_1409);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffff9e38,(char *)in_stack_ffffffffffff9e30);
      dVar126 = (double)std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)in_stack_ffffffffffff9e38,
                                       (char *)in_stack_ffffffffffff9e30);
      log(in_RDI,dVar126);
      std::__cxx11::string::~string(local_13c8);
      std::__cxx11::string::~string(local_13e8);
      std::__cxx11::string::~string(local_1408);
      std::allocator<char>::~allocator((allocator<char> *)&local_1409);
      local_11 = 0;
    }
    else {
      local_1418 = &(in_RDI->m_Dispatch).clBuildProgram;
      *local_1418 = p_Var33;
    }
    OS(in_RDI);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1440,"clUnloadCompiler",&local_1441);
    p_Var34 = (cl_api_clUnloadCompiler)
              ::OS::Services_Common::GetFunctionPointer
                        (in_stack_ffffffffffff9e38,in_stack_ffffffffffff9e30,
                         in_stack_ffffffffffff9e28);
    std::__cxx11::string::~string(local_1440);
    std::allocator<char>::~allocator((allocator<char> *)&local_1441);
    local_1420 = p_Var34;
    if (p_Var34 == (cl_api_clUnloadCompiler)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_14a8,"Couldn\'t get exported function pointer to: ",&local_14a9);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffff9e38,(char *)in_stack_ffffffffffff9e30);
      dVar126 = (double)std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)in_stack_ffffffffffff9e38,
                                       (char *)in_stack_ffffffffffff9e30);
      log(in_RDI,dVar126);
      std::__cxx11::string::~string(local_1468);
      std::__cxx11::string::~string(local_1488);
      std::__cxx11::string::~string(local_14a8);
      std::allocator<char>::~allocator((allocator<char> *)&local_14a9);
      local_11 = 0;
    }
    else {
      local_14b8 = &(in_RDI->m_Dispatch).clUnloadCompiler;
      *local_14b8 = p_Var34;
    }
    OS(in_RDI);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_14e0,"clGetProgramInfo",&local_14e1);
    p_Var35 = (cl_api_clGetProgramInfo)
              ::OS::Services_Common::GetFunctionPointer
                        (in_stack_ffffffffffff9e38,in_stack_ffffffffffff9e30,
                         in_stack_ffffffffffff9e28);
    std::__cxx11::string::~string(local_14e0);
    std::allocator<char>::~allocator((allocator<char> *)&local_14e1);
    local_14c0 = p_Var35;
    if (p_Var35 == (cl_api_clGetProgramInfo)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_1548,"Couldn\'t get exported function pointer to: ",&local_1549);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffff9e38,(char *)in_stack_ffffffffffff9e30);
      dVar126 = (double)std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)in_stack_ffffffffffff9e38,
                                       (char *)in_stack_ffffffffffff9e30);
      log(in_RDI,dVar126);
      std::__cxx11::string::~string(local_1508);
      std::__cxx11::string::~string(local_1528);
      std::__cxx11::string::~string(local_1548);
      std::allocator<char>::~allocator((allocator<char> *)&local_1549);
      local_11 = 0;
    }
    else {
      local_1558 = &(in_RDI->m_Dispatch).clGetProgramInfo;
      *local_1558 = p_Var35;
    }
    OS(in_RDI);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1580,"clGetProgramBuildInfo",&local_1581);
    p_Var36 = (cl_api_clGetProgramBuildInfo)
              ::OS::Services_Common::GetFunctionPointer
                        (in_stack_ffffffffffff9e38,in_stack_ffffffffffff9e30,
                         in_stack_ffffffffffff9e28);
    std::__cxx11::string::~string(local_1580);
    std::allocator<char>::~allocator((allocator<char> *)&local_1581);
    local_1560 = p_Var36;
    if (p_Var36 == (cl_api_clGetProgramBuildInfo)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_15e8,"Couldn\'t get exported function pointer to: ",&local_15e9);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffff9e38,(char *)in_stack_ffffffffffff9e30);
      dVar126 = (double)std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)in_stack_ffffffffffff9e38,
                                       (char *)in_stack_ffffffffffff9e30);
      log(in_RDI,dVar126);
      std::__cxx11::string::~string(local_15a8);
      std::__cxx11::string::~string(local_15c8);
      std::__cxx11::string::~string(local_15e8);
      std::allocator<char>::~allocator((allocator<char> *)&local_15e9);
      local_11 = 0;
    }
    else {
      local_15f8 = &(in_RDI->m_Dispatch).clGetProgramBuildInfo;
      *local_15f8 = p_Var36;
    }
    OS(in_RDI);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1620,"clCreateKernel",&local_1621);
    p_Var37 = (cl_api_clCreateKernel)
              ::OS::Services_Common::GetFunctionPointer
                        (in_stack_ffffffffffff9e38,in_stack_ffffffffffff9e30,
                         in_stack_ffffffffffff9e28);
    std::__cxx11::string::~string(local_1620);
    std::allocator<char>::~allocator((allocator<char> *)&local_1621);
    local_1600 = p_Var37;
    if (p_Var37 == (cl_api_clCreateKernel)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_1688,"Couldn\'t get exported function pointer to: ",&local_1689);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffff9e38,(char *)in_stack_ffffffffffff9e30);
      dVar126 = (double)std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)in_stack_ffffffffffff9e38,
                                       (char *)in_stack_ffffffffffff9e30);
      log(in_RDI,dVar126);
      std::__cxx11::string::~string(local_1648);
      std::__cxx11::string::~string(local_1668);
      std::__cxx11::string::~string(local_1688);
      std::allocator<char>::~allocator((allocator<char> *)&local_1689);
      local_11 = 0;
    }
    else {
      local_1698 = &(in_RDI->m_Dispatch).clCreateKernel;
      *local_1698 = p_Var37;
    }
    OS(in_RDI);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_16c0,"clCreateKernelsInProgram",&local_16c1);
    p_Var38 = (cl_api_clCreateKernelsInProgram)
              ::OS::Services_Common::GetFunctionPointer
                        (in_stack_ffffffffffff9e38,in_stack_ffffffffffff9e30,
                         in_stack_ffffffffffff9e28);
    std::__cxx11::string::~string(local_16c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_16c1);
    local_16a0 = p_Var38;
    if (p_Var38 == (cl_api_clCreateKernelsInProgram)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_1728,"Couldn\'t get exported function pointer to: ",&local_1729);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffff9e38,(char *)in_stack_ffffffffffff9e30);
      dVar126 = (double)std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)in_stack_ffffffffffff9e38,
                                       (char *)in_stack_ffffffffffff9e30);
      log(in_RDI,dVar126);
      std::__cxx11::string::~string(local_16e8);
      std::__cxx11::string::~string(local_1708);
      std::__cxx11::string::~string(local_1728);
      std::allocator<char>::~allocator((allocator<char> *)&local_1729);
      local_11 = 0;
    }
    else {
      local_1738 = &(in_RDI->m_Dispatch).clCreateKernelsInProgram;
      *local_1738 = p_Var38;
    }
    OS(in_RDI);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1760,"clRetainKernel",&local_1761);
    p_Var39 = (cl_api_clRetainKernel)
              ::OS::Services_Common::GetFunctionPointer
                        (in_stack_ffffffffffff9e38,in_stack_ffffffffffff9e30,
                         in_stack_ffffffffffff9e28);
    std::__cxx11::string::~string(local_1760);
    std::allocator<char>::~allocator((allocator<char> *)&local_1761);
    local_1740 = p_Var39;
    if (p_Var39 == (cl_api_clRetainKernel)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_17c8,"Couldn\'t get exported function pointer to: ",&local_17c9);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffff9e38,(char *)in_stack_ffffffffffff9e30);
      dVar126 = (double)std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)in_stack_ffffffffffff9e38,
                                       (char *)in_stack_ffffffffffff9e30);
      log(in_RDI,dVar126);
      std::__cxx11::string::~string(local_1788);
      std::__cxx11::string::~string(local_17a8);
      std::__cxx11::string::~string(local_17c8);
      std::allocator<char>::~allocator((allocator<char> *)&local_17c9);
      local_11 = 0;
    }
    else {
      local_17d8 = &(in_RDI->m_Dispatch).clRetainKernel;
      *local_17d8 = p_Var39;
    }
    OS(in_RDI);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1800,"clReleaseKernel",&local_1801);
    p_Var40 = (cl_api_clReleaseKernel)
              ::OS::Services_Common::GetFunctionPointer
                        (in_stack_ffffffffffff9e38,in_stack_ffffffffffff9e30,
                         in_stack_ffffffffffff9e28);
    std::__cxx11::string::~string(local_1800);
    std::allocator<char>::~allocator((allocator<char> *)&local_1801);
    local_17e0 = p_Var40;
    if (p_Var40 == (cl_api_clReleaseKernel)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_1868,"Couldn\'t get exported function pointer to: ",&local_1869);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffff9e38,(char *)in_stack_ffffffffffff9e30);
      dVar126 = (double)std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)in_stack_ffffffffffff9e38,
                                       (char *)in_stack_ffffffffffff9e30);
      log(in_RDI,dVar126);
      std::__cxx11::string::~string(local_1828);
      std::__cxx11::string::~string(local_1848);
      std::__cxx11::string::~string(local_1868);
      std::allocator<char>::~allocator((allocator<char> *)&local_1869);
      local_11 = 0;
    }
    else {
      local_1878 = &(in_RDI->m_Dispatch).clReleaseKernel;
      *local_1878 = p_Var40;
    }
    OS(in_RDI);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_18a0,"clSetKernelArg",&local_18a1);
    p_Var41 = (cl_api_clSetKernelArg)
              ::OS::Services_Common::GetFunctionPointer
                        (in_stack_ffffffffffff9e38,in_stack_ffffffffffff9e30,
                         in_stack_ffffffffffff9e28);
    std::__cxx11::string::~string(local_18a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_18a1);
    local_1880 = p_Var41;
    if (p_Var41 == (cl_api_clSetKernelArg)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_1908,"Couldn\'t get exported function pointer to: ",&local_1909);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffff9e38,(char *)in_stack_ffffffffffff9e30);
      dVar126 = (double)std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)in_stack_ffffffffffff9e38,
                                       (char *)in_stack_ffffffffffff9e30);
      log(in_RDI,dVar126);
      std::__cxx11::string::~string(local_18c8);
      std::__cxx11::string::~string(local_18e8);
      std::__cxx11::string::~string(local_1908);
      std::allocator<char>::~allocator((allocator<char> *)&local_1909);
      local_11 = 0;
    }
    else {
      local_1918 = &(in_RDI->m_Dispatch).clSetKernelArg;
      *local_1918 = p_Var41;
    }
    OS(in_RDI);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1940,"clGetKernelInfo",&local_1941);
    p_Var42 = (cl_api_clGetKernelInfo)
              ::OS::Services_Common::GetFunctionPointer
                        (in_stack_ffffffffffff9e38,in_stack_ffffffffffff9e30,
                         in_stack_ffffffffffff9e28);
    std::__cxx11::string::~string(local_1940);
    std::allocator<char>::~allocator((allocator<char> *)&local_1941);
    local_1920 = p_Var42;
    if (p_Var42 == (cl_api_clGetKernelInfo)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_19a8,"Couldn\'t get exported function pointer to: ",&local_19a9);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffff9e38,(char *)in_stack_ffffffffffff9e30);
      dVar126 = (double)std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)in_stack_ffffffffffff9e38,
                                       (char *)in_stack_ffffffffffff9e30);
      log(in_RDI,dVar126);
      std::__cxx11::string::~string(local_1968);
      std::__cxx11::string::~string(local_1988);
      std::__cxx11::string::~string(local_19a8);
      std::allocator<char>::~allocator((allocator<char> *)&local_19a9);
      local_11 = 0;
    }
    else {
      local_19b8 = &(in_RDI->m_Dispatch).clGetKernelInfo;
      *local_19b8 = p_Var42;
    }
    OS(in_RDI);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_19e0,"clGetKernelWorkGroupInfo",&local_19e1);
    p_Var43 = (cl_api_clGetKernelWorkGroupInfo)
              ::OS::Services_Common::GetFunctionPointer
                        (in_stack_ffffffffffff9e38,in_stack_ffffffffffff9e30,
                         in_stack_ffffffffffff9e28);
    std::__cxx11::string::~string(local_19e0);
    std::allocator<char>::~allocator((allocator<char> *)&local_19e1);
    local_19c0 = p_Var43;
    if (p_Var43 == (cl_api_clGetKernelWorkGroupInfo)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_1a48,"Couldn\'t get exported function pointer to: ",&local_1a49);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffff9e38,(char *)in_stack_ffffffffffff9e30);
      dVar126 = (double)std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)in_stack_ffffffffffff9e38,
                                       (char *)in_stack_ffffffffffff9e30);
      log(in_RDI,dVar126);
      std::__cxx11::string::~string(local_1a08);
      std::__cxx11::string::~string(local_1a28);
      std::__cxx11::string::~string(local_1a48);
      std::allocator<char>::~allocator((allocator<char> *)&local_1a49);
      local_11 = 0;
    }
    else {
      local_1a58 = &(in_RDI->m_Dispatch).clGetKernelWorkGroupInfo;
      *local_1a58 = p_Var43;
    }
    OS(in_RDI);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1a80,"clWaitForEvents",&local_1a81);
    p_Var44 = (cl_api_clWaitForEvents)
              ::OS::Services_Common::GetFunctionPointer
                        (in_stack_ffffffffffff9e38,in_stack_ffffffffffff9e30,
                         in_stack_ffffffffffff9e28);
    std::__cxx11::string::~string(local_1a80);
    std::allocator<char>::~allocator((allocator<char> *)&local_1a81);
    local_1a60 = p_Var44;
    if (p_Var44 == (cl_api_clWaitForEvents)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_1ae8,"Couldn\'t get exported function pointer to: ",&local_1ae9);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffff9e38,(char *)in_stack_ffffffffffff9e30);
      dVar126 = (double)std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)in_stack_ffffffffffff9e38,
                                       (char *)in_stack_ffffffffffff9e30);
      log(in_RDI,dVar126);
      std::__cxx11::string::~string(local_1aa8);
      std::__cxx11::string::~string(local_1ac8);
      std::__cxx11::string::~string(local_1ae8);
      std::allocator<char>::~allocator((allocator<char> *)&local_1ae9);
      local_11 = 0;
    }
    else {
      local_1af8 = &(in_RDI->m_Dispatch).clWaitForEvents;
      *local_1af8 = p_Var44;
    }
    OS(in_RDI);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1b20,"clGetEventInfo",&local_1b21);
    p_Var45 = (cl_api_clGetEventInfo)
              ::OS::Services_Common::GetFunctionPointer
                        (in_stack_ffffffffffff9e38,in_stack_ffffffffffff9e30,
                         in_stack_ffffffffffff9e28);
    std::__cxx11::string::~string(local_1b20);
    std::allocator<char>::~allocator((allocator<char> *)&local_1b21);
    local_1b00 = p_Var45;
    if (p_Var45 == (cl_api_clGetEventInfo)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_1b88,"Couldn\'t get exported function pointer to: ",&local_1b89);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffff9e38,(char *)in_stack_ffffffffffff9e30);
      dVar126 = (double)std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)in_stack_ffffffffffff9e38,
                                       (char *)in_stack_ffffffffffff9e30);
      log(in_RDI,dVar126);
      std::__cxx11::string::~string(local_1b48);
      std::__cxx11::string::~string(local_1b68);
      std::__cxx11::string::~string(local_1b88);
      std::allocator<char>::~allocator((allocator<char> *)&local_1b89);
      local_11 = 0;
    }
    else {
      local_1b98 = &(in_RDI->m_Dispatch).clGetEventInfo;
      *local_1b98 = p_Var45;
    }
    OS(in_RDI);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1bc0,"clRetainEvent",&local_1bc1);
    p_Var46 = (cl_api_clRetainEvent)
              ::OS::Services_Common::GetFunctionPointer
                        (in_stack_ffffffffffff9e38,in_stack_ffffffffffff9e30,
                         in_stack_ffffffffffff9e28);
    std::__cxx11::string::~string(local_1bc0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1bc1);
    local_1ba0 = p_Var46;
    if (p_Var46 == (cl_api_clRetainEvent)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_1c28,"Couldn\'t get exported function pointer to: ",&local_1c29);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffff9e38,(char *)in_stack_ffffffffffff9e30);
      dVar126 = (double)std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)in_stack_ffffffffffff9e38,
                                       (char *)in_stack_ffffffffffff9e30);
      log(in_RDI,dVar126);
      std::__cxx11::string::~string(local_1be8);
      std::__cxx11::string::~string(local_1c08);
      std::__cxx11::string::~string(local_1c28);
      std::allocator<char>::~allocator((allocator<char> *)&local_1c29);
      local_11 = 0;
    }
    else {
      local_1c38 = &(in_RDI->m_Dispatch).clRetainEvent;
      *local_1c38 = p_Var46;
    }
    OS(in_RDI);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1c60,"clReleaseEvent",&local_1c61);
    p_Var47 = (cl_api_clReleaseEvent)
              ::OS::Services_Common::GetFunctionPointer
                        (in_stack_ffffffffffff9e38,in_stack_ffffffffffff9e30,
                         in_stack_ffffffffffff9e28);
    std::__cxx11::string::~string(local_1c60);
    std::allocator<char>::~allocator((allocator<char> *)&local_1c61);
    local_1c40 = p_Var47;
    if (p_Var47 == (cl_api_clReleaseEvent)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_1cc8,"Couldn\'t get exported function pointer to: ",&local_1cc9);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffff9e38,(char *)in_stack_ffffffffffff9e30);
      dVar126 = (double)std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)in_stack_ffffffffffff9e38,
                                       (char *)in_stack_ffffffffffff9e30);
      log(in_RDI,dVar126);
      std::__cxx11::string::~string(local_1c88);
      std::__cxx11::string::~string(local_1ca8);
      std::__cxx11::string::~string(local_1cc8);
      std::allocator<char>::~allocator((allocator<char> *)&local_1cc9);
      local_11 = 0;
    }
    else {
      local_1cd8 = &(in_RDI->m_Dispatch).clReleaseEvent;
      *local_1cd8 = p_Var47;
    }
    OS(in_RDI);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1d00,"clGetEventProfilingInfo",&local_1d01);
    p_Var48 = (cl_api_clGetEventProfilingInfo)
              ::OS::Services_Common::GetFunctionPointer
                        (in_stack_ffffffffffff9e38,in_stack_ffffffffffff9e30,
                         in_stack_ffffffffffff9e28);
    std::__cxx11::string::~string(local_1d00);
    std::allocator<char>::~allocator((allocator<char> *)&local_1d01);
    local_1ce0 = p_Var48;
    if (p_Var48 == (cl_api_clGetEventProfilingInfo)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_1d68,"Couldn\'t get exported function pointer to: ",&local_1d69);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffff9e38,(char *)in_stack_ffffffffffff9e30);
      dVar126 = (double)std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)in_stack_ffffffffffff9e38,
                                       (char *)in_stack_ffffffffffff9e30);
      log(in_RDI,dVar126);
      std::__cxx11::string::~string(local_1d28);
      std::__cxx11::string::~string(local_1d48);
      std::__cxx11::string::~string(local_1d68);
      std::allocator<char>::~allocator((allocator<char> *)&local_1d69);
      local_11 = 0;
    }
    else {
      local_1d78 = &(in_RDI->m_Dispatch).clGetEventProfilingInfo;
      *local_1d78 = p_Var48;
    }
    OS(in_RDI);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1da0,"clFlush",&local_1da1);
    p_Var49 = (cl_api_clFlush)
              ::OS::Services_Common::GetFunctionPointer
                        (in_stack_ffffffffffff9e38,in_stack_ffffffffffff9e30,
                         in_stack_ffffffffffff9e28);
    std::__cxx11::string::~string(local_1da0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1da1);
    local_1d80 = p_Var49;
    if (p_Var49 == (cl_api_clFlush)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_1e08,"Couldn\'t get exported function pointer to: ",&local_1e09);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffff9e38,(char *)in_stack_ffffffffffff9e30);
      dVar126 = (double)std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)in_stack_ffffffffffff9e38,
                                       (char *)in_stack_ffffffffffff9e30);
      log(in_RDI,dVar126);
      std::__cxx11::string::~string(local_1dc8);
      std::__cxx11::string::~string(local_1de8);
      std::__cxx11::string::~string(local_1e08);
      std::allocator<char>::~allocator((allocator<char> *)&local_1e09);
      local_11 = 0;
    }
    else {
      local_1e18 = &(in_RDI->m_Dispatch).clFlush;
      *local_1e18 = p_Var49;
    }
    OS(in_RDI);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1e40,"clFinish",&local_1e41);
    p_Var50 = (cl_api_clFinish)
              ::OS::Services_Common::GetFunctionPointer
                        (in_stack_ffffffffffff9e38,in_stack_ffffffffffff9e30,
                         in_stack_ffffffffffff9e28);
    std::__cxx11::string::~string(local_1e40);
    std::allocator<char>::~allocator((allocator<char> *)&local_1e41);
    local_1e20 = p_Var50;
    if (p_Var50 == (cl_api_clFinish)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_1ea8,"Couldn\'t get exported function pointer to: ",&local_1ea9);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffff9e38,(char *)in_stack_ffffffffffff9e30);
      dVar126 = (double)std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)in_stack_ffffffffffff9e38,
                                       (char *)in_stack_ffffffffffff9e30);
      log(in_RDI,dVar126);
      std::__cxx11::string::~string(local_1e68);
      std::__cxx11::string::~string(local_1e88);
      std::__cxx11::string::~string(local_1ea8);
      std::allocator<char>::~allocator((allocator<char> *)&local_1ea9);
      local_11 = 0;
    }
    else {
      local_1eb8 = &(in_RDI->m_Dispatch).clFinish;
      *local_1eb8 = p_Var50;
    }
    OS(in_RDI);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1ee0,"clEnqueueReadBuffer",&local_1ee1);
    p_Var51 = (cl_api_clEnqueueReadBuffer)
              ::OS::Services_Common::GetFunctionPointer
                        (in_stack_ffffffffffff9e38,in_stack_ffffffffffff9e30,
                         in_stack_ffffffffffff9e28);
    std::__cxx11::string::~string(local_1ee0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1ee1);
    local_1ec0 = p_Var51;
    if (p_Var51 == (cl_api_clEnqueueReadBuffer)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_1f48,"Couldn\'t get exported function pointer to: ",&local_1f49);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffff9e38,(char *)in_stack_ffffffffffff9e30);
      dVar126 = (double)std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)in_stack_ffffffffffff9e38,
                                       (char *)in_stack_ffffffffffff9e30);
      log(in_RDI,dVar126);
      std::__cxx11::string::~string(local_1f08);
      std::__cxx11::string::~string(local_1f28);
      std::__cxx11::string::~string(local_1f48);
      std::allocator<char>::~allocator((allocator<char> *)&local_1f49);
      local_11 = 0;
    }
    else {
      local_1f58 = &(in_RDI->m_Dispatch).clEnqueueReadBuffer;
      *local_1f58 = p_Var51;
    }
    OS(in_RDI);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1f80,"clEnqueueWriteBuffer",&local_1f81);
    p_Var52 = (cl_api_clEnqueueWriteBuffer)
              ::OS::Services_Common::GetFunctionPointer
                        (in_stack_ffffffffffff9e38,in_stack_ffffffffffff9e30,
                         in_stack_ffffffffffff9e28);
    std::__cxx11::string::~string(local_1f80);
    std::allocator<char>::~allocator((allocator<char> *)&local_1f81);
    local_1f60 = p_Var52;
    if (p_Var52 == (cl_api_clEnqueueWriteBuffer)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_1fe8,"Couldn\'t get exported function pointer to: ",&local_1fe9);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffff9e38,(char *)in_stack_ffffffffffff9e30);
      dVar126 = (double)std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)in_stack_ffffffffffff9e38,
                                       (char *)in_stack_ffffffffffff9e30);
      log(in_RDI,dVar126);
      std::__cxx11::string::~string(local_1fa8);
      std::__cxx11::string::~string(local_1fc8);
      std::__cxx11::string::~string(local_1fe8);
      std::allocator<char>::~allocator((allocator<char> *)&local_1fe9);
      local_11 = 0;
    }
    else {
      local_1ff8 = &(in_RDI->m_Dispatch).clEnqueueWriteBuffer;
      *local_1ff8 = p_Var52;
    }
    OS(in_RDI);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2020,"clEnqueueCopyBuffer",&local_2021);
    p_Var53 = (cl_api_clEnqueueCopyBuffer)
              ::OS::Services_Common::GetFunctionPointer
                        (in_stack_ffffffffffff9e38,in_stack_ffffffffffff9e30,
                         in_stack_ffffffffffff9e28);
    std::__cxx11::string::~string(local_2020);
    std::allocator<char>::~allocator((allocator<char> *)&local_2021);
    local_2000 = p_Var53;
    if (p_Var53 == (cl_api_clEnqueueCopyBuffer)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_2088,"Couldn\'t get exported function pointer to: ",&local_2089);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffff9e38,(char *)in_stack_ffffffffffff9e30);
      dVar126 = (double)std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)in_stack_ffffffffffff9e38,
                                       (char *)in_stack_ffffffffffff9e30);
      log(in_RDI,dVar126);
      std::__cxx11::string::~string(local_2048);
      std::__cxx11::string::~string(local_2068);
      std::__cxx11::string::~string(local_2088);
      std::allocator<char>::~allocator((allocator<char> *)&local_2089);
      local_11 = 0;
    }
    else {
      local_2098 = &(in_RDI->m_Dispatch).clEnqueueCopyBuffer;
      *local_2098 = p_Var53;
    }
    OS(in_RDI);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_20c0,"clEnqueueReadImage",&local_20c1);
    p_Var54 = (cl_api_clEnqueueReadImage)
              ::OS::Services_Common::GetFunctionPointer
                        (in_stack_ffffffffffff9e38,in_stack_ffffffffffff9e30,
                         in_stack_ffffffffffff9e28);
    std::__cxx11::string::~string(local_20c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_20c1);
    local_20a0 = p_Var54;
    if (p_Var54 == (cl_api_clEnqueueReadImage)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_2128,"Couldn\'t get exported function pointer to: ",&local_2129);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffff9e38,(char *)in_stack_ffffffffffff9e30);
      dVar126 = (double)std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)in_stack_ffffffffffff9e38,
                                       (char *)in_stack_ffffffffffff9e30);
      log(in_RDI,dVar126);
      std::__cxx11::string::~string(local_20e8);
      std::__cxx11::string::~string(local_2108);
      std::__cxx11::string::~string(local_2128);
      std::allocator<char>::~allocator((allocator<char> *)&local_2129);
      local_11 = 0;
    }
    else {
      local_2138 = &(in_RDI->m_Dispatch).clEnqueueReadImage;
      *local_2138 = p_Var54;
    }
    OS(in_RDI);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2160,"clEnqueueWriteImage",&local_2161);
    p_Var55 = (cl_api_clEnqueueWriteImage)
              ::OS::Services_Common::GetFunctionPointer
                        (in_stack_ffffffffffff9e38,in_stack_ffffffffffff9e30,
                         in_stack_ffffffffffff9e28);
    std::__cxx11::string::~string(local_2160);
    std::allocator<char>::~allocator((allocator<char> *)&local_2161);
    local_2140 = p_Var55;
    if (p_Var55 == (cl_api_clEnqueueWriteImage)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_21c8,"Couldn\'t get exported function pointer to: ",&local_21c9);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffff9e38,(char *)in_stack_ffffffffffff9e30);
      dVar126 = (double)std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)in_stack_ffffffffffff9e38,
                                       (char *)in_stack_ffffffffffff9e30);
      log(in_RDI,dVar126);
      std::__cxx11::string::~string(local_2188);
      std::__cxx11::string::~string(local_21a8);
      std::__cxx11::string::~string(local_21c8);
      std::allocator<char>::~allocator((allocator<char> *)&local_21c9);
      local_11 = 0;
    }
    else {
      local_21d8 = &(in_RDI->m_Dispatch).clEnqueueWriteImage;
      *local_21d8 = p_Var55;
    }
    OS(in_RDI);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2200,"clEnqueueCopyImage",&local_2201);
    p_Var56 = (cl_api_clEnqueueCopyImage)
              ::OS::Services_Common::GetFunctionPointer
                        (in_stack_ffffffffffff9e38,in_stack_ffffffffffff9e30,
                         in_stack_ffffffffffff9e28);
    std::__cxx11::string::~string(local_2200);
    std::allocator<char>::~allocator((allocator<char> *)&local_2201);
    local_21e0 = p_Var56;
    if (p_Var56 == (cl_api_clEnqueueCopyImage)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_2268,"Couldn\'t get exported function pointer to: ",&local_2269);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffff9e38,(char *)in_stack_ffffffffffff9e30);
      dVar126 = (double)std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)in_stack_ffffffffffff9e38,
                                       (char *)in_stack_ffffffffffff9e30);
      log(in_RDI,dVar126);
      std::__cxx11::string::~string(local_2228);
      std::__cxx11::string::~string(local_2248);
      std::__cxx11::string::~string(local_2268);
      std::allocator<char>::~allocator((allocator<char> *)&local_2269);
      local_11 = 0;
    }
    else {
      local_2278 = &(in_RDI->m_Dispatch).clEnqueueCopyImage;
      *local_2278 = p_Var56;
    }
    OS(in_RDI);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_22a0,"clEnqueueCopyImageToBuffer",&local_22a1);
    p_Var57 = (cl_api_clEnqueueCopyImageToBuffer)
              ::OS::Services_Common::GetFunctionPointer
                        (in_stack_ffffffffffff9e38,in_stack_ffffffffffff9e30,
                         in_stack_ffffffffffff9e28);
    std::__cxx11::string::~string(local_22a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_22a1);
    local_2280 = p_Var57;
    if (p_Var57 == (cl_api_clEnqueueCopyImageToBuffer)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_2308,"Couldn\'t get exported function pointer to: ",&local_2309);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffff9e38,(char *)in_stack_ffffffffffff9e30);
      dVar126 = (double)std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)in_stack_ffffffffffff9e38,
                                       (char *)in_stack_ffffffffffff9e30);
      log(in_RDI,dVar126);
      std::__cxx11::string::~string(local_22c8);
      std::__cxx11::string::~string(local_22e8);
      std::__cxx11::string::~string(local_2308);
      std::allocator<char>::~allocator((allocator<char> *)&local_2309);
      local_11 = 0;
    }
    else {
      local_2318 = &(in_RDI->m_Dispatch).clEnqueueCopyImageToBuffer;
      *local_2318 = p_Var57;
    }
    OS(in_RDI);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2340,"clEnqueueCopyBufferToImage",&local_2341);
    p_Var58 = (cl_api_clEnqueueCopyBufferToImage)
              ::OS::Services_Common::GetFunctionPointer
                        (in_stack_ffffffffffff9e38,in_stack_ffffffffffff9e30,
                         in_stack_ffffffffffff9e28);
    std::__cxx11::string::~string(local_2340);
    std::allocator<char>::~allocator((allocator<char> *)&local_2341);
    local_2320 = p_Var58;
    if (p_Var58 == (cl_api_clEnqueueCopyBufferToImage)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_23a8,"Couldn\'t get exported function pointer to: ",&local_23a9);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffff9e38,(char *)in_stack_ffffffffffff9e30);
      dVar126 = (double)std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)in_stack_ffffffffffff9e38,
                                       (char *)in_stack_ffffffffffff9e30);
      log(in_RDI,dVar126);
      std::__cxx11::string::~string(local_2368);
      std::__cxx11::string::~string(local_2388);
      std::__cxx11::string::~string(local_23a8);
      std::allocator<char>::~allocator((allocator<char> *)&local_23a9);
      local_11 = 0;
    }
    else {
      local_23b8 = &(in_RDI->m_Dispatch).clEnqueueCopyBufferToImage;
      *local_23b8 = p_Var58;
    }
    OS(in_RDI);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_23e0,"clEnqueueMapBuffer",&local_23e1);
    p_Var59 = (cl_api_clEnqueueMapBuffer)
              ::OS::Services_Common::GetFunctionPointer
                        (in_stack_ffffffffffff9e38,in_stack_ffffffffffff9e30,
                         in_stack_ffffffffffff9e28);
    std::__cxx11::string::~string(local_23e0);
    std::allocator<char>::~allocator((allocator<char> *)&local_23e1);
    local_23c0 = p_Var59;
    if (p_Var59 == (cl_api_clEnqueueMapBuffer)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_2448,"Couldn\'t get exported function pointer to: ",&local_2449);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffff9e38,(char *)in_stack_ffffffffffff9e30);
      dVar126 = (double)std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)in_stack_ffffffffffff9e38,
                                       (char *)in_stack_ffffffffffff9e30);
      log(in_RDI,dVar126);
      std::__cxx11::string::~string(local_2408);
      std::__cxx11::string::~string(local_2428);
      std::__cxx11::string::~string(local_2448);
      std::allocator<char>::~allocator((allocator<char> *)&local_2449);
      local_11 = 0;
    }
    else {
      local_2458 = &(in_RDI->m_Dispatch).clEnqueueMapBuffer;
      *local_2458 = p_Var59;
    }
    OS(in_RDI);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2480,"clEnqueueMapImage",&local_2481);
    p_Var60 = (cl_api_clEnqueueMapImage)
              ::OS::Services_Common::GetFunctionPointer
                        (in_stack_ffffffffffff9e38,in_stack_ffffffffffff9e30,
                         in_stack_ffffffffffff9e28);
    std::__cxx11::string::~string(local_2480);
    std::allocator<char>::~allocator((allocator<char> *)&local_2481);
    local_2460 = p_Var60;
    if (p_Var60 == (cl_api_clEnqueueMapImage)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_24e8,"Couldn\'t get exported function pointer to: ",&local_24e9);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffff9e38,(char *)in_stack_ffffffffffff9e30);
      dVar126 = (double)std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)in_stack_ffffffffffff9e38,
                                       (char *)in_stack_ffffffffffff9e30);
      log(in_RDI,dVar126);
      std::__cxx11::string::~string(local_24a8);
      std::__cxx11::string::~string(local_24c8);
      std::__cxx11::string::~string(local_24e8);
      std::allocator<char>::~allocator((allocator<char> *)&local_24e9);
      local_11 = 0;
    }
    else {
      local_24f8 = &(in_RDI->m_Dispatch).clEnqueueMapImage;
      *local_24f8 = p_Var60;
    }
    OS(in_RDI);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2520,"clEnqueueUnmapMemObject",&local_2521);
    p_Var61 = (cl_api_clEnqueueUnmapMemObject)
              ::OS::Services_Common::GetFunctionPointer
                        (in_stack_ffffffffffff9e38,in_stack_ffffffffffff9e30,
                         in_stack_ffffffffffff9e28);
    std::__cxx11::string::~string(local_2520);
    std::allocator<char>::~allocator((allocator<char> *)&local_2521);
    local_2500 = p_Var61;
    if (p_Var61 == (cl_api_clEnqueueUnmapMemObject)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_2588,"Couldn\'t get exported function pointer to: ",&local_2589);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffff9e38,(char *)in_stack_ffffffffffff9e30);
      dVar126 = (double)std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)in_stack_ffffffffffff9e38,
                                       (char *)in_stack_ffffffffffff9e30);
      log(in_RDI,dVar126);
      std::__cxx11::string::~string(local_2548);
      std::__cxx11::string::~string(local_2568);
      std::__cxx11::string::~string(local_2588);
      std::allocator<char>::~allocator((allocator<char> *)&local_2589);
      local_11 = 0;
    }
    else {
      local_2598 = &(in_RDI->m_Dispatch).clEnqueueUnmapMemObject;
      *local_2598 = p_Var61;
    }
    OS(in_RDI);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_25c0,"clEnqueueNDRangeKernel",&local_25c1);
    p_Var62 = (cl_api_clEnqueueNDRangeKernel)
              ::OS::Services_Common::GetFunctionPointer
                        (in_stack_ffffffffffff9e38,in_stack_ffffffffffff9e30,
                         in_stack_ffffffffffff9e28);
    std::__cxx11::string::~string(local_25c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_25c1);
    local_25a0 = p_Var62;
    if (p_Var62 == (cl_api_clEnqueueNDRangeKernel)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_2628,"Couldn\'t get exported function pointer to: ",&local_2629);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffff9e38,(char *)in_stack_ffffffffffff9e30);
      dVar126 = (double)std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)in_stack_ffffffffffff9e38,
                                       (char *)in_stack_ffffffffffff9e30);
      log(in_RDI,dVar126);
      std::__cxx11::string::~string(local_25e8);
      std::__cxx11::string::~string(local_2608);
      std::__cxx11::string::~string(local_2628);
      std::allocator<char>::~allocator((allocator<char> *)&local_2629);
      local_11 = 0;
    }
    else {
      local_2638 = &(in_RDI->m_Dispatch).clEnqueueNDRangeKernel;
      *local_2638 = p_Var62;
    }
    OS(in_RDI);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2660,"clEnqueueTask",&local_2661);
    p_Var63 = (cl_api_clEnqueueTask)
              ::OS::Services_Common::GetFunctionPointer
                        (in_stack_ffffffffffff9e38,in_stack_ffffffffffff9e30,
                         in_stack_ffffffffffff9e28);
    std::__cxx11::string::~string(local_2660);
    std::allocator<char>::~allocator((allocator<char> *)&local_2661);
    local_2640 = p_Var63;
    if (p_Var63 == (cl_api_clEnqueueTask)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_26c8,"Couldn\'t get exported function pointer to: ",&local_26c9);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffff9e38,(char *)in_stack_ffffffffffff9e30);
      dVar126 = (double)std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)in_stack_ffffffffffff9e38,
                                       (char *)in_stack_ffffffffffff9e30);
      log(in_RDI,dVar126);
      std::__cxx11::string::~string(local_2688);
      std::__cxx11::string::~string(local_26a8);
      std::__cxx11::string::~string(local_26c8);
      std::allocator<char>::~allocator((allocator<char> *)&local_26c9);
      local_11 = 0;
    }
    else {
      local_26d8 = &(in_RDI->m_Dispatch).clEnqueueTask;
      *local_26d8 = p_Var63;
    }
    OS(in_RDI);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2700,"clEnqueueNativeKernel",&local_2701);
    p_Var64 = (cl_api_clEnqueueNativeKernel)
              ::OS::Services_Common::GetFunctionPointer
                        (in_stack_ffffffffffff9e38,in_stack_ffffffffffff9e30,
                         in_stack_ffffffffffff9e28);
    std::__cxx11::string::~string(local_2700);
    std::allocator<char>::~allocator((allocator<char> *)&local_2701);
    local_26e0 = p_Var64;
    if (p_Var64 == (cl_api_clEnqueueNativeKernel)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_2768,"Couldn\'t get exported function pointer to: ",&local_2769);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffff9e38,(char *)in_stack_ffffffffffff9e30);
      dVar126 = (double)std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)in_stack_ffffffffffff9e38,
                                       (char *)in_stack_ffffffffffff9e30);
      log(in_RDI,dVar126);
      std::__cxx11::string::~string(local_2728);
      std::__cxx11::string::~string(local_2748);
      std::__cxx11::string::~string(local_2768);
      std::allocator<char>::~allocator((allocator<char> *)&local_2769);
      local_11 = 0;
    }
    else {
      local_2778 = &(in_RDI->m_Dispatch).clEnqueueNativeKernel;
      *local_2778 = p_Var64;
    }
    OS(in_RDI);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_27a0,"clEnqueueMarker",&local_27a1);
    p_Var65 = (cl_api_clEnqueueMarker)
              ::OS::Services_Common::GetFunctionPointer
                        (in_stack_ffffffffffff9e38,in_stack_ffffffffffff9e30,
                         in_stack_ffffffffffff9e28);
    std::__cxx11::string::~string(local_27a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_27a1);
    local_2780 = p_Var65;
    if (p_Var65 == (cl_api_clEnqueueMarker)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_2808,"Couldn\'t get exported function pointer to: ",&local_2809);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffff9e38,(char *)in_stack_ffffffffffff9e30);
      dVar126 = (double)std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)in_stack_ffffffffffff9e38,
                                       (char *)in_stack_ffffffffffff9e30);
      log(in_RDI,dVar126);
      std::__cxx11::string::~string(local_27c8);
      std::__cxx11::string::~string(local_27e8);
      std::__cxx11::string::~string(local_2808);
      std::allocator<char>::~allocator((allocator<char> *)&local_2809);
      local_11 = 0;
    }
    else {
      local_2818 = &(in_RDI->m_Dispatch).clEnqueueMarker;
      *local_2818 = p_Var65;
    }
    OS(in_RDI);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2840,"clEnqueueWaitForEvents",&local_2841);
    p_Var66 = (cl_api_clEnqueueWaitForEvents)
              ::OS::Services_Common::GetFunctionPointer
                        (in_stack_ffffffffffff9e38,in_stack_ffffffffffff9e30,
                         in_stack_ffffffffffff9e28);
    std::__cxx11::string::~string(local_2840);
    std::allocator<char>::~allocator((allocator<char> *)&local_2841);
    local_2820 = p_Var66;
    if (p_Var66 == (cl_api_clEnqueueWaitForEvents)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_28a8,"Couldn\'t get exported function pointer to: ",&local_28a9);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffff9e38,(char *)in_stack_ffffffffffff9e30);
      dVar126 = (double)std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)in_stack_ffffffffffff9e38,
                                       (char *)in_stack_ffffffffffff9e30);
      log(in_RDI,dVar126);
      std::__cxx11::string::~string(local_2868);
      std::__cxx11::string::~string(local_2888);
      std::__cxx11::string::~string(local_28a8);
      std::allocator<char>::~allocator((allocator<char> *)&local_28a9);
      local_11 = 0;
    }
    else {
      local_28b8 = &(in_RDI->m_Dispatch).clEnqueueWaitForEvents;
      *local_28b8 = p_Var66;
    }
    OS(in_RDI);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_28e0,"clEnqueueBarrier",&local_28e1);
    p_Var67 = (cl_api_clEnqueueBarrier)
              ::OS::Services_Common::GetFunctionPointer
                        (in_stack_ffffffffffff9e38,in_stack_ffffffffffff9e30,
                         in_stack_ffffffffffff9e28);
    std::__cxx11::string::~string(local_28e0);
    std::allocator<char>::~allocator((allocator<char> *)&local_28e1);
    local_28c0 = p_Var67;
    if (p_Var67 == (cl_api_clEnqueueBarrier)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_2948,"Couldn\'t get exported function pointer to: ",&local_2949);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffff9e38,(char *)in_stack_ffffffffffff9e30);
      dVar126 = (double)std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)in_stack_ffffffffffff9e38,
                                       (char *)in_stack_ffffffffffff9e30);
      log(in_RDI,dVar126);
      std::__cxx11::string::~string(local_2908);
      std::__cxx11::string::~string(local_2928);
      std::__cxx11::string::~string(local_2948);
      std::allocator<char>::~allocator((allocator<char> *)&local_2949);
      local_11 = 0;
    }
    else {
      local_2958 = &(in_RDI->m_Dispatch).clEnqueueBarrier;
      *local_2958 = p_Var67;
    }
    local_2959 = local_11 & 1;
    OS(in_RDI);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2988,"clGetExtensionFunctionAddress",&local_2989);
    p_Var68 = (cl_api_clGetExtensionFunctionAddress)
              ::OS::Services_Common::GetFunctionPointer
                        (in_stack_ffffffffffff9e38,in_stack_ffffffffffff9e30,
                         in_stack_ffffffffffff9e28);
    std::__cxx11::string::~string(local_2988);
    std::allocator<char>::~allocator((allocator<char> *)&local_2989);
    local_2968 = p_Var68;
    if (p_Var68 == (cl_api_clGetExtensionFunctionAddress)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_29f0,"Couldn\'t get exported function pointer to: ",&local_29f1);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffff9e38,(char *)in_stack_ffffffffffff9e30);
      dVar126 = (double)std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)in_stack_ffffffffffff9e38,
                                       (char *)in_stack_ffffffffffff9e30);
      log(in_RDI,dVar126);
      std::__cxx11::string::~string(local_29b0);
      std::__cxx11::string::~string(local_29d0);
      std::__cxx11::string::~string(local_29f0);
      std::allocator<char>::~allocator((allocator<char> *)&local_29f1);
      local_11 = 0;
    }
    else {
      local_2a00 = &(in_RDI->m_Dispatch).clGetExtensionFunctionAddress;
      *local_2a00 = p_Var68;
    }
    OS(in_RDI);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2a28,"clGetGLContextInfoKHR",&local_2a29);
    p_Var69 = (cl_api_clGetGLContextInfoKHR)
              ::OS::Services_Common::GetFunctionPointer
                        (in_stack_ffffffffffff9e38,in_stack_ffffffffffff9e30,
                         in_stack_ffffffffffff9e28);
    std::__cxx11::string::~string(local_2a28);
    std::allocator<char>::~allocator((allocator<char> *)&local_2a29);
    local_2a08 = p_Var69;
    if (p_Var69 == (cl_api_clGetGLContextInfoKHR)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_2a90,"Couldn\'t get exported function pointer to: ",&local_2a91);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffff9e38,(char *)in_stack_ffffffffffff9e30);
      dVar126 = (double)std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)in_stack_ffffffffffff9e38,
                                       (char *)in_stack_ffffffffffff9e30);
      log(in_RDI,dVar126);
      std::__cxx11::string::~string(local_2a50);
      std::__cxx11::string::~string(local_2a70);
      std::__cxx11::string::~string(local_2a90);
      std::allocator<char>::~allocator((allocator<char> *)&local_2a91);
      local_11 = 0;
    }
    else {
      local_2aa0 = &(in_RDI->m_Dispatch).clGetGLContextInfoKHR;
      *local_2aa0 = p_Var69;
    }
    OS(in_RDI);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2ac8,"clCreateFromGLBuffer",&local_2ac9);
    p_Var70 = (cl_api_clCreateFromGLBuffer)
              ::OS::Services_Common::GetFunctionPointer
                        (in_stack_ffffffffffff9e38,in_stack_ffffffffffff9e30,
                         in_stack_ffffffffffff9e28);
    std::__cxx11::string::~string(local_2ac8);
    std::allocator<char>::~allocator((allocator<char> *)&local_2ac9);
    local_2aa8 = p_Var70;
    if (p_Var70 == (cl_api_clCreateFromGLBuffer)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_2b30,"Couldn\'t get exported function pointer to: ",&local_2b31);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffff9e38,(char *)in_stack_ffffffffffff9e30);
      dVar126 = (double)std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)in_stack_ffffffffffff9e38,
                                       (char *)in_stack_ffffffffffff9e30);
      log(in_RDI,dVar126);
      std::__cxx11::string::~string(local_2af0);
      std::__cxx11::string::~string(local_2b10);
      std::__cxx11::string::~string(local_2b30);
      std::allocator<char>::~allocator((allocator<char> *)&local_2b31);
      local_11 = 0;
    }
    else {
      local_2b40 = &(in_RDI->m_Dispatch).clCreateFromGLBuffer;
      *local_2b40 = p_Var70;
    }
    OS(in_RDI);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2b68,"clCreateFromGLTexture",&local_2b69);
    p_Var71 = (cl_api_clCreateFromGLTexture)
              ::OS::Services_Common::GetFunctionPointer
                        (in_stack_ffffffffffff9e38,in_stack_ffffffffffff9e30,
                         in_stack_ffffffffffff9e28);
    std::__cxx11::string::~string(local_2b68);
    std::allocator<char>::~allocator((allocator<char> *)&local_2b69);
    local_2b48 = p_Var71;
    if (p_Var71 == (cl_api_clCreateFromGLTexture)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_2bd0,"Couldn\'t get exported function pointer to: ",&local_2bd1);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffff9e38,(char *)in_stack_ffffffffffff9e30);
      dVar126 = (double)std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)in_stack_ffffffffffff9e38,
                                       (char *)in_stack_ffffffffffff9e30);
      log(in_RDI,dVar126);
      std::__cxx11::string::~string(local_2b90);
      std::__cxx11::string::~string(local_2bb0);
      std::__cxx11::string::~string(local_2bd0);
      std::allocator<char>::~allocator((allocator<char> *)&local_2bd1);
      local_11 = 0;
    }
    else {
      local_2be0 = &(in_RDI->m_Dispatch).clCreateFromGLTexture;
      *local_2be0 = p_Var71;
    }
    OS(in_RDI);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2c08,"clCreateFromGLTexture2D",&local_2c09);
    p_Var72 = (cl_api_clCreateFromGLTexture2D)
              ::OS::Services_Common::GetFunctionPointer
                        (in_stack_ffffffffffff9e38,in_stack_ffffffffffff9e30,
                         in_stack_ffffffffffff9e28);
    std::__cxx11::string::~string(local_2c08);
    std::allocator<char>::~allocator((allocator<char> *)&local_2c09);
    local_2be8 = p_Var72;
    if (p_Var72 == (cl_api_clCreateFromGLTexture2D)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_2c70,"Couldn\'t get exported function pointer to: ",&local_2c71);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffff9e38,(char *)in_stack_ffffffffffff9e30);
      dVar126 = (double)std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)in_stack_ffffffffffff9e38,
                                       (char *)in_stack_ffffffffffff9e30);
      log(in_RDI,dVar126);
      std::__cxx11::string::~string(local_2c30);
      std::__cxx11::string::~string(local_2c50);
      std::__cxx11::string::~string(local_2c70);
      std::allocator<char>::~allocator((allocator<char> *)&local_2c71);
      local_11 = 0;
    }
    else {
      local_2c80 = &(in_RDI->m_Dispatch).clCreateFromGLTexture2D;
      *local_2c80 = p_Var72;
    }
    OS(in_RDI);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2ca8,"clCreateFromGLTexture3D",&local_2ca9);
    p_Var73 = (cl_api_clCreateFromGLTexture3D)
              ::OS::Services_Common::GetFunctionPointer
                        (in_stack_ffffffffffff9e38,in_stack_ffffffffffff9e30,
                         in_stack_ffffffffffff9e28);
    std::__cxx11::string::~string(local_2ca8);
    std::allocator<char>::~allocator((allocator<char> *)&local_2ca9);
    local_2c88 = p_Var73;
    if (p_Var73 == (cl_api_clCreateFromGLTexture3D)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_2d10,"Couldn\'t get exported function pointer to: ",&local_2d11);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffff9e38,(char *)in_stack_ffffffffffff9e30);
      dVar126 = (double)std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)in_stack_ffffffffffff9e38,
                                       (char *)in_stack_ffffffffffff9e30);
      log(in_RDI,dVar126);
      std::__cxx11::string::~string(local_2cd0);
      std::__cxx11::string::~string(local_2cf0);
      std::__cxx11::string::~string(local_2d10);
      std::allocator<char>::~allocator((allocator<char> *)&local_2d11);
      local_11 = 0;
    }
    else {
      local_2d20 = &(in_RDI->m_Dispatch).clCreateFromGLTexture3D;
      *local_2d20 = p_Var73;
    }
    OS(in_RDI);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2d48,"clCreateFromGLRenderbuffer",&local_2d49);
    p_Var74 = (cl_api_clCreateFromGLRenderbuffer)
              ::OS::Services_Common::GetFunctionPointer
                        (in_stack_ffffffffffff9e38,in_stack_ffffffffffff9e30,
                         in_stack_ffffffffffff9e28);
    std::__cxx11::string::~string(local_2d48);
    std::allocator<char>::~allocator((allocator<char> *)&local_2d49);
    local_2d28 = p_Var74;
    if (p_Var74 == (cl_api_clCreateFromGLRenderbuffer)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_2db0,"Couldn\'t get exported function pointer to: ",&local_2db1);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffff9e38,(char *)in_stack_ffffffffffff9e30);
      dVar126 = (double)std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)in_stack_ffffffffffff9e38,
                                       (char *)in_stack_ffffffffffff9e30);
      log(in_RDI,dVar126);
      std::__cxx11::string::~string(local_2d70);
      std::__cxx11::string::~string(local_2d90);
      std::__cxx11::string::~string(local_2db0);
      std::allocator<char>::~allocator((allocator<char> *)&local_2db1);
      local_11 = 0;
    }
    else {
      local_2dc0 = &(in_RDI->m_Dispatch).clCreateFromGLRenderbuffer;
      *local_2dc0 = p_Var74;
    }
    OS(in_RDI);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2de8,"clGetGLObjectInfo",&local_2de9);
    p_Var75 = (cl_api_clGetGLObjectInfo)
              ::OS::Services_Common::GetFunctionPointer
                        (in_stack_ffffffffffff9e38,in_stack_ffffffffffff9e30,
                         in_stack_ffffffffffff9e28);
    std::__cxx11::string::~string(local_2de8);
    std::allocator<char>::~allocator((allocator<char> *)&local_2de9);
    local_2dc8 = p_Var75;
    if (p_Var75 == (cl_api_clGetGLObjectInfo)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_2e50,"Couldn\'t get exported function pointer to: ",&local_2e51);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffff9e38,(char *)in_stack_ffffffffffff9e30);
      dVar126 = (double)std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)in_stack_ffffffffffff9e38,
                                       (char *)in_stack_ffffffffffff9e30);
      log(in_RDI,dVar126);
      std::__cxx11::string::~string(local_2e10);
      std::__cxx11::string::~string(local_2e30);
      std::__cxx11::string::~string(local_2e50);
      std::allocator<char>::~allocator((allocator<char> *)&local_2e51);
      local_11 = 0;
    }
    else {
      local_2e60 = &(in_RDI->m_Dispatch).clGetGLObjectInfo;
      *local_2e60 = p_Var75;
    }
    OS(in_RDI);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2e88,"clGetGLTextureInfo",&local_2e89);
    p_Var76 = (cl_api_clGetGLTextureInfo)
              ::OS::Services_Common::GetFunctionPointer
                        (in_stack_ffffffffffff9e38,in_stack_ffffffffffff9e30,
                         in_stack_ffffffffffff9e28);
    std::__cxx11::string::~string(local_2e88);
    std::allocator<char>::~allocator((allocator<char> *)&local_2e89);
    local_2e68 = p_Var76;
    if (p_Var76 == (cl_api_clGetGLTextureInfo)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_2ef0,"Couldn\'t get exported function pointer to: ",&local_2ef1);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffff9e38,(char *)in_stack_ffffffffffff9e30);
      dVar126 = (double)std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)in_stack_ffffffffffff9e38,
                                       (char *)in_stack_ffffffffffff9e30);
      log(in_RDI,dVar126);
      std::__cxx11::string::~string(local_2eb0);
      std::__cxx11::string::~string(local_2ed0);
      std::__cxx11::string::~string(local_2ef0);
      std::allocator<char>::~allocator((allocator<char> *)&local_2ef1);
      local_11 = 0;
    }
    else {
      local_2f00 = &(in_RDI->m_Dispatch).clGetGLTextureInfo;
      *local_2f00 = p_Var76;
    }
    OS(in_RDI);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2f28,"clEnqueueAcquireGLObjects",&local_2f29);
    p_Var77 = (cl_api_clEnqueueAcquireGLObjects)
              ::OS::Services_Common::GetFunctionPointer
                        (in_stack_ffffffffffff9e38,in_stack_ffffffffffff9e30,
                         in_stack_ffffffffffff9e28);
    std::__cxx11::string::~string(local_2f28);
    std::allocator<char>::~allocator((allocator<char> *)&local_2f29);
    local_2f08 = p_Var77;
    if (p_Var77 == (cl_api_clEnqueueAcquireGLObjects)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_2f90,"Couldn\'t get exported function pointer to: ",&local_2f91);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffff9e38,(char *)in_stack_ffffffffffff9e30);
      dVar126 = (double)std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)in_stack_ffffffffffff9e38,
                                       (char *)in_stack_ffffffffffff9e30);
      log(in_RDI,dVar126);
      std::__cxx11::string::~string(local_2f50);
      std::__cxx11::string::~string(local_2f70);
      std::__cxx11::string::~string(local_2f90);
      std::allocator<char>::~allocator((allocator<char> *)&local_2f91);
      local_11 = 0;
    }
    else {
      local_2fa0 = &(in_RDI->m_Dispatch).clEnqueueAcquireGLObjects;
      *local_2fa0 = p_Var77;
    }
    OS(in_RDI);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2fc8,"clEnqueueReleaseGLObjects",&local_2fc9);
    p_Var78 = (cl_api_clEnqueueReleaseGLObjects)
              ::OS::Services_Common::GetFunctionPointer
                        (in_stack_ffffffffffff9e38,in_stack_ffffffffffff9e30,
                         in_stack_ffffffffffff9e28);
    std::__cxx11::string::~string(local_2fc8);
    std::allocator<char>::~allocator((allocator<char> *)&local_2fc9);
    local_2fa8 = p_Var78;
    if (p_Var78 == (cl_api_clEnqueueReleaseGLObjects)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_3030,"Couldn\'t get exported function pointer to: ",&local_3031);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffff9e38,(char *)in_stack_ffffffffffff9e30);
      dVar126 = (double)std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)in_stack_ffffffffffff9e38,
                                       (char *)in_stack_ffffffffffff9e30);
      log(in_RDI,dVar126);
      std::__cxx11::string::~string(local_2ff0);
      std::__cxx11::string::~string(local_3010);
      std::__cxx11::string::~string(local_3030);
      std::allocator<char>::~allocator((allocator<char> *)&local_3031);
      local_11 = 0;
    }
    else {
      local_3040 = &(in_RDI->m_Dispatch).clEnqueueReleaseGLObjects;
      *local_3040 = p_Var78;
    }
    OS(in_RDI);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_3068,"clSetEventCallback",&local_3069);
    p_Var79 = (cl_api_clSetEventCallback)
              ::OS::Services_Common::GetFunctionPointer
                        (in_stack_ffffffffffff9e38,in_stack_ffffffffffff9e30,
                         in_stack_ffffffffffff9e28);
    std::__cxx11::string::~string(local_3068);
    std::allocator<char>::~allocator((allocator<char> *)&local_3069);
    local_3048 = p_Var79;
    if (p_Var79 == (cl_api_clSetEventCallback)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_30d0,"Couldn\'t get exported function pointer to: ",&local_30d1);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffff9e38,(char *)in_stack_ffffffffffff9e30);
      dVar126 = (double)std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)in_stack_ffffffffffff9e38,
                                       (char *)in_stack_ffffffffffff9e30);
      log(in_RDI,dVar126);
      std::__cxx11::string::~string(local_3090);
      std::__cxx11::string::~string(local_30b0);
      std::__cxx11::string::~string(local_30d0);
      std::allocator<char>::~allocator((allocator<char> *)&local_30d1);
      local_11 = 0;
    }
    else {
      local_30e0 = &(in_RDI->m_Dispatch).clSetEventCallback;
      *local_30e0 = p_Var79;
    }
    OS(in_RDI);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_3108,"clCreateSubBuffer",&local_3109);
    p_Var80 = (cl_api_clCreateSubBuffer)
              ::OS::Services_Common::GetFunctionPointer
                        (in_stack_ffffffffffff9e38,in_stack_ffffffffffff9e30,
                         in_stack_ffffffffffff9e28);
    std::__cxx11::string::~string(local_3108);
    std::allocator<char>::~allocator((allocator<char> *)&local_3109);
    local_30e8 = p_Var80;
    if (p_Var80 == (cl_api_clCreateSubBuffer)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_3170,"Couldn\'t get exported function pointer to: ",&local_3171);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffff9e38,(char *)in_stack_ffffffffffff9e30);
      dVar126 = (double)std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)in_stack_ffffffffffff9e38,
                                       (char *)in_stack_ffffffffffff9e30);
      log(in_RDI,dVar126);
      std::__cxx11::string::~string(local_3130);
      std::__cxx11::string::~string(local_3150);
      std::__cxx11::string::~string(local_3170);
      std::allocator<char>::~allocator((allocator<char> *)&local_3171);
      local_11 = 0;
    }
    else {
      local_3180 = &(in_RDI->m_Dispatch).clCreateSubBuffer;
      *local_3180 = p_Var80;
    }
    OS(in_RDI);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_31a8,"clSetMemObjectDestructorCallback",&local_31a9);
    p_Var81 = (cl_api_clSetMemObjectDestructorCallback)
              ::OS::Services_Common::GetFunctionPointer
                        (in_stack_ffffffffffff9e38,in_stack_ffffffffffff9e30,
                         in_stack_ffffffffffff9e28);
    std::__cxx11::string::~string(local_31a8);
    std::allocator<char>::~allocator((allocator<char> *)&local_31a9);
    local_3188 = p_Var81;
    if (p_Var81 == (cl_api_clSetMemObjectDestructorCallback)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_3210,"Couldn\'t get exported function pointer to: ",&local_3211);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffff9e38,(char *)in_stack_ffffffffffff9e30);
      dVar126 = (double)std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)in_stack_ffffffffffff9e38,
                                       (char *)in_stack_ffffffffffff9e30);
      log(in_RDI,dVar126);
      std::__cxx11::string::~string(local_31d0);
      std::__cxx11::string::~string(local_31f0);
      std::__cxx11::string::~string(local_3210);
      std::allocator<char>::~allocator((allocator<char> *)&local_3211);
      local_11 = 0;
    }
    else {
      local_3220 = &(in_RDI->m_Dispatch).clSetMemObjectDestructorCallback;
      *local_3220 = p_Var81;
    }
    OS(in_RDI);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_3248,"clCreateUserEvent",&local_3249);
    p_Var82 = (cl_api_clCreateUserEvent)
              ::OS::Services_Common::GetFunctionPointer
                        (in_stack_ffffffffffff9e38,in_stack_ffffffffffff9e30,
                         in_stack_ffffffffffff9e28);
    std::__cxx11::string::~string(local_3248);
    std::allocator<char>::~allocator((allocator<char> *)&local_3249);
    local_3228 = p_Var82;
    if (p_Var82 == (cl_api_clCreateUserEvent)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_32b0,"Couldn\'t get exported function pointer to: ",&local_32b1);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffff9e38,(char *)in_stack_ffffffffffff9e30);
      dVar126 = (double)std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)in_stack_ffffffffffff9e38,
                                       (char *)in_stack_ffffffffffff9e30);
      log(in_RDI,dVar126);
      std::__cxx11::string::~string(local_3270);
      std::__cxx11::string::~string(local_3290);
      std::__cxx11::string::~string(local_32b0);
      std::allocator<char>::~allocator((allocator<char> *)&local_32b1);
      local_11 = 0;
    }
    else {
      local_32c0 = &(in_RDI->m_Dispatch).clCreateUserEvent;
      *local_32c0 = p_Var82;
    }
    OS(in_RDI);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_32e8,"clSetUserEventStatus",&local_32e9);
    p_Var83 = (cl_api_clSetUserEventStatus)
              ::OS::Services_Common::GetFunctionPointer
                        (in_stack_ffffffffffff9e38,in_stack_ffffffffffff9e30,
                         in_stack_ffffffffffff9e28);
    std::__cxx11::string::~string(local_32e8);
    std::allocator<char>::~allocator((allocator<char> *)&local_32e9);
    local_32c8 = p_Var83;
    if (p_Var83 == (cl_api_clSetUserEventStatus)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_3350,"Couldn\'t get exported function pointer to: ",&local_3351);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffff9e38,(char *)in_stack_ffffffffffff9e30);
      dVar126 = (double)std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)in_stack_ffffffffffff9e38,
                                       (char *)in_stack_ffffffffffff9e30);
      log(in_RDI,dVar126);
      std::__cxx11::string::~string(local_3310);
      std::__cxx11::string::~string(local_3330);
      std::__cxx11::string::~string(local_3350);
      std::allocator<char>::~allocator((allocator<char> *)&local_3351);
      local_11 = 0;
    }
    else {
      local_3360 = &(in_RDI->m_Dispatch).clSetUserEventStatus;
      *local_3360 = p_Var83;
    }
    OS(in_RDI);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_3388,"clEnqueueReadBufferRect",&local_3389);
    p_Var84 = (cl_api_clEnqueueReadBufferRect)
              ::OS::Services_Common::GetFunctionPointer
                        (in_stack_ffffffffffff9e38,in_stack_ffffffffffff9e30,
                         in_stack_ffffffffffff9e28);
    std::__cxx11::string::~string(local_3388);
    std::allocator<char>::~allocator((allocator<char> *)&local_3389);
    local_3368 = p_Var84;
    if (p_Var84 == (cl_api_clEnqueueReadBufferRect)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_33f0,"Couldn\'t get exported function pointer to: ",&local_33f1);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffff9e38,(char *)in_stack_ffffffffffff9e30);
      dVar126 = (double)std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)in_stack_ffffffffffff9e38,
                                       (char *)in_stack_ffffffffffff9e30);
      log(in_RDI,dVar126);
      std::__cxx11::string::~string(local_33b0);
      std::__cxx11::string::~string(local_33d0);
      std::__cxx11::string::~string(local_33f0);
      std::allocator<char>::~allocator((allocator<char> *)&local_33f1);
      local_11 = 0;
    }
    else {
      local_3400 = &(in_RDI->m_Dispatch).clEnqueueReadBufferRect;
      *local_3400 = p_Var84;
    }
    OS(in_RDI);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_3428,"clEnqueueWriteBufferRect",&local_3429);
    p_Var85 = (cl_api_clEnqueueWriteBufferRect)
              ::OS::Services_Common::GetFunctionPointer
                        (in_stack_ffffffffffff9e38,in_stack_ffffffffffff9e30,
                         in_stack_ffffffffffff9e28);
    std::__cxx11::string::~string(local_3428);
    std::allocator<char>::~allocator((allocator<char> *)&local_3429);
    local_3408 = p_Var85;
    if (p_Var85 == (cl_api_clEnqueueWriteBufferRect)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_3490,"Couldn\'t get exported function pointer to: ",&local_3491);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffff9e38,(char *)in_stack_ffffffffffff9e30);
      dVar126 = (double)std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)in_stack_ffffffffffff9e38,
                                       (char *)in_stack_ffffffffffff9e30);
      log(in_RDI,dVar126);
      std::__cxx11::string::~string(local_3450);
      std::__cxx11::string::~string(local_3470);
      std::__cxx11::string::~string(local_3490);
      std::allocator<char>::~allocator((allocator<char> *)&local_3491);
      local_11 = 0;
    }
    else {
      local_34a0 = &(in_RDI->m_Dispatch).clEnqueueWriteBufferRect;
      *local_34a0 = p_Var85;
    }
    OS(in_RDI);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_34c8,"clEnqueueCopyBufferRect",&local_34c9);
    p_Var86 = (cl_api_clEnqueueCopyBufferRect)
              ::OS::Services_Common::GetFunctionPointer
                        (in_stack_ffffffffffff9e38,in_stack_ffffffffffff9e30,
                         in_stack_ffffffffffff9e28);
    std::__cxx11::string::~string(local_34c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_34c9);
    local_34a8 = p_Var86;
    if (p_Var86 == (cl_api_clEnqueueCopyBufferRect)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_3530,"Couldn\'t get exported function pointer to: ",&local_3531);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffff9e38,(char *)in_stack_ffffffffffff9e30);
      dVar126 = (double)std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)in_stack_ffffffffffff9e38,
                                       (char *)in_stack_ffffffffffff9e30);
      log(in_RDI,dVar126);
      std::__cxx11::string::~string(local_34f0);
      std::__cxx11::string::~string(local_3510);
      std::__cxx11::string::~string(local_3530);
      std::allocator<char>::~allocator((allocator<char> *)&local_3531);
      local_11 = 0;
    }
    else {
      local_3540 = &(in_RDI->m_Dispatch).clEnqueueCopyBufferRect;
      *local_3540 = p_Var86;
    }
    OS(in_RDI);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_3568,"clCreateSubDevices",&local_3569);
    p_Var87 = (cl_api_clCreateSubDevices)
              ::OS::Services_Common::GetFunctionPointer
                        (in_stack_ffffffffffff9e38,in_stack_ffffffffffff9e30,
                         in_stack_ffffffffffff9e28);
    std::__cxx11::string::~string(local_3568);
    std::allocator<char>::~allocator((allocator<char> *)&local_3569);
    local_3548 = p_Var87;
    if (p_Var87 == (cl_api_clCreateSubDevices)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_35d0,"Couldn\'t get exported function pointer to: ",&local_35d1);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffff9e38,(char *)in_stack_ffffffffffff9e30);
      dVar126 = (double)std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)in_stack_ffffffffffff9e38,
                                       (char *)in_stack_ffffffffffff9e30);
      log(in_RDI,dVar126);
      std::__cxx11::string::~string(local_3590);
      std::__cxx11::string::~string(local_35b0);
      std::__cxx11::string::~string(local_35d0);
      std::allocator<char>::~allocator((allocator<char> *)&local_35d1);
      local_11 = 0;
    }
    else {
      local_35e0 = &(in_RDI->m_Dispatch).clCreateSubDevices;
      *local_35e0 = p_Var87;
    }
    OS(in_RDI);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_3608,"clRetainDevice",&local_3609);
    p_Var88 = (cl_api_clRetainDevice)
              ::OS::Services_Common::GetFunctionPointer
                        (in_stack_ffffffffffff9e38,in_stack_ffffffffffff9e30,
                         in_stack_ffffffffffff9e28);
    std::__cxx11::string::~string(local_3608);
    std::allocator<char>::~allocator((allocator<char> *)&local_3609);
    local_35e8 = p_Var88;
    if (p_Var88 == (cl_api_clRetainDevice)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_3670,"Couldn\'t get exported function pointer to: ",&local_3671);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffff9e38,(char *)in_stack_ffffffffffff9e30);
      dVar126 = (double)std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)in_stack_ffffffffffff9e38,
                                       (char *)in_stack_ffffffffffff9e30);
      log(in_RDI,dVar126);
      std::__cxx11::string::~string(local_3630);
      std::__cxx11::string::~string(local_3650);
      std::__cxx11::string::~string(local_3670);
      std::allocator<char>::~allocator((allocator<char> *)&local_3671);
      local_11 = 0;
    }
    else {
      local_3680 = &(in_RDI->m_Dispatch).clRetainDevice;
      *local_3680 = p_Var88;
    }
    OS(in_RDI);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_36a8,"clReleaseDevice",&local_36a9);
    p_Var89 = (cl_api_clReleaseDevice)
              ::OS::Services_Common::GetFunctionPointer
                        (in_stack_ffffffffffff9e38,in_stack_ffffffffffff9e30,
                         in_stack_ffffffffffff9e28);
    std::__cxx11::string::~string(local_36a8);
    std::allocator<char>::~allocator((allocator<char> *)&local_36a9);
    local_3688 = p_Var89;
    if (p_Var89 == (cl_api_clReleaseDevice)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_3710,"Couldn\'t get exported function pointer to: ",&local_3711);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffff9e38,(char *)in_stack_ffffffffffff9e30);
      dVar126 = (double)std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)in_stack_ffffffffffff9e38,
                                       (char *)in_stack_ffffffffffff9e30);
      log(in_RDI,dVar126);
      std::__cxx11::string::~string(local_36d0);
      std::__cxx11::string::~string(local_36f0);
      std::__cxx11::string::~string(local_3710);
      std::allocator<char>::~allocator((allocator<char> *)&local_3711);
      local_11 = 0;
    }
    else {
      local_3720 = &(in_RDI->m_Dispatch).clReleaseDevice;
      *local_3720 = p_Var89;
    }
    OS(in_RDI);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_3748,"clCreateImage",&local_3749);
    p_Var90 = (cl_api_clCreateImage)
              ::OS::Services_Common::GetFunctionPointer
                        (in_stack_ffffffffffff9e38,in_stack_ffffffffffff9e30,
                         in_stack_ffffffffffff9e28);
    std::__cxx11::string::~string(local_3748);
    std::allocator<char>::~allocator((allocator<char> *)&local_3749);
    local_3728 = p_Var90;
    if (p_Var90 == (cl_api_clCreateImage)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_37b0,"Couldn\'t get exported function pointer to: ",&local_37b1);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffff9e38,(char *)in_stack_ffffffffffff9e30);
      dVar126 = (double)std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)in_stack_ffffffffffff9e38,
                                       (char *)in_stack_ffffffffffff9e30);
      log(in_RDI,dVar126);
      std::__cxx11::string::~string(local_3770);
      std::__cxx11::string::~string(local_3790);
      std::__cxx11::string::~string(local_37b0);
      std::allocator<char>::~allocator((allocator<char> *)&local_37b1);
      local_11 = 0;
    }
    else {
      local_37c0 = &(in_RDI->m_Dispatch).clCreateImage;
      *local_37c0 = p_Var90;
    }
    OS(in_RDI);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_37e8,"clCreateProgramWithBuiltInKernels",&local_37e9);
    p_Var91 = (cl_api_clCreateProgramWithBuiltInKernels)
              ::OS::Services_Common::GetFunctionPointer
                        (in_stack_ffffffffffff9e38,in_stack_ffffffffffff9e30,
                         in_stack_ffffffffffff9e28);
    std::__cxx11::string::~string(local_37e8);
    std::allocator<char>::~allocator((allocator<char> *)&local_37e9);
    local_37c8 = p_Var91;
    if (p_Var91 == (cl_api_clCreateProgramWithBuiltInKernels)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_3850,"Couldn\'t get exported function pointer to: ",&local_3851);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffff9e38,(char *)in_stack_ffffffffffff9e30);
      dVar126 = (double)std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)in_stack_ffffffffffff9e38,
                                       (char *)in_stack_ffffffffffff9e30);
      log(in_RDI,dVar126);
      std::__cxx11::string::~string(local_3810);
      std::__cxx11::string::~string(local_3830);
      std::__cxx11::string::~string(local_3850);
      std::allocator<char>::~allocator((allocator<char> *)&local_3851);
      local_11 = 0;
    }
    else {
      local_3860 = &(in_RDI->m_Dispatch).clCreateProgramWithBuiltInKernels;
      *local_3860 = p_Var91;
    }
    OS(in_RDI);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_3888,"clCompileProgram",&local_3889);
    p_Var92 = (cl_api_clCompileProgram)
              ::OS::Services_Common::GetFunctionPointer
                        (in_stack_ffffffffffff9e38,in_stack_ffffffffffff9e30,
                         in_stack_ffffffffffff9e28);
    std::__cxx11::string::~string(local_3888);
    std::allocator<char>::~allocator((allocator<char> *)&local_3889);
    local_3868 = p_Var92;
    if (p_Var92 == (cl_api_clCompileProgram)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_38f0,"Couldn\'t get exported function pointer to: ",&local_38f1);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffff9e38,(char *)in_stack_ffffffffffff9e30);
      dVar126 = (double)std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)in_stack_ffffffffffff9e38,
                                       (char *)in_stack_ffffffffffff9e30);
      log(in_RDI,dVar126);
      std::__cxx11::string::~string(local_38b0);
      std::__cxx11::string::~string(local_38d0);
      std::__cxx11::string::~string(local_38f0);
      std::allocator<char>::~allocator((allocator<char> *)&local_38f1);
      local_11 = 0;
    }
    else {
      local_3900 = &(in_RDI->m_Dispatch).clCompileProgram;
      *local_3900 = p_Var92;
    }
    OS(in_RDI);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_3928,"clLinkProgram",&local_3929);
    p_Var93 = (cl_api_clLinkProgram)
              ::OS::Services_Common::GetFunctionPointer
                        (in_stack_ffffffffffff9e38,in_stack_ffffffffffff9e30,
                         in_stack_ffffffffffff9e28);
    std::__cxx11::string::~string(local_3928);
    std::allocator<char>::~allocator((allocator<char> *)&local_3929);
    local_3908 = p_Var93;
    if (p_Var93 == (cl_api_clLinkProgram)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_3990,"Couldn\'t get exported function pointer to: ",&local_3991);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffff9e38,(char *)in_stack_ffffffffffff9e30);
      dVar126 = (double)std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)in_stack_ffffffffffff9e38,
                                       (char *)in_stack_ffffffffffff9e30);
      log(in_RDI,dVar126);
      std::__cxx11::string::~string(local_3950);
      std::__cxx11::string::~string(local_3970);
      std::__cxx11::string::~string(local_3990);
      std::allocator<char>::~allocator((allocator<char> *)&local_3991);
      local_11 = 0;
    }
    else {
      local_39a0 = &(in_RDI->m_Dispatch).clLinkProgram;
      *local_39a0 = p_Var93;
    }
    OS(in_RDI);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_39c8,"clUnloadPlatformCompiler",&local_39c9);
    p_Var94 = (cl_api_clUnloadPlatformCompiler)
              ::OS::Services_Common::GetFunctionPointer
                        (in_stack_ffffffffffff9e38,in_stack_ffffffffffff9e30,
                         in_stack_ffffffffffff9e28);
    std::__cxx11::string::~string(local_39c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_39c9);
    local_39a8 = p_Var94;
    if (p_Var94 == (cl_api_clUnloadPlatformCompiler)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_3a30,"Couldn\'t get exported function pointer to: ",&local_3a31);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffff9e38,(char *)in_stack_ffffffffffff9e30);
      dVar126 = (double)std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)in_stack_ffffffffffff9e38,
                                       (char *)in_stack_ffffffffffff9e30);
      log(in_RDI,dVar126);
      std::__cxx11::string::~string(local_39f0);
      std::__cxx11::string::~string(local_3a10);
      std::__cxx11::string::~string(local_3a30);
      std::allocator<char>::~allocator((allocator<char> *)&local_3a31);
      local_11 = 0;
    }
    else {
      local_3a40 = &(in_RDI->m_Dispatch).clUnloadPlatformCompiler;
      *local_3a40 = p_Var94;
    }
    OS(in_RDI);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_3a68,"clGetKernelArgInfo",&local_3a69);
    p_Var95 = (cl_api_clGetKernelArgInfo)
              ::OS::Services_Common::GetFunctionPointer
                        (in_stack_ffffffffffff9e38,in_stack_ffffffffffff9e30,
                         in_stack_ffffffffffff9e28);
    std::__cxx11::string::~string(local_3a68);
    std::allocator<char>::~allocator((allocator<char> *)&local_3a69);
    local_3a48 = p_Var95;
    if (p_Var95 == (cl_api_clGetKernelArgInfo)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_3ad0,"Couldn\'t get exported function pointer to: ",&local_3ad1);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffff9e38,(char *)in_stack_ffffffffffff9e30);
      dVar126 = (double)std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)in_stack_ffffffffffff9e38,
                                       (char *)in_stack_ffffffffffff9e30);
      log(in_RDI,dVar126);
      std::__cxx11::string::~string(local_3a90);
      std::__cxx11::string::~string(local_3ab0);
      std::__cxx11::string::~string(local_3ad0);
      std::allocator<char>::~allocator((allocator<char> *)&local_3ad1);
      local_11 = 0;
    }
    else {
      local_3ae0 = &(in_RDI->m_Dispatch).clGetKernelArgInfo;
      *local_3ae0 = p_Var95;
    }
    OS(in_RDI);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_3b08,"clEnqueueFillBuffer",&local_3b09);
    p_Var96 = (cl_api_clEnqueueFillBuffer)
              ::OS::Services_Common::GetFunctionPointer
                        (in_stack_ffffffffffff9e38,in_stack_ffffffffffff9e30,
                         in_stack_ffffffffffff9e28);
    std::__cxx11::string::~string(local_3b08);
    std::allocator<char>::~allocator((allocator<char> *)&local_3b09);
    local_3ae8 = p_Var96;
    if (p_Var96 == (cl_api_clEnqueueFillBuffer)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_3b70,"Couldn\'t get exported function pointer to: ",&local_3b71);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffff9e38,(char *)in_stack_ffffffffffff9e30);
      dVar126 = (double)std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)in_stack_ffffffffffff9e38,
                                       (char *)in_stack_ffffffffffff9e30);
      log(in_RDI,dVar126);
      std::__cxx11::string::~string(local_3b30);
      std::__cxx11::string::~string(local_3b50);
      std::__cxx11::string::~string(local_3b70);
      std::allocator<char>::~allocator((allocator<char> *)&local_3b71);
      local_11 = 0;
    }
    else {
      local_3b80 = &(in_RDI->m_Dispatch).clEnqueueFillBuffer;
      *local_3b80 = p_Var96;
    }
    OS(in_RDI);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_3ba8,"clEnqueueFillImage",&local_3ba9);
    p_Var97 = (cl_api_clEnqueueFillImage)
              ::OS::Services_Common::GetFunctionPointer
                        (in_stack_ffffffffffff9e38,in_stack_ffffffffffff9e30,
                         in_stack_ffffffffffff9e28);
    std::__cxx11::string::~string(local_3ba8);
    std::allocator<char>::~allocator((allocator<char> *)&local_3ba9);
    local_3b88 = p_Var97;
    if (p_Var97 == (cl_api_clEnqueueFillImage)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_3c10,"Couldn\'t get exported function pointer to: ",&local_3c11);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffff9e38,(char *)in_stack_ffffffffffff9e30);
      dVar126 = (double)std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)in_stack_ffffffffffff9e38,
                                       (char *)in_stack_ffffffffffff9e30);
      log(in_RDI,dVar126);
      std::__cxx11::string::~string(local_3bd0);
      std::__cxx11::string::~string(local_3bf0);
      std::__cxx11::string::~string(local_3c10);
      std::allocator<char>::~allocator((allocator<char> *)&local_3c11);
      local_11 = 0;
    }
    else {
      local_3c20 = &(in_RDI->m_Dispatch).clEnqueueFillImage;
      *local_3c20 = p_Var97;
    }
    OS(in_RDI);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_3c48,"clEnqueueMigrateMemObjects",&local_3c49);
    p_Var98 = (cl_api_clEnqueueMigrateMemObjects)
              ::OS::Services_Common::GetFunctionPointer
                        (in_stack_ffffffffffff9e38,in_stack_ffffffffffff9e30,
                         in_stack_ffffffffffff9e28);
    std::__cxx11::string::~string(local_3c48);
    std::allocator<char>::~allocator((allocator<char> *)&local_3c49);
    local_3c28 = p_Var98;
    if (p_Var98 == (cl_api_clEnqueueMigrateMemObjects)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_3cb0,"Couldn\'t get exported function pointer to: ",&local_3cb1);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffff9e38,(char *)in_stack_ffffffffffff9e30);
      dVar126 = (double)std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)in_stack_ffffffffffff9e38,
                                       (char *)in_stack_ffffffffffff9e30);
      log(in_RDI,dVar126);
      std::__cxx11::string::~string(local_3c70);
      std::__cxx11::string::~string(local_3c90);
      std::__cxx11::string::~string(local_3cb0);
      std::allocator<char>::~allocator((allocator<char> *)&local_3cb1);
      local_11 = 0;
    }
    else {
      local_3cc0 = &(in_RDI->m_Dispatch).clEnqueueMigrateMemObjects;
      *local_3cc0 = p_Var98;
    }
    OS(in_RDI);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_3ce8,"clEnqueueMarkerWithWaitList",&local_3ce9);
    p_Var99 = (cl_api_clEnqueueMarkerWithWaitList)
              ::OS::Services_Common::GetFunctionPointer
                        (in_stack_ffffffffffff9e38,in_stack_ffffffffffff9e30,
                         in_stack_ffffffffffff9e28);
    std::__cxx11::string::~string(local_3ce8);
    std::allocator<char>::~allocator((allocator<char> *)&local_3ce9);
    local_3cc8 = p_Var99;
    if (p_Var99 == (cl_api_clEnqueueMarkerWithWaitList)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_3d50,"Couldn\'t get exported function pointer to: ",&local_3d51);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffff9e38,(char *)in_stack_ffffffffffff9e30);
      dVar126 = (double)std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)in_stack_ffffffffffff9e38,
                                       (char *)in_stack_ffffffffffff9e30);
      log(in_RDI,dVar126);
      std::__cxx11::string::~string(local_3d10);
      std::__cxx11::string::~string(local_3d30);
      std::__cxx11::string::~string(local_3d50);
      std::allocator<char>::~allocator((allocator<char> *)&local_3d51);
      local_11 = 0;
    }
    else {
      local_3d60 = &(in_RDI->m_Dispatch).clEnqueueMarkerWithWaitList;
      *local_3d60 = p_Var99;
    }
    OS(in_RDI);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_3d88,"clEnqueueBarrierWithWaitList",&local_3d89);
    p_Var100 = (cl_api_clEnqueueBarrierWithWaitList)
               ::OS::Services_Common::GetFunctionPointer
                         (in_stack_ffffffffffff9e38,in_stack_ffffffffffff9e30,
                          in_stack_ffffffffffff9e28);
    std::__cxx11::string::~string(local_3d88);
    std::allocator<char>::~allocator((allocator<char> *)&local_3d89);
    local_3d68 = p_Var100;
    if (p_Var100 == (cl_api_clEnqueueBarrierWithWaitList)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_3df0,"Couldn\'t get exported function pointer to: ",&local_3df1);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffff9e38,(char *)in_stack_ffffffffffff9e30);
      dVar126 = (double)std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)in_stack_ffffffffffff9e38,
                                       (char *)in_stack_ffffffffffff9e30);
      log(in_RDI,dVar126);
      std::__cxx11::string::~string(local_3db0);
      std::__cxx11::string::~string(local_3dd0);
      std::__cxx11::string::~string(local_3df0);
      std::allocator<char>::~allocator((allocator<char> *)&local_3df1);
      local_11 = 0;
    }
    else {
      local_3e00 = &(in_RDI->m_Dispatch).clEnqueueBarrierWithWaitList;
      *local_3e00 = p_Var100;
    }
    OS(in_RDI);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_3e28,"clGetExtensionFunctionAddressForPlatform",&local_3e29);
    p_Var101 = (cl_api_clGetExtensionFunctionAddressForPlatform)
               ::OS::Services_Common::GetFunctionPointer
                         (in_stack_ffffffffffff9e38,in_stack_ffffffffffff9e30,
                          in_stack_ffffffffffff9e28);
    std::__cxx11::string::~string(local_3e28);
    std::allocator<char>::~allocator((allocator<char> *)&local_3e29);
    local_3e08 = p_Var101;
    if (p_Var101 == (cl_api_clGetExtensionFunctionAddressForPlatform)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_3e90,"Couldn\'t get exported function pointer to: ",&local_3e91);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffff9e38,(char *)in_stack_ffffffffffff9e30);
      dVar126 = (double)std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)in_stack_ffffffffffff9e38,
                                       (char *)in_stack_ffffffffffff9e30);
      log(in_RDI,dVar126);
      std::__cxx11::string::~string(local_3e50);
      std::__cxx11::string::~string(local_3e70);
      std::__cxx11::string::~string(local_3e90);
      std::allocator<char>::~allocator((allocator<char> *)&local_3e91);
      local_11 = 0;
    }
    else {
      local_3ea0 = &(in_RDI->m_Dispatch).clGetExtensionFunctionAddressForPlatform;
      *local_3ea0 = p_Var101;
    }
    OS(in_RDI);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_3ec8,"clCreateCommandQueueWithProperties",&local_3ec9);
    p_Var102 = (cl_api_clCreateCommandQueueWithProperties)
               ::OS::Services_Common::GetFunctionPointer
                         (in_stack_ffffffffffff9e38,in_stack_ffffffffffff9e30,
                          in_stack_ffffffffffff9e28);
    std::__cxx11::string::~string(local_3ec8);
    std::allocator<char>::~allocator((allocator<char> *)&local_3ec9);
    local_3ea8 = p_Var102;
    if (p_Var102 == (cl_api_clCreateCommandQueueWithProperties)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_3f30,"Couldn\'t get exported function pointer to: ",&local_3f31);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffff9e38,(char *)in_stack_ffffffffffff9e30);
      dVar126 = (double)std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)in_stack_ffffffffffff9e38,
                                       (char *)in_stack_ffffffffffff9e30);
      log(in_RDI,dVar126);
      std::__cxx11::string::~string(local_3ef0);
      std::__cxx11::string::~string(local_3f10);
      std::__cxx11::string::~string(local_3f30);
      std::allocator<char>::~allocator((allocator<char> *)&local_3f31);
      local_11 = 0;
    }
    else {
      local_3f40 = &(in_RDI->m_Dispatch).clCreateCommandQueueWithProperties;
      *local_3f40 = p_Var102;
    }
    OS(in_RDI);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_3f68,"clCreatePipe",&local_3f69);
    p_Var103 = (cl_api_clCreatePipe)
               ::OS::Services_Common::GetFunctionPointer
                         (in_stack_ffffffffffff9e38,in_stack_ffffffffffff9e30,
                          in_stack_ffffffffffff9e28);
    std::__cxx11::string::~string(local_3f68);
    std::allocator<char>::~allocator((allocator<char> *)&local_3f69);
    local_3f48 = p_Var103;
    if (p_Var103 == (cl_api_clCreatePipe)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_3fd0,"Couldn\'t get exported function pointer to: ",&local_3fd1);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffff9e38,(char *)in_stack_ffffffffffff9e30);
      dVar126 = (double)std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)in_stack_ffffffffffff9e38,
                                       (char *)in_stack_ffffffffffff9e30);
      log(in_RDI,dVar126);
      std::__cxx11::string::~string(local_3f90);
      std::__cxx11::string::~string(local_3fb0);
      std::__cxx11::string::~string(local_3fd0);
      std::allocator<char>::~allocator((allocator<char> *)&local_3fd1);
      local_11 = 0;
    }
    else {
      local_3fe0 = &(in_RDI->m_Dispatch).clCreatePipe;
      *local_3fe0 = p_Var103;
    }
    OS(in_RDI);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_4008,"clGetPipeInfo",&local_4009);
    p_Var104 = (cl_api_clGetPipeInfo)
               ::OS::Services_Common::GetFunctionPointer
                         (in_stack_ffffffffffff9e38,in_stack_ffffffffffff9e30,
                          in_stack_ffffffffffff9e28);
    std::__cxx11::string::~string(local_4008);
    std::allocator<char>::~allocator((allocator<char> *)&local_4009);
    local_3fe8 = p_Var104;
    if (p_Var104 == (cl_api_clGetPipeInfo)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_4070,"Couldn\'t get exported function pointer to: ",&local_4071);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffff9e38,(char *)in_stack_ffffffffffff9e30);
      dVar126 = (double)std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)in_stack_ffffffffffff9e38,
                                       (char *)in_stack_ffffffffffff9e30);
      log(in_RDI,dVar126);
      std::__cxx11::string::~string(local_4030);
      std::__cxx11::string::~string(local_4050);
      std::__cxx11::string::~string(local_4070);
      std::allocator<char>::~allocator((allocator<char> *)&local_4071);
      local_11 = 0;
    }
    else {
      local_4080 = &(in_RDI->m_Dispatch).clGetPipeInfo;
      *local_4080 = p_Var104;
    }
    OS(in_RDI);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_40a8,"clSVMAlloc",&local_40a9);
    p_Var105 = (cl_api_clSVMAlloc)
               ::OS::Services_Common::GetFunctionPointer
                         (in_stack_ffffffffffff9e38,in_stack_ffffffffffff9e30,
                          in_stack_ffffffffffff9e28);
    std::__cxx11::string::~string(local_40a8);
    std::allocator<char>::~allocator((allocator<char> *)&local_40a9);
    local_4088 = p_Var105;
    if (p_Var105 == (cl_api_clSVMAlloc)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_4110,"Couldn\'t get exported function pointer to: ",&local_4111);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffff9e38,(char *)in_stack_ffffffffffff9e30);
      dVar126 = (double)std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)in_stack_ffffffffffff9e38,
                                       (char *)in_stack_ffffffffffff9e30);
      log(in_RDI,dVar126);
      std::__cxx11::string::~string(local_40d0);
      std::__cxx11::string::~string(local_40f0);
      std::__cxx11::string::~string(local_4110);
      std::allocator<char>::~allocator((allocator<char> *)&local_4111);
      local_11 = 0;
    }
    else {
      local_4120 = &(in_RDI->m_Dispatch).clSVMAlloc;
      *local_4120 = p_Var105;
    }
    OS(in_RDI);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_4148,"clSVMFree",&local_4149);
    p_Var106 = (cl_api_clSVMFree)
               ::OS::Services_Common::GetFunctionPointer
                         (in_stack_ffffffffffff9e38,in_stack_ffffffffffff9e30,
                          in_stack_ffffffffffff9e28);
    std::__cxx11::string::~string(local_4148);
    std::allocator<char>::~allocator((allocator<char> *)&local_4149);
    local_4128 = p_Var106;
    if (p_Var106 == (cl_api_clSVMFree)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_41b0,"Couldn\'t get exported function pointer to: ",&local_41b1);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffff9e38,(char *)in_stack_ffffffffffff9e30);
      dVar126 = (double)std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)in_stack_ffffffffffff9e38,
                                       (char *)in_stack_ffffffffffff9e30);
      log(in_RDI,dVar126);
      std::__cxx11::string::~string(local_4170);
      std::__cxx11::string::~string(local_4190);
      std::__cxx11::string::~string(local_41b0);
      std::allocator<char>::~allocator((allocator<char> *)&local_41b1);
      local_11 = 0;
    }
    else {
      local_41c0 = &(in_RDI->m_Dispatch).clSVMFree;
      *local_41c0 = p_Var106;
    }
    OS(in_RDI);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_41e8,"clEnqueueSVMFree",&local_41e9);
    p_Var107 = (cl_api_clEnqueueSVMFree)
               ::OS::Services_Common::GetFunctionPointer
                         (in_stack_ffffffffffff9e38,in_stack_ffffffffffff9e30,
                          in_stack_ffffffffffff9e28);
    std::__cxx11::string::~string(local_41e8);
    std::allocator<char>::~allocator((allocator<char> *)&local_41e9);
    local_41c8 = p_Var107;
    if (p_Var107 == (cl_api_clEnqueueSVMFree)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_4250,"Couldn\'t get exported function pointer to: ",&local_4251);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffff9e38,(char *)in_stack_ffffffffffff9e30);
      dVar126 = (double)std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)in_stack_ffffffffffff9e38,
                                       (char *)in_stack_ffffffffffff9e30);
      log(in_RDI,dVar126);
      std::__cxx11::string::~string(local_4210);
      std::__cxx11::string::~string(local_4230);
      std::__cxx11::string::~string(local_4250);
      std::allocator<char>::~allocator((allocator<char> *)&local_4251);
      local_11 = 0;
    }
    else {
      local_4260 = &(in_RDI->m_Dispatch).clEnqueueSVMFree;
      *local_4260 = p_Var107;
    }
    OS(in_RDI);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_4288,"clEnqueueSVMMemcpy",&local_4289);
    p_Var108 = (cl_api_clEnqueueSVMMemcpy)
               ::OS::Services_Common::GetFunctionPointer
                         (in_stack_ffffffffffff9e38,in_stack_ffffffffffff9e30,
                          in_stack_ffffffffffff9e28);
    std::__cxx11::string::~string(local_4288);
    std::allocator<char>::~allocator((allocator<char> *)&local_4289);
    local_4268 = p_Var108;
    if (p_Var108 == (cl_api_clEnqueueSVMMemcpy)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_42f0,"Couldn\'t get exported function pointer to: ",&local_42f1);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffff9e38,(char *)in_stack_ffffffffffff9e30);
      dVar126 = (double)std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)in_stack_ffffffffffff9e38,
                                       (char *)in_stack_ffffffffffff9e30);
      log(in_RDI,dVar126);
      std::__cxx11::string::~string(local_42b0);
      std::__cxx11::string::~string(local_42d0);
      std::__cxx11::string::~string(local_42f0);
      std::allocator<char>::~allocator((allocator<char> *)&local_42f1);
      local_11 = 0;
    }
    else {
      local_4300 = &(in_RDI->m_Dispatch).clEnqueueSVMMemcpy;
      *local_4300 = p_Var108;
    }
    OS(in_RDI);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_4328,"clEnqueueSVMMemFill",&local_4329);
    p_Var109 = (cl_api_clEnqueueSVMMemFill)
               ::OS::Services_Common::GetFunctionPointer
                         (in_stack_ffffffffffff9e38,in_stack_ffffffffffff9e30,
                          in_stack_ffffffffffff9e28);
    std::__cxx11::string::~string(local_4328);
    std::allocator<char>::~allocator((allocator<char> *)&local_4329);
    local_4308 = p_Var109;
    if (p_Var109 == (cl_api_clEnqueueSVMMemFill)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_4390,"Couldn\'t get exported function pointer to: ",&local_4391);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffff9e38,(char *)in_stack_ffffffffffff9e30);
      dVar126 = (double)std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)in_stack_ffffffffffff9e38,
                                       (char *)in_stack_ffffffffffff9e30);
      log(in_RDI,dVar126);
      std::__cxx11::string::~string(local_4350);
      std::__cxx11::string::~string(local_4370);
      std::__cxx11::string::~string(local_4390);
      std::allocator<char>::~allocator((allocator<char> *)&local_4391);
      local_11 = 0;
    }
    else {
      local_43a0 = &(in_RDI->m_Dispatch).clEnqueueSVMMemFill;
      *local_43a0 = p_Var109;
    }
    OS(in_RDI);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_43c8,"clEnqueueSVMMap",&local_43c9);
    p_Var110 = (cl_api_clEnqueueSVMMap)
               ::OS::Services_Common::GetFunctionPointer
                         (in_stack_ffffffffffff9e38,in_stack_ffffffffffff9e30,
                          in_stack_ffffffffffff9e28);
    std::__cxx11::string::~string(local_43c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_43c9);
    local_43a8 = p_Var110;
    if (p_Var110 == (cl_api_clEnqueueSVMMap)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_4430,"Couldn\'t get exported function pointer to: ",&local_4431);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffff9e38,(char *)in_stack_ffffffffffff9e30);
      dVar126 = (double)std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)in_stack_ffffffffffff9e38,
                                       (char *)in_stack_ffffffffffff9e30);
      log(in_RDI,dVar126);
      std::__cxx11::string::~string(local_43f0);
      std::__cxx11::string::~string(local_4410);
      std::__cxx11::string::~string(local_4430);
      std::allocator<char>::~allocator((allocator<char> *)&local_4431);
      local_11 = 0;
    }
    else {
      local_4440 = &(in_RDI->m_Dispatch).clEnqueueSVMMap;
      *local_4440 = p_Var110;
    }
    OS(in_RDI);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_4468,"clEnqueueSVMUnmap",&local_4469);
    p_Var111 = (cl_api_clEnqueueSVMUnmap)
               ::OS::Services_Common::GetFunctionPointer
                         (in_stack_ffffffffffff9e38,in_stack_ffffffffffff9e30,
                          in_stack_ffffffffffff9e28);
    std::__cxx11::string::~string(local_4468);
    std::allocator<char>::~allocator((allocator<char> *)&local_4469);
    local_4448 = p_Var111;
    if (p_Var111 == (cl_api_clEnqueueSVMUnmap)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_44d0,"Couldn\'t get exported function pointer to: ",&local_44d1);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffff9e38,(char *)in_stack_ffffffffffff9e30);
      dVar126 = (double)std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)in_stack_ffffffffffff9e38,
                                       (char *)in_stack_ffffffffffff9e30);
      log(in_RDI,dVar126);
      std::__cxx11::string::~string(local_4490);
      std::__cxx11::string::~string(local_44b0);
      std::__cxx11::string::~string(local_44d0);
      std::allocator<char>::~allocator((allocator<char> *)&local_44d1);
      local_11 = 0;
    }
    else {
      local_44e0 = &(in_RDI->m_Dispatch).clEnqueueSVMUnmap;
      *local_44e0 = p_Var111;
    }
    OS(in_RDI);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_4508,"clCreateSamplerWithProperties",&local_4509);
    p_Var112 = (cl_api_clCreateSamplerWithProperties)
               ::OS::Services_Common::GetFunctionPointer
                         (in_stack_ffffffffffff9e38,in_stack_ffffffffffff9e30,
                          in_stack_ffffffffffff9e28);
    std::__cxx11::string::~string(local_4508);
    std::allocator<char>::~allocator((allocator<char> *)&local_4509);
    local_44e8 = p_Var112;
    if (p_Var112 == (cl_api_clCreateSamplerWithProperties)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_4570,"Couldn\'t get exported function pointer to: ",&local_4571);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffff9e38,(char *)in_stack_ffffffffffff9e30);
      dVar126 = (double)std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)in_stack_ffffffffffff9e38,
                                       (char *)in_stack_ffffffffffff9e30);
      log(in_RDI,dVar126);
      std::__cxx11::string::~string(local_4530);
      std::__cxx11::string::~string(local_4550);
      std::__cxx11::string::~string(local_4570);
      std::allocator<char>::~allocator((allocator<char> *)&local_4571);
      local_11 = 0;
    }
    else {
      local_4580 = &(in_RDI->m_Dispatch).clCreateSamplerWithProperties;
      *local_4580 = p_Var112;
    }
    OS(in_RDI);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_45a8,"clSetKernelArgSVMPointer",&local_45a9);
    p_Var113 = (cl_api_clSetKernelArgSVMPointer)
               ::OS::Services_Common::GetFunctionPointer
                         (in_stack_ffffffffffff9e38,in_stack_ffffffffffff9e30,
                          in_stack_ffffffffffff9e28);
    std::__cxx11::string::~string(local_45a8);
    std::allocator<char>::~allocator((allocator<char> *)&local_45a9);
    local_4588 = p_Var113;
    if (p_Var113 == (cl_api_clSetKernelArgSVMPointer)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_4610,"Couldn\'t get exported function pointer to: ",&local_4611);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffff9e38,(char *)in_stack_ffffffffffff9e30);
      dVar126 = (double)std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)in_stack_ffffffffffff9e38,
                                       (char *)in_stack_ffffffffffff9e30);
      log(in_RDI,dVar126);
      std::__cxx11::string::~string(local_45d0);
      std::__cxx11::string::~string(local_45f0);
      std::__cxx11::string::~string(local_4610);
      std::allocator<char>::~allocator((allocator<char> *)&local_4611);
      local_11 = 0;
    }
    else {
      local_4620 = &(in_RDI->m_Dispatch).clSetKernelArgSVMPointer;
      *local_4620 = p_Var113;
    }
    OS(in_RDI);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_4648,"clSetKernelExecInfo",&local_4649);
    p_Var114 = (cl_api_clSetKernelExecInfo)
               ::OS::Services_Common::GetFunctionPointer
                         (in_stack_ffffffffffff9e38,in_stack_ffffffffffff9e30,
                          in_stack_ffffffffffff9e28);
    std::__cxx11::string::~string(local_4648);
    std::allocator<char>::~allocator((allocator<char> *)&local_4649);
    local_4628 = p_Var114;
    if (p_Var114 == (cl_api_clSetKernelExecInfo)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_46b0,"Couldn\'t get exported function pointer to: ",&local_46b1);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffff9e38,(char *)in_stack_ffffffffffff9e30);
      dVar126 = (double)std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)in_stack_ffffffffffff9e38,
                                       (char *)in_stack_ffffffffffff9e30);
      log(in_RDI,dVar126);
      std::__cxx11::string::~string(local_4670);
      std::__cxx11::string::~string(local_4690);
      std::__cxx11::string::~string(local_46b0);
      std::allocator<char>::~allocator((allocator<char> *)&local_46b1);
      local_11 = 0;
    }
    else {
      local_46c0 = &(in_RDI->m_Dispatch).clSetKernelExecInfo;
      *local_46c0 = p_Var114;
    }
    OS(in_RDI);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_46e8,"clCloneKernel",&local_46e9);
    p_Var115 = (cl_api_clCloneKernel)
               ::OS::Services_Common::GetFunctionPointer
                         (in_stack_ffffffffffff9e38,in_stack_ffffffffffff9e30,
                          in_stack_ffffffffffff9e28);
    std::__cxx11::string::~string(local_46e8);
    std::allocator<char>::~allocator((allocator<char> *)&local_46e9);
    local_46c8 = p_Var115;
    if (p_Var115 == (cl_api_clCloneKernel)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_4750,"Couldn\'t get exported function pointer to: ",&local_4751);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffff9e38,(char *)in_stack_ffffffffffff9e30);
      dVar126 = (double)std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)in_stack_ffffffffffff9e38,
                                       (char *)in_stack_ffffffffffff9e30);
      log(in_RDI,dVar126);
      std::__cxx11::string::~string(local_4710);
      std::__cxx11::string::~string(local_4730);
      std::__cxx11::string::~string(local_4750);
      std::allocator<char>::~allocator((allocator<char> *)&local_4751);
      local_11 = 0;
    }
    else {
      local_4760 = &(in_RDI->m_Dispatch).clCloneKernel;
      *local_4760 = p_Var115;
    }
    OS(in_RDI);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_4788,"clCreateProgramWithIL",&local_4789);
    p_Var116 = (cl_api_clCreateProgramWithIL)
               ::OS::Services_Common::GetFunctionPointer
                         (in_stack_ffffffffffff9e38,in_stack_ffffffffffff9e30,
                          in_stack_ffffffffffff9e28);
    std::__cxx11::string::~string(local_4788);
    std::allocator<char>::~allocator((allocator<char> *)&local_4789);
    local_4768 = p_Var116;
    if (p_Var116 == (cl_api_clCreateProgramWithIL)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_47f0,"Couldn\'t get exported function pointer to: ",&local_47f1);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffff9e38,(char *)in_stack_ffffffffffff9e30);
      dVar126 = (double)std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)in_stack_ffffffffffff9e38,
                                       (char *)in_stack_ffffffffffff9e30);
      log(in_RDI,dVar126);
      std::__cxx11::string::~string(local_47b0);
      std::__cxx11::string::~string(local_47d0);
      std::__cxx11::string::~string(local_47f0);
      std::allocator<char>::~allocator((allocator<char> *)&local_47f1);
      local_11 = 0;
    }
    else {
      local_4800 = &(in_RDI->m_Dispatch).clCreateProgramWithIL;
      *local_4800 = p_Var116;
    }
    OS(in_RDI);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_4828,"clEnqueueSVMMigrateMem",&local_4829);
    p_Var117 = (cl_api_clEnqueueSVMMigrateMem)
               ::OS::Services_Common::GetFunctionPointer
                         (in_stack_ffffffffffff9e38,in_stack_ffffffffffff9e30,
                          in_stack_ffffffffffff9e28);
    std::__cxx11::string::~string(local_4828);
    std::allocator<char>::~allocator((allocator<char> *)&local_4829);
    local_4808 = p_Var117;
    if (p_Var117 == (cl_api_clEnqueueSVMMigrateMem)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_4890,"Couldn\'t get exported function pointer to: ",&local_4891);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffff9e38,(char *)in_stack_ffffffffffff9e30);
      dVar126 = (double)std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)in_stack_ffffffffffff9e38,
                                       (char *)in_stack_ffffffffffff9e30);
      log(in_RDI,dVar126);
      std::__cxx11::string::~string(local_4850);
      std::__cxx11::string::~string(local_4870);
      std::__cxx11::string::~string(local_4890);
      std::allocator<char>::~allocator((allocator<char> *)&local_4891);
      local_11 = 0;
    }
    else {
      local_48a0 = &(in_RDI->m_Dispatch).clEnqueueSVMMigrateMem;
      *local_48a0 = p_Var117;
    }
    OS(in_RDI);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_48c8,"clGetDeviceAndHostTimer",&local_48c9);
    p_Var118 = (cl_api_clGetDeviceAndHostTimer)
               ::OS::Services_Common::GetFunctionPointer
                         (in_stack_ffffffffffff9e38,in_stack_ffffffffffff9e30,
                          in_stack_ffffffffffff9e28);
    std::__cxx11::string::~string(local_48c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_48c9);
    local_48a8 = p_Var118;
    if (p_Var118 == (cl_api_clGetDeviceAndHostTimer)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_4930,"Couldn\'t get exported function pointer to: ",&local_4931);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffff9e38,(char *)in_stack_ffffffffffff9e30);
      dVar126 = (double)std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)in_stack_ffffffffffff9e38,
                                       (char *)in_stack_ffffffffffff9e30);
      log(in_RDI,dVar126);
      std::__cxx11::string::~string(local_48f0);
      std::__cxx11::string::~string(local_4910);
      std::__cxx11::string::~string(local_4930);
      std::allocator<char>::~allocator((allocator<char> *)&local_4931);
      local_11 = 0;
    }
    else {
      local_4940 = &(in_RDI->m_Dispatch).clGetDeviceAndHostTimer;
      *local_4940 = p_Var118;
    }
    OS(in_RDI);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_4968,"clGetHostTimer",&local_4969);
    p_Var119 = (cl_api_clGetHostTimer)
               ::OS::Services_Common::GetFunctionPointer
                         (in_stack_ffffffffffff9e38,in_stack_ffffffffffff9e30,
                          in_stack_ffffffffffff9e28);
    std::__cxx11::string::~string(local_4968);
    std::allocator<char>::~allocator((allocator<char> *)&local_4969);
    local_4948 = p_Var119;
    if (p_Var119 == (cl_api_clGetHostTimer)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_49d0,"Couldn\'t get exported function pointer to: ",&local_49d1);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffff9e38,(char *)in_stack_ffffffffffff9e30);
      dVar126 = (double)std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)in_stack_ffffffffffff9e38,
                                       (char *)in_stack_ffffffffffff9e30);
      log(in_RDI,dVar126);
      std::__cxx11::string::~string(local_4990);
      std::__cxx11::string::~string(local_49b0);
      std::__cxx11::string::~string(local_49d0);
      std::allocator<char>::~allocator((allocator<char> *)&local_49d1);
      local_11 = 0;
    }
    else {
      local_49e0 = &(in_RDI->m_Dispatch).clGetHostTimer;
      *local_49e0 = p_Var119;
    }
    OS(in_RDI);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_4a08,"clGetKernelSubGroupInfo",&local_4a09);
    p_Var120 = (cl_api_clGetKernelSubGroupInfo)
               ::OS::Services_Common::GetFunctionPointer
                         (in_stack_ffffffffffff9e38,in_stack_ffffffffffff9e30,
                          in_stack_ffffffffffff9e28);
    std::__cxx11::string::~string(local_4a08);
    std::allocator<char>::~allocator((allocator<char> *)&local_4a09);
    local_49e8 = p_Var120;
    if (p_Var120 == (cl_api_clGetKernelSubGroupInfo)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_4a70,"Couldn\'t get exported function pointer to: ",&local_4a71);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffff9e38,(char *)in_stack_ffffffffffff9e30);
      dVar126 = (double)std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)in_stack_ffffffffffff9e38,
                                       (char *)in_stack_ffffffffffff9e30);
      log(in_RDI,dVar126);
      std::__cxx11::string::~string(local_4a30);
      std::__cxx11::string::~string(local_4a50);
      std::__cxx11::string::~string(local_4a70);
      std::allocator<char>::~allocator((allocator<char> *)&local_4a71);
      local_11 = 0;
    }
    else {
      local_4a80 = &(in_RDI->m_Dispatch).clGetKernelSubGroupInfo;
      *local_4a80 = p_Var120;
    }
    OS(in_RDI);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_4aa8,"clSetDefaultDeviceCommandQueue",&local_4aa9);
    p_Var121 = (cl_api_clSetDefaultDeviceCommandQueue)
               ::OS::Services_Common::GetFunctionPointer
                         (in_stack_ffffffffffff9e38,in_stack_ffffffffffff9e30,
                          in_stack_ffffffffffff9e28);
    std::__cxx11::string::~string(local_4aa8);
    std::allocator<char>::~allocator((allocator<char> *)&local_4aa9);
    local_4a88 = p_Var121;
    if (p_Var121 == (cl_api_clSetDefaultDeviceCommandQueue)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_4b10,"Couldn\'t get exported function pointer to: ",&local_4b11);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffff9e38,(char *)in_stack_ffffffffffff9e30);
      dVar126 = (double)std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)in_stack_ffffffffffff9e38,
                                       (char *)in_stack_ffffffffffff9e30);
      log(in_RDI,dVar126);
      std::__cxx11::string::~string(local_4ad0);
      std::__cxx11::string::~string(local_4af0);
      std::__cxx11::string::~string(local_4b10);
      std::allocator<char>::~allocator((allocator<char> *)&local_4b11);
      local_11 = 0;
    }
    else {
      local_4b20 = &(in_RDI->m_Dispatch).clSetDefaultDeviceCommandQueue;
      *local_4b20 = p_Var121;
    }
    OS(in_RDI);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_4b48,"clSetProgramReleaseCallback",&local_4b49);
    p_Var122 = (cl_api_clSetProgramReleaseCallback)
               ::OS::Services_Common::GetFunctionPointer
                         (in_stack_ffffffffffff9e38,in_stack_ffffffffffff9e30,
                          in_stack_ffffffffffff9e28);
    std::__cxx11::string::~string(local_4b48);
    std::allocator<char>::~allocator((allocator<char> *)&local_4b49);
    local_4b28 = p_Var122;
    if (p_Var122 == (cl_api_clSetProgramReleaseCallback)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_4bb0,"Couldn\'t get exported function pointer to: ",&local_4bb1);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffff9e38,(char *)in_stack_ffffffffffff9e30);
      dVar126 = (double)std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)in_stack_ffffffffffff9e38,
                                       (char *)in_stack_ffffffffffff9e30);
      log(in_RDI,dVar126);
      std::__cxx11::string::~string(local_4b70);
      std::__cxx11::string::~string(local_4b90);
      std::__cxx11::string::~string(local_4bb0);
      std::allocator<char>::~allocator((allocator<char> *)&local_4bb1);
      local_11 = 0;
    }
    else {
      local_4bc0 = &(in_RDI->m_Dispatch).clSetProgramReleaseCallback;
      *local_4bc0 = p_Var122;
    }
    OS(in_RDI);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_4be8,"clSetProgramSpecializationConstant",&local_4be9);
    p_Var123 = (cl_api_clSetProgramSpecializationConstant)
               ::OS::Services_Common::GetFunctionPointer
                         (in_stack_ffffffffffff9e38,in_stack_ffffffffffff9e30,
                          in_stack_ffffffffffff9e28);
    std::__cxx11::string::~string(local_4be8);
    std::allocator<char>::~allocator((allocator<char> *)&local_4be9);
    local_4bc8 = p_Var123;
    if (p_Var123 == (cl_api_clSetProgramSpecializationConstant)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_4c50,"Couldn\'t get exported function pointer to: ",&local_4c51);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffff9e38,(char *)in_stack_ffffffffffff9e30);
      dVar126 = (double)std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)in_stack_ffffffffffff9e38,
                                       (char *)in_stack_ffffffffffff9e30);
      log(in_RDI,dVar126);
      std::__cxx11::string::~string(local_4c10);
      std::__cxx11::string::~string(local_4c30);
      std::__cxx11::string::~string(local_4c50);
      std::allocator<char>::~allocator((allocator<char> *)&local_4c51);
      local_11 = 0;
    }
    else {
      local_4c60 = &(in_RDI->m_Dispatch).clSetProgramSpecializationConstant;
      *local_4c60 = p_Var123;
    }
    OS(in_RDI);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_4c88,"clCreateBufferWithProperties",&local_4c89);
    p_Var124 = (cl_api_clCreateBufferWithProperties)
               ::OS::Services_Common::GetFunctionPointer
                         (in_stack_ffffffffffff9e38,in_stack_ffffffffffff9e30,
                          in_stack_ffffffffffff9e28);
    std::__cxx11::string::~string(local_4c88);
    std::allocator<char>::~allocator((allocator<char> *)&local_4c89);
    local_4c68 = p_Var124;
    if (p_Var124 == (cl_api_clCreateBufferWithProperties)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_4cf0,"Couldn\'t get exported function pointer to: ",&local_4cf1);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffff9e38,(char *)in_stack_ffffffffffff9e30);
      dVar126 = (double)std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)in_stack_ffffffffffff9e38,
                                       (char *)in_stack_ffffffffffff9e30);
      log(in_RDI,dVar126);
      std::__cxx11::string::~string(local_4cb0);
      std::__cxx11::string::~string(local_4cd0);
      std::__cxx11::string::~string(local_4cf0);
      std::allocator<char>::~allocator((allocator<char> *)&local_4cf1);
      local_11 = 0;
    }
    else {
      local_4d00 = &(in_RDI->m_Dispatch).clCreateBufferWithProperties;
      *local_4d00 = p_Var124;
    }
    OS(in_RDI);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_4d28,"clCreateImageWithProperties",&local_4d29);
    p_Var125 = (cl_api_clCreateImageWithProperties)
               ::OS::Services_Common::GetFunctionPointer
                         (in_stack_ffffffffffff9e38,in_stack_ffffffffffff9e30,
                          in_stack_ffffffffffff9e28);
    std::__cxx11::string::~string(local_4d28);
    std::allocator<char>::~allocator((allocator<char> *)&local_4d29);
    local_4d08 = p_Var125;
    if (p_Var125 == (cl_api_clCreateImageWithProperties)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_4d90,"Couldn\'t get exported function pointer to: ",&local_4d91);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffff9e38,(char *)in_stack_ffffffffffff9e30);
      dVar126 = (double)std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)in_stack_ffffffffffff9e38,
                                       (char *)in_stack_ffffffffffff9e30);
      log(in_RDI,dVar126);
      std::__cxx11::string::~string(local_4d50);
      std::__cxx11::string::~string(local_4d70);
      std::__cxx11::string::~string(local_4d90);
      std::allocator<char>::~allocator((allocator<char> *)&local_4d91);
      local_11 = 0;
    }
    else {
      local_4da0 = &(in_RDI->m_Dispatch).clCreateImageWithProperties;
      *local_4da0 = p_Var125;
    }
    OS(in_RDI);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_4dc8,"clSetContextDestructorCallback",&local_4dc9);
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            ::OS::Services_Common::GetFunctionPointer
                      (in_stack_ffffffffffff9e38,in_stack_ffffffffffff9e30,in_stack_ffffffffffff9e28
                      );
    std::__cxx11::string::~string(local_4dc8);
    std::allocator<char>::~allocator((allocator<char> *)&local_4dc9);
    local_4da8 = __lhs;
    if (__lhs == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      in_stack_ffffffffffff9e30 = &local_4e31;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_4e30,"Couldn\'t get exported function pointer to: ",in_stack_ffffffffffff9e30
                );
      std::operator+(__lhs,(char *)in_stack_ffffffffffff9e30);
      dVar126 = (double)std::operator+(__lhs,(char *)in_stack_ffffffffffff9e30);
      log(in_RDI,dVar126);
      std::__cxx11::string::~string(local_4df0);
      std::__cxx11::string::~string(local_4e10);
      std::__cxx11::string::~string(local_4e30);
      std::allocator<char>::~allocator((allocator<char> *)&local_4e31);
    }
    else {
      (in_RDI->m_Dispatch).clSetContextDestructorCallback =
           (cl_api_clSetContextDestructorCallback)__lhs;
    }
    local_11 = local_2959 & 1;
  }
  if (((local_11 & 1) == 0) && (in_RDI->m_OpenCLLibraryHandle != (void *)0x0)) {
    OS(in_RDI);
    ::OS::Services_Common::UnloadLibrary
              ((Services_Common *)in_stack_ffffffffffff9e30,(void **)in_stack_ffffffffffff9e28);
    in_RDI->m_OpenCLLibraryHandle = (void *)0x0;
  }
  return (bool)(local_11 & 1);
}

Assistant:

bool CLIntercept::initDispatch( const std::string& libName )
{
    bool success = true;

    if( success )
    {
        m_OpenCLLibraryHandle = OS().LoadLibrary( libName.c_str() );
        if( m_OpenCLLibraryHandle == NULL )
        {
            log( std::string("Couldn't load library: ") + libName + "\n");
            success = false;
        }
    }

    if( success )
    {
        INIT_EXPORTED_FUNC(clGetPlatformIDs);
        INIT_EXPORTED_FUNC(clGetPlatformInfo);
        INIT_EXPORTED_FUNC(clGetDeviceIDs);
        INIT_EXPORTED_FUNC(clGetDeviceInfo);
        INIT_EXPORTED_FUNC(clCreateContext);
        INIT_EXPORTED_FUNC(clCreateContextFromType);
        INIT_EXPORTED_FUNC(clRetainContext);
        INIT_EXPORTED_FUNC(clReleaseContext);
        INIT_EXPORTED_FUNC(clGetContextInfo);
        INIT_EXPORTED_FUNC(clCreateCommandQueue);
        INIT_EXPORTED_FUNC(clRetainCommandQueue);
        INIT_EXPORTED_FUNC(clReleaseCommandQueue);
        INIT_EXPORTED_FUNC(clGetCommandQueueInfo);
        INIT_EXPORTED_FUNC(clSetCommandQueueProperty);
        INIT_EXPORTED_FUNC(clCreateBuffer);
        INIT_EXPORTED_FUNC(clCreateImage2D);
        INIT_EXPORTED_FUNC(clCreateImage3D);
        INIT_EXPORTED_FUNC(clRetainMemObject);
        INIT_EXPORTED_FUNC(clReleaseMemObject);
        INIT_EXPORTED_FUNC(clGetSupportedImageFormats);
        INIT_EXPORTED_FUNC(clGetMemObjectInfo);
        INIT_EXPORTED_FUNC(clGetImageInfo);
        INIT_EXPORTED_FUNC(clCreateSampler);
        INIT_EXPORTED_FUNC(clRetainSampler);
        INIT_EXPORTED_FUNC(clReleaseSampler);
        INIT_EXPORTED_FUNC(clGetSamplerInfo);
        INIT_EXPORTED_FUNC(clCreateProgramWithSource);
        INIT_EXPORTED_FUNC(clCreateProgramWithBinary);
        INIT_EXPORTED_FUNC(clRetainProgram);
        INIT_EXPORTED_FUNC(clReleaseProgram);
        INIT_EXPORTED_FUNC(clBuildProgram);
        INIT_EXPORTED_FUNC(clUnloadCompiler);
        INIT_EXPORTED_FUNC(clGetProgramInfo);
        INIT_EXPORTED_FUNC(clGetProgramBuildInfo);
        INIT_EXPORTED_FUNC(clCreateKernel);
        INIT_EXPORTED_FUNC(clCreateKernelsInProgram);
        INIT_EXPORTED_FUNC(clRetainKernel);
        INIT_EXPORTED_FUNC(clReleaseKernel);
        INIT_EXPORTED_FUNC(clSetKernelArg);
        INIT_EXPORTED_FUNC(clGetKernelInfo);
        INIT_EXPORTED_FUNC(clGetKernelWorkGroupInfo);
        INIT_EXPORTED_FUNC(clWaitForEvents);
        INIT_EXPORTED_FUNC(clGetEventInfo);
        INIT_EXPORTED_FUNC(clRetainEvent);
        INIT_EXPORTED_FUNC(clReleaseEvent);
        INIT_EXPORTED_FUNC(clGetEventProfilingInfo);
        INIT_EXPORTED_FUNC(clFlush);
        INIT_EXPORTED_FUNC(clFinish);
        INIT_EXPORTED_FUNC(clEnqueueReadBuffer);
        INIT_EXPORTED_FUNC(clEnqueueWriteBuffer);
        INIT_EXPORTED_FUNC(clEnqueueCopyBuffer);
        INIT_EXPORTED_FUNC(clEnqueueReadImage);
        INIT_EXPORTED_FUNC(clEnqueueWriteImage);
        INIT_EXPORTED_FUNC(clEnqueueCopyImage);
        INIT_EXPORTED_FUNC(clEnqueueCopyImageToBuffer);
        INIT_EXPORTED_FUNC(clEnqueueCopyBufferToImage);
        INIT_EXPORTED_FUNC(clEnqueueMapBuffer);
        INIT_EXPORTED_FUNC(clEnqueueMapImage);
        INIT_EXPORTED_FUNC(clEnqueueUnmapMemObject);
        INIT_EXPORTED_FUNC(clEnqueueNDRangeKernel);
        INIT_EXPORTED_FUNC(clEnqueueTask);
        INIT_EXPORTED_FUNC(clEnqueueNativeKernel);
        INIT_EXPORTED_FUNC(clEnqueueMarker);
        INIT_EXPORTED_FUNC(clEnqueueWaitForEvents);
        INIT_EXPORTED_FUNC(clEnqueueBarrier);

        bool    savedSuccess = success;

        INIT_EXPORTED_FUNC(clGetExtensionFunctionAddress);

        // cl_khr_gl_sharing (optional)
        // The entry points for this extension are exported from the ICD
        // loader even though they are extension APIs.
        INIT_EXPORTED_FUNC( clGetGLContextInfoKHR );
#if defined(_WIN32) || defined(__linux__) || defined(__FreeBSD__)
        INIT_EXPORTED_FUNC( clCreateFromGLBuffer );
        INIT_EXPORTED_FUNC( clCreateFromGLTexture );
        INIT_EXPORTED_FUNC( clCreateFromGLTexture2D );
        INIT_EXPORTED_FUNC( clCreateFromGLTexture3D );
        INIT_EXPORTED_FUNC( clCreateFromGLRenderbuffer );
        INIT_EXPORTED_FUNC( clGetGLObjectInfo );
        INIT_EXPORTED_FUNC( clGetGLTextureInfo );   // OpenCL 1.2
        INIT_EXPORTED_FUNC( clEnqueueAcquireGLObjects );
        INIT_EXPORTED_FUNC( clEnqueueReleaseGLObjects );
#endif

        // OpenCL 1.1 Entry Points (optional)
        INIT_EXPORTED_FUNC(clSetEventCallback);
        INIT_EXPORTED_FUNC(clCreateSubBuffer);
        INIT_EXPORTED_FUNC(clSetMemObjectDestructorCallback);
        INIT_EXPORTED_FUNC(clCreateUserEvent);
        INIT_EXPORTED_FUNC(clSetUserEventStatus);
        INIT_EXPORTED_FUNC(clEnqueueReadBufferRect);
        INIT_EXPORTED_FUNC(clEnqueueWriteBufferRect);
        INIT_EXPORTED_FUNC(clEnqueueCopyBufferRect);

        // OpenCL 1.2 Entry Points (optional)
        INIT_EXPORTED_FUNC(clCreateSubDevices);
        INIT_EXPORTED_FUNC(clRetainDevice);
        INIT_EXPORTED_FUNC(clReleaseDevice);
        INIT_EXPORTED_FUNC(clCreateImage);
        INIT_EXPORTED_FUNC(clCreateProgramWithBuiltInKernels);
        INIT_EXPORTED_FUNC(clCompileProgram);
        INIT_EXPORTED_FUNC(clLinkProgram);
        INIT_EXPORTED_FUNC(clUnloadPlatformCompiler);
        INIT_EXPORTED_FUNC(clGetKernelArgInfo);
        INIT_EXPORTED_FUNC(clEnqueueFillBuffer);
        INIT_EXPORTED_FUNC(clEnqueueFillImage);
        INIT_EXPORTED_FUNC(clEnqueueMigrateMemObjects);
        INIT_EXPORTED_FUNC(clEnqueueMarkerWithWaitList);
        INIT_EXPORTED_FUNC(clEnqueueBarrierWithWaitList);
        INIT_EXPORTED_FUNC(clGetExtensionFunctionAddressForPlatform);

        // OpenCL 2.0 Entry Points (optional)
        INIT_EXPORTED_FUNC(clCreateCommandQueueWithProperties);
        INIT_EXPORTED_FUNC(clCreatePipe);
        INIT_EXPORTED_FUNC(clGetPipeInfo);
        INIT_EXPORTED_FUNC(clSVMAlloc);
        INIT_EXPORTED_FUNC(clSVMFree);
        INIT_EXPORTED_FUNC(clEnqueueSVMFree);
        INIT_EXPORTED_FUNC(clEnqueueSVMMemcpy);
        INIT_EXPORTED_FUNC(clEnqueueSVMMemFill);
        INIT_EXPORTED_FUNC(clEnqueueSVMMap);
        INIT_EXPORTED_FUNC(clEnqueueSVMUnmap);
        INIT_EXPORTED_FUNC(clCreateSamplerWithProperties);
        INIT_EXPORTED_FUNC(clSetKernelArgSVMPointer);
        INIT_EXPORTED_FUNC(clSetKernelExecInfo);

        // OpenCL 2.1 Entry Points (optional)
        INIT_EXPORTED_FUNC(clCloneKernel);
        INIT_EXPORTED_FUNC(clCreateProgramWithIL);
        INIT_EXPORTED_FUNC(clEnqueueSVMMigrateMem);
        INIT_EXPORTED_FUNC(clGetDeviceAndHostTimer);
        INIT_EXPORTED_FUNC(clGetHostTimer);
        INIT_EXPORTED_FUNC(clGetKernelSubGroupInfo);
        INIT_EXPORTED_FUNC(clSetDefaultDeviceCommandQueue);

        // OpenCL 2.2 Entry Points (optional)
        INIT_EXPORTED_FUNC(clSetProgramReleaseCallback);
        INIT_EXPORTED_FUNC(clSetProgramSpecializationConstant);

        // OpenCL 3.0 Entry Points (optional)
        INIT_EXPORTED_FUNC(clCreateBufferWithProperties);
        INIT_EXPORTED_FUNC(clCreateImageWithProperties);
        INIT_EXPORTED_FUNC(clSetContextDestructorCallback);

        success = savedSuccess;
    }

    if( !success )
    {
        if( m_OpenCLLibraryHandle != NULL )
        {
            OS().UnloadLibrary( m_OpenCLLibraryHandle );
            m_OpenCLLibraryHandle = NULL;
        }
    }

    return success;
}